

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int ncnn::binary_op_broadcast_inner(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  ulong uVar36;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  _func_int ***ppp_Var97;
  undefined1 auVar98 [36];
  int size_2;
  int iVar99;
  int iVar100;
  uint uVar101;
  uint uVar102;
  int *extraout_RAX;
  ulong uVar103;
  uint uVar104;
  uint uVar105;
  uint uVar106;
  long lVar107;
  uint uVar108;
  uint uVar109;
  int size_1;
  long lVar110;
  int size;
  ulong uVar111;
  undefined1 (*pauVar112) [64];
  float *pfVar113;
  uint *puVar114;
  undefined1 (*pauVar115) [32];
  undefined1 (*pauVar116) [64];
  undefined8 *puVar117;
  float *pfVar118;
  ulong uVar119;
  void *pvVar120;
  int iVar121;
  long lVar122;
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  float fVar186;
  undefined1 auVar187 [16];
  undefined8 uVar208;
  undefined8 uVar209;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined8 uVar211;
  undefined1 auVar197 [32];
  undefined8 uVar212;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined8 uVar213;
  undefined8 uVar214;
  undefined8 uVar215;
  undefined1 auVar210 [56];
  undefined8 uVar216;
  __m512 afVar207;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [64];
  __m128 afVar333;
  binary_op_rpow op_1;
  binary_op_ratan2 op;
  __m256 _b_256;
  __m256 _p;
  __m128 _b_128;
  void *local_250;
  binary_op_rpow local_241;
  Mat *local_240;
  void *local_238;
  void *local_230;
  Allocator *local_228;
  int *local_220;
  Mat *local_218;
  int local_20c;
  void *local_208;
  undefined8 local_200;
  void *local_1f8;
  undefined1 local_1f0 [16];
  size_t local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  float local_194;
  __m128 local_190;
  Mat local_180;
  long local_108;
  undefined1 local_100 [32];
  undefined1 auStack_e0 [32];
  __m256 local_a0;
  uint local_7c;
  
  local_250 = b->data;
  local_220 = b->refcount;
  local_208 = (void *)b->elemsize;
  local_228 = b->allocator;
  uVar1 = b->dims;
  uVar2 = b->w;
  uStack_1a8 = 0;
  local_1d8 = b->cstep;
  if (local_220 != (int *)0x0) {
    LOCK();
    *local_220 = *local_220 + 1;
    UNLOCK();
  }
  uVar102 = b->dims;
  uVar108 = b->w ^ 1;
  local_240 = a;
  local_218 = c;
  local_1b0._0_4_ = uVar1;
  local_1b0._4_4_ = uVar2;
  if (uVar102 == 2 && uVar108 == 0) {
    Mat::reshape(&local_180,b,b->h,(Allocator *)0x0);
    if (local_180.refcount != (int *)0x0) {
      LOCK();
      *local_180.refcount = *local_180.refcount + 1;
      UNLOCK();
    }
    if (local_220 != (int *)0x0) {
      LOCK();
      *local_220 = *local_220 + -1;
      UNLOCK();
      if (*local_220 == 0) {
        if (local_228 == (Allocator *)0x0) {
          if (local_250 != (void *)0x0) {
            free(local_250);
          }
        }
        else {
          (*local_228->_vptr_Allocator[3])(local_228,local_250);
        }
      }
    }
    auVar98 = (undefined1  [36])local_180._28_36_;
    local_250 = local_180.data;
    local_208 = (void *)local_180.elemsize;
    local_228 = local_180.allocator;
    local_1b0._0_4_ = local_180.dims;
    local_1b0._4_4_ = local_180.w;
    uStack_1a8 = 0;
    local_1d8 = local_180.cstep;
    local_220 = local_180.refcount;
    if (local_180.refcount != (int *)0x0) {
      LOCK();
      *local_180.refcount = *local_180.refcount + -1;
      UNLOCK();
      if (*local_180.refcount == 0) {
        if (local_180.allocator == (Allocator *)0x0) {
LAB_003afe5c:
          local_180._28_36_ = auVar98;
          uStack_1a8 = 0;
          auVar98 = (undefined1  [36])local_180._28_36_;
          if (local_250 != (void *)0x0) {
            free(local_250);
            auVar98 = (undefined1  [36])local_180._28_36_;
          }
        }
        else {
          ppp_Var97 = &(local_180.allocator)->_vptr_Allocator;
          local_180._28_36_ = auVar98;
          (*(*ppp_Var97)[3])();
          auVar98 = (undefined1  [36])local_180._28_36_;
        }
      }
    }
  }
  else {
    uVar101 = b->h;
    if ((uVar102 ^ 3) == 0 && (uVar101 ^ 1) == 0) {
      Mat::reshape(&local_180,b,b->c,(Allocator *)0x0);
      if (local_180.refcount != (int *)0x0) {
        LOCK();
        *local_180.refcount = *local_180.refcount + 1;
        UNLOCK();
      }
      if (local_220 != (int *)0x0) {
        LOCK();
        *local_220 = *local_220 + -1;
        UNLOCK();
        if (*local_220 == 0) {
          if (local_228 == (Allocator *)0x0) {
            if (local_250 != (void *)0x0) {
              free(local_250);
            }
          }
          else {
            (*local_228->_vptr_Allocator[3])(local_228,local_250);
          }
        }
      }
      auVar98 = (undefined1  [36])local_180._28_36_;
      local_250 = local_180.data;
      local_208 = (void *)local_180.elemsize;
      local_228 = local_180.allocator;
      local_1b0._0_4_ = local_180.dims;
      local_1b0._4_4_ = local_180.w;
      uStack_1a8 = 0;
      local_1d8 = local_180.cstep;
      local_220 = local_180.refcount;
      if (local_180.refcount != (int *)0x0) {
        LOCK();
        *local_180.refcount = *local_180.refcount + -1;
        UNLOCK();
        if (*local_180.refcount == 0) {
          if (local_180.allocator == (Allocator *)0x0) goto LAB_003afe5c;
          ppp_Var97 = &(local_180.allocator)->_vptr_Allocator;
          local_180._28_36_ = auVar98;
          (*(*ppp_Var97)[3])();
          auVar98 = (undefined1  [36])local_180._28_36_;
        }
      }
    }
    else if ((uVar102 ^ 3) == 0 && uVar108 == 0) {
      Mat::reshape(&local_180,b,uVar101,b->c,(Allocator *)0x0);
      if (local_180.refcount != (int *)0x0) {
        LOCK();
        *local_180.refcount = *local_180.refcount + 1;
        UNLOCK();
      }
      if (local_220 != (int *)0x0) {
        LOCK();
        *local_220 = *local_220 + -1;
        UNLOCK();
        if (*local_220 == 0) {
          if (local_228 == (Allocator *)0x0) {
            if (local_250 != (void *)0x0) {
              free(local_250);
            }
          }
          else {
            (*local_228->_vptr_Allocator[3])(local_228,local_250);
          }
        }
      }
      auVar98 = (undefined1  [36])local_180._28_36_;
      local_250 = local_180.data;
      local_208 = (void *)local_180.elemsize;
      local_228 = local_180.allocator;
      local_1b0._0_4_ = local_180.dims;
      local_1b0._4_4_ = local_180.w;
      uStack_1a8 = 0;
      local_1d8 = local_180.cstep;
      local_220 = local_180.refcount;
      if (local_180.refcount != (int *)0x0) {
        LOCK();
        *local_180.refcount = *local_180.refcount + -1;
        UNLOCK();
        if (*local_180.refcount == 0) {
          if (local_180.allocator == (Allocator *)0x0) goto LAB_003afe5c;
          ppp_Var97 = &(local_180.allocator)->_vptr_Allocator;
          local_180._28_36_ = auVar98;
          (*(*ppp_Var97)[3])();
          auVar98 = (undefined1  [36])local_180._28_36_;
        }
      }
    }
    else {
      uVar102 = uVar102 ^ 4;
      iVar99 = b->d;
      if (iVar99 == 1 && uVar102 == 0) {
        Mat::reshape(&local_180,b,b->c,(Allocator *)0x0);
        if (local_180.refcount != (int *)0x0) {
          LOCK();
          *local_180.refcount = *local_180.refcount + 1;
          UNLOCK();
        }
        if (local_220 != (int *)0x0) {
          LOCK();
          *local_220 = *local_220 + -1;
          UNLOCK();
          if (*local_220 == 0) {
            if (local_228 == (Allocator *)0x0) {
              if (local_250 != (void *)0x0) {
                free(local_250);
              }
            }
            else {
              (*local_228->_vptr_Allocator[3])(local_228,local_250);
            }
          }
        }
        auVar98 = (undefined1  [36])local_180._28_36_;
        local_250 = local_180.data;
        local_208 = (void *)local_180.elemsize;
        local_228 = local_180.allocator;
        local_1b0._0_4_ = local_180.dims;
        local_1b0._4_4_ = local_180.w;
        uStack_1a8 = 0;
        local_1d8 = local_180.cstep;
        local_220 = local_180.refcount;
        if (local_180.refcount != (int *)0x0) {
          LOCK();
          *local_180.refcount = *local_180.refcount + -1;
          UNLOCK();
          if (*local_180.refcount == 0) {
            if (local_180.allocator == (Allocator *)0x0) goto LAB_003afe5c;
            ppp_Var97 = &(local_180.allocator)->_vptr_Allocator;
            local_180._28_36_ = auVar98;
            (*(*ppp_Var97)[3])();
            auVar98 = (undefined1  [36])local_180._28_36_;
          }
        }
      }
      else if ((uVar101 ^ 1) == 0 && uVar102 == 0) {
        Mat::reshape(&local_180,b,iVar99,b->c,(Allocator *)0x0);
        if (local_180.refcount != (int *)0x0) {
          LOCK();
          *local_180.refcount = *local_180.refcount + 1;
          UNLOCK();
        }
        if (local_220 != (int *)0x0) {
          LOCK();
          *local_220 = *local_220 + -1;
          UNLOCK();
          if (*local_220 == 0) {
            if (local_228 == (Allocator *)0x0) {
              if (local_250 != (void *)0x0) {
                free(local_250);
              }
            }
            else {
              (*local_228->_vptr_Allocator[3])(local_228,local_250);
            }
          }
        }
        auVar98 = (undefined1  [36])local_180._28_36_;
        local_250 = local_180.data;
        local_208 = (void *)local_180.elemsize;
        local_228 = local_180.allocator;
        local_1b0._0_4_ = local_180.dims;
        local_1b0._4_4_ = local_180.w;
        uStack_1a8 = 0;
        local_1d8 = local_180.cstep;
        local_220 = local_180.refcount;
        if (local_180.refcount != (int *)0x0) {
          LOCK();
          *local_180.refcount = *local_180.refcount + -1;
          UNLOCK();
          if (*local_180.refcount == 0) {
            if (local_180.allocator == (Allocator *)0x0) goto LAB_003afe5c;
            ppp_Var97 = &(local_180.allocator)->_vptr_Allocator;
            local_180._28_36_ = auVar98;
            (*(*ppp_Var97)[3])();
            auVar98 = (undefined1  [36])local_180._28_36_;
          }
        }
      }
      else {
        if (uVar102 != 0 || uVar108 != 0) goto LAB_003afe92;
        Mat::reshape(&local_180,b,uVar101,iVar99,b->c,(Allocator *)0x0);
        if (local_180.refcount != (int *)0x0) {
          LOCK();
          *local_180.refcount = *local_180.refcount + 1;
          UNLOCK();
        }
        if (local_220 != (int *)0x0) {
          LOCK();
          *local_220 = *local_220 + -1;
          UNLOCK();
          if (*local_220 == 0) {
            if (local_228 == (Allocator *)0x0) {
              if (local_250 != (void *)0x0) {
                free(local_250);
              }
            }
            else {
              (*local_228->_vptr_Allocator[3])(local_228,local_250);
            }
          }
        }
        auVar98 = (undefined1  [36])local_180._28_36_;
        local_250 = local_180.data;
        local_208 = (void *)local_180.elemsize;
        local_228 = local_180.allocator;
        local_1b0._0_4_ = local_180.dims;
        local_1b0._4_4_ = local_180.w;
        uStack_1a8 = 0;
        local_1d8 = local_180.cstep;
        local_220 = local_180.refcount;
        if (local_180.refcount != (int *)0x0) {
          LOCK();
          *local_180.refcount = *local_180.refcount + -1;
          UNLOCK();
          if (*local_180.refcount == 0) {
            if (local_180.allocator == (Allocator *)0x0) goto LAB_003afe5c;
            ppp_Var97 = &(local_180.allocator)->_vptr_Allocator;
            local_180._28_36_ = auVar98;
            (*(*ppp_Var97)[3])();
            auVar98 = (undefined1  [36])local_180._28_36_;
          }
        }
      }
    }
  }
  local_180._28_36_ = auVar98;
  auVar98 = (undefined1  [36])local_180._28_36_;
  local_180.cstep = 0;
  local_180._0_16_ = ZEXT816(0);
  local_180._0_28_ = ZEXT1228((undefined1  [12])local_180._0_12_);
  local_180._60_4_ = auVar98._32_4_;
  local_180._0_60_ = ZEXT4060((undefined1  [40])local_180._0_40_);
LAB_003afe92:
  local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
  switch(op_type) {
  case 0:
    iVar99 = local_240->w;
    uVar102 = local_240->h;
    uVar103 = (ulong)uVar102;
    uVar108 = local_240->d;
    local_1f0._0_8_ = CONCAT44(0,uVar108);
    uVar101 = local_240->c;
    local_238 = (void *)(ulong)uVar101;
    iVar121 = local_240->elempack;
    if (0 < (int)uVar102 && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      uVar109 = iVar121 * iVar99;
      uVar111 = 0;
      do {
        fVar186 = *(float *)((long)local_250 + uVar111 * 4);
        if (iVar121 == 4) {
          auVar217 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10);
        }
        else {
          auVar217._4_4_ = fVar186;
          auVar217._0_4_ = fVar186;
          auVar217._8_4_ = fVar186;
          auVar217._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar272 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20);
        }
        else {
          auVar272._16_16_ = auVar217;
          auVar272._0_16_ = auVar217;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar272),auVar272,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * uVar111 * local_240->elemsize + (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * uVar111 * local_218->elemsize + (long)local_218->data);
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vaddps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          fVar58 = *(float *)(*pauVar116 + 4);
          fVar59 = *(float *)(*pauVar116 + 8);
          fVar60 = *(float *)(*pauVar116 + 0xc);
          fVar61 = *(float *)(*pauVar116 + 0x10);
          fVar62 = *(float *)(*pauVar116 + 0x14);
          fVar63 = *(float *)(*pauVar116 + 0x18);
          fVar64 = *(float *)(*pauVar116 + 0x1c);
          *(float *)*pauVar112 = auVar272._0_4_ + *(float *)*pauVar116;
          *(float *)((long)*pauVar112 + 4) = auVar272._4_4_ + fVar58;
          *(float *)((long)*pauVar112 + 8) = auVar272._8_4_ + fVar59;
          *(float *)((long)*pauVar112 + 0xc) = auVar272._12_4_ + fVar60;
          *(float *)((long)*pauVar112 + 0x10) = auVar272._16_4_ + fVar61;
          *(float *)((long)*pauVar112 + 0x14) = auVar272._20_4_ + fVar62;
          *(float *)((long)*pauVar112 + 0x18) = auVar272._24_4_ + fVar63;
          *(float *)((long)*pauVar112 + 0x1c) = auVar272._28_4_ + fVar64;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar257._0_4_ = auVar217._0_4_ + *(float *)*pauVar116;
          auVar257._4_4_ = auVar217._4_4_ + *(float *)(*pauVar116 + 4);
          auVar257._8_4_ = auVar217._8_4_ + *(float *)(*pauVar116 + 8);
          auVar257._12_4_ = auVar217._12_4_ + *(float *)(*pauVar116 + 0xc);
          *(undefined1 (*) [16])*pauVar112 = auVar257;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 fVar186 + *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        uVar111 = uVar111 + 1;
      } while (uVar111 != uVar103);
    }
    if ((0 < (int)uVar101 && (uint)local_1b0 == 1) && local_240->dims - 3U < 2) {
      uVar109 = uVar102 * uVar108 * iVar121 * iVar99;
      pvVar120 = (void *)0x0;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        if (iVar121 == 4) {
          auVar218 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar218._4_4_ = fVar186;
          auVar218._0_4_ = fVar186;
          auVar218._8_4_ = fVar186;
          auVar218._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar273 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar273._16_16_ = auVar218;
          auVar273._0_16_ = auVar218;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar273),auVar273,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vaddps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          fVar58 = *(float *)(*pauVar116 + 4);
          fVar59 = *(float *)(*pauVar116 + 8);
          fVar60 = *(float *)(*pauVar116 + 0xc);
          fVar61 = *(float *)(*pauVar116 + 0x10);
          fVar62 = *(float *)(*pauVar116 + 0x14);
          fVar63 = *(float *)(*pauVar116 + 0x18);
          fVar64 = *(float *)(*pauVar116 + 0x1c);
          *(float *)*pauVar112 = auVar273._0_4_ + *(float *)*pauVar116;
          *(float *)((long)*pauVar112 + 4) = auVar273._4_4_ + fVar58;
          *(float *)((long)*pauVar112 + 8) = auVar273._8_4_ + fVar59;
          *(float *)((long)*pauVar112 + 0xc) = auVar273._12_4_ + fVar60;
          *(float *)((long)*pauVar112 + 0x10) = auVar273._16_4_ + fVar61;
          *(float *)((long)*pauVar112 + 0x14) = auVar273._20_4_ + fVar62;
          *(float *)((long)*pauVar112 + 0x18) = auVar273._24_4_ + fVar63;
          *(float *)((long)*pauVar112 + 0x1c) = auVar273._28_4_ + fVar64;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar258._0_4_ = auVar218._0_4_ + *(float *)*pauVar116;
          auVar258._4_4_ = auVar218._4_4_ + *(float *)(*pauVar116 + 4);
          auVar258._8_4_ = auVar218._8_4_ + *(float *)(*pauVar116 + 8);
          auVar258._12_4_ = auVar218._12_4_ + *(float *)(*pauVar116 + 0xc);
          *(undefined1 (*) [16])*pauVar112 = auVar258;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 fVar186 + *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1f8 = (void *)CONCAT44(local_1f8._4_4_,(uint)local_1b0);
    local_200 = (void *)(CONCAT44(local_200._4_4_,(uint)local_1b0) ^ 2);
    if ((local_240->dims == 3 && (uint)local_1b0 == 2) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99;
      auVar65._4_4_ = local_1b0._4_4_;
      auVar65._0_4_ = (uint)local_1b0;
      auVar65._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar65,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar102) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar112 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar116 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar219 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar219._4_4_ = fVar186;
              auVar219._0_4_ = fVar186;
              auVar219._8_4_ = fVar186;
              auVar219._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar274 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar274._16_16_ = auVar219;
              auVar274._0_16_ = auVar219;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar274),auVar274,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vaddps_avx512f(auVar123,*pauVar116);
                *pauVar112 = auVar124;
                pauVar116 = pauVar116 + 1;
                pauVar112 = pauVar112 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              fVar58 = *(float *)(*pauVar116 + 4);
              fVar59 = *(float *)(*pauVar116 + 8);
              fVar60 = *(float *)(*pauVar116 + 0xc);
              fVar61 = *(float *)(*pauVar116 + 0x10);
              fVar62 = *(float *)(*pauVar116 + 0x14);
              fVar63 = *(float *)(*pauVar116 + 0x18);
              fVar64 = *(float *)(*pauVar116 + 0x1c);
              *(float *)*pauVar112 = auVar274._0_4_ + *(float *)*pauVar116;
              *(float *)((long)*pauVar112 + 4) = auVar274._4_4_ + fVar58;
              *(float *)((long)*pauVar112 + 8) = auVar274._8_4_ + fVar59;
              *(float *)((long)*pauVar112 + 0xc) = auVar274._12_4_ + fVar60;
              *(float *)((long)*pauVar112 + 0x10) = auVar274._16_4_ + fVar61;
              *(float *)((long)*pauVar112 + 0x14) = auVar274._20_4_ + fVar62;
              *(float *)((long)*pauVar112 + 0x18) = auVar274._24_4_ + fVar63;
              *(float *)((long)*pauVar112 + 0x1c) = auVar274._28_4_ + fVar64;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar259._0_4_ = auVar219._0_4_ + *(float *)*pauVar116;
              auVar259._4_4_ = auVar219._4_4_ + *(float *)(*pauVar116 + 4);
              auVar259._8_4_ = auVar219._8_4_ + *(float *)(*pauVar116 + 8);
              auVar259._12_4_ = auVar219._12_4_ + *(float *)(*pauVar116 + 0xc);
              *(undefined1 (*) [16])*pauVar112 = auVar259;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar122 = 0;
              lVar110 = 0;
              do {
                *(float *)((long)*pauVar112 + lVar122 * 4) =
                     fVar186 + *(float *)(*pauVar116 + lVar122 * 4);
                lVar110 = lVar110 + -4;
                lVar122 = lVar122 + 1;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != uVar103);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    if ((local_240->dims == 4 && (uint)local_200 == 0) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99 * uVar102;
      auVar66._4_4_ = local_1b0._4_4_;
      auVar66._0_4_ = (uint)local_1b0;
      auVar66._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar66,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar220 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar220._4_4_ = fVar186;
              auVar220._0_4_ = fVar186;
              auVar220._8_4_ = fVar186;
              auVar220._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar275 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar275._16_16_ = auVar220;
              auVar275._0_16_ = auVar220;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar275),auVar275,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vaddps_avx512f(auVar123,*pauVar112);
                *pauVar116 = auVar124;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              fVar58 = *(float *)(*pauVar112 + 4);
              fVar59 = *(float *)(*pauVar112 + 8);
              fVar60 = *(float *)(*pauVar112 + 0xc);
              fVar61 = *(float *)(*pauVar112 + 0x10);
              fVar62 = *(float *)(*pauVar112 + 0x14);
              fVar63 = *(float *)(*pauVar112 + 0x18);
              fVar64 = *(float *)(*pauVar112 + 0x1c);
              *(float *)*pauVar116 = auVar275._0_4_ + *(float *)*pauVar112;
              *(float *)((long)*pauVar116 + 4) = auVar275._4_4_ + fVar58;
              *(float *)((long)*pauVar116 + 8) = auVar275._8_4_ + fVar59;
              *(float *)((long)*pauVar116 + 0xc) = auVar275._12_4_ + fVar60;
              *(float *)((long)*pauVar116 + 0x10) = auVar275._16_4_ + fVar61;
              *(float *)((long)*pauVar116 + 0x14) = auVar275._20_4_ + fVar62;
              *(float *)((long)*pauVar116 + 0x18) = auVar275._24_4_ + fVar63;
              *(float *)((long)*pauVar116 + 0x1c) = auVar275._28_4_ + fVar64;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar260._0_4_ = auVar220._0_4_ + *(float *)*pauVar112;
              auVar260._4_4_ = auVar220._4_4_ + *(float *)(*pauVar112 + 4);
              auVar260._8_4_ = auVar220._8_4_ + *(float *)(*pauVar112 + 8);
              auVar260._12_4_ = auVar220._12_4_ + *(float *)(*pauVar112 + 0xc);
              *(undefined1 (*) [16])*pauVar116 = auVar260;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar110 = 0;
              lVar122 = 0;
              do {
                *(float *)((long)*pauVar116 + lVar122 * 4) =
                     fVar186 + *(float *)(*pauVar112 + lVar122 * 4);
                lVar122 = lVar122 + 1;
                lVar110 = lVar110 + -4;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_1b0 == 3 && local_240->dims == 4) && 0 < (int)uVar101) {
      uVar101 = iVar99 * iVar121;
      auVar67._4_4_ = local_1b0._4_4_;
      auVar67._0_4_ = (uint)local_1b0;
      auVar67._8_8_ = uStack_1a8;
      iVar99 = vextractps_avx(auVar67,1);
      local_1d8 = local_1d8 * (long)local_208;
      local_230 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_230 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_230 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            if (0 < (int)uVar102) {
              lVar107 = (long)iVar99 * (long)local_208 * uVar111 + local_1d8 * (long)local_230;
              uVar119 = 0;
              do {
                fVar186 = *(float *)((long)local_250 + uVar119 * 4 + lVar107);
                if (iVar121 == 4) {
                  auVar221 = *(undefined1 (*) [16])((long)local_250 + uVar119 * 0x10 + lVar107);
                }
                else {
                  auVar221._4_4_ = fVar186;
                  auVar221._0_4_ = fVar186;
                  auVar221._8_4_ = fVar186;
                  auVar221._12_4_ = fVar186;
                }
                if (iVar121 == 8) {
                  auVar276 = *(undefined1 (*) [32])((long)local_250 + uVar119 * 0x20 + lVar107);
                }
                else {
                  auVar276._16_16_ = auVar221;
                  auVar276._0_16_ = auVar221;
                }
                if (iVar121 == 0x10) {
                  auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar119 * 0x40 + lVar107);
                }
                else {
                  auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar276),auVar276,1);
                }
                uVar109 = 0;
                if (0xf < (int)uVar101) {
                  iVar100 = 0xf;
                  do {
                    auVar124 = vaddps_avx512f(auVar123,*pauVar112);
                    *pauVar116 = auVar124;
                    pauVar112 = pauVar112 + 1;
                    pauVar116 = pauVar116 + 1;
                    iVar100 = iVar100 + 0x10;
                    uVar109 = uVar101 & 0xfffffff0;
                  } while (iVar100 < (int)uVar101);
                }
                uVar106 = uVar109 | 7;
                while ((int)uVar106 < (int)uVar101) {
                  fVar58 = *(float *)(*pauVar112 + 4);
                  fVar59 = *(float *)(*pauVar112 + 8);
                  fVar60 = *(float *)(*pauVar112 + 0xc);
                  fVar61 = *(float *)(*pauVar112 + 0x10);
                  fVar62 = *(float *)(*pauVar112 + 0x14);
                  fVar63 = *(float *)(*pauVar112 + 0x18);
                  fVar64 = *(float *)(*pauVar112 + 0x1c);
                  *(float *)*pauVar116 = auVar276._0_4_ + *(float *)*pauVar112;
                  *(float *)((long)*pauVar116 + 4) = auVar276._4_4_ + fVar58;
                  *(float *)((long)*pauVar116 + 8) = auVar276._8_4_ + fVar59;
                  *(float *)((long)*pauVar116 + 0xc) = auVar276._12_4_ + fVar60;
                  *(float *)((long)*pauVar116 + 0x10) = auVar276._16_4_ + fVar61;
                  *(float *)((long)*pauVar116 + 0x14) = auVar276._20_4_ + fVar62;
                  *(float *)((long)*pauVar116 + 0x18) = auVar276._24_4_ + fVar63;
                  *(float *)((long)*pauVar116 + 0x1c) = auVar276._28_4_ + fVar64;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
                  uVar106 = uVar109 + 0xf;
                  uVar109 = uVar109 + 8;
                }
                uVar106 = uVar109 | 3;
                while ((int)uVar106 < (int)uVar101) {
                  auVar261._0_4_ = auVar221._0_4_ + *(float *)*pauVar112;
                  auVar261._4_4_ = auVar221._4_4_ + *(float *)(*pauVar112 + 4);
                  auVar261._8_4_ = auVar221._8_4_ + *(float *)(*pauVar112 + 8);
                  auVar261._12_4_ = auVar221._12_4_ + *(float *)(*pauVar112 + 0xc);
                  *(undefined1 (*) [16])*pauVar116 = auVar261;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
                  uVar106 = uVar109 + 7;
                  uVar109 = uVar109 + 4;
                }
                if (uVar101 - uVar109 != 0 && (int)uVar109 <= (int)uVar101) {
                  lVar110 = 0;
                  lVar122 = 0;
                  do {
                    *(float *)((long)*pauVar116 + lVar122 * 4) =
                         fVar186 + *(float *)(*pauVar112 + lVar122 * 4);
                    lVar122 = lVar122 + 1;
                    lVar110 = lVar110 + -4;
                  } while (uVar101 - uVar109 != (int)lVar122);
                  pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
                }
                uVar119 = uVar119 + 1;
              } while (uVar119 != uVar103);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        local_230 = (void *)((long)local_230 + 1);
        local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
      } while (local_230 != local_238);
    }
    break;
  case 1:
    iVar99 = local_240->w;
    uVar102 = local_240->h;
    uVar103 = (ulong)uVar102;
    uVar108 = local_240->d;
    local_1f0._0_8_ = CONCAT44(0,uVar108);
    uVar101 = local_240->c;
    local_238 = (void *)(ulong)uVar101;
    iVar121 = local_240->elempack;
    if (0 < (int)uVar102 && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      uVar109 = iVar121 * iVar99;
      uVar111 = 0;
      do {
        fVar186 = *(float *)((long)local_250 + uVar111 * 4);
        if (iVar121 == 4) {
          auVar237 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10);
        }
        else {
          auVar237._4_4_ = fVar186;
          auVar237._0_4_ = fVar186;
          auVar237._8_4_ = fVar186;
          auVar237._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar292 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20);
        }
        else {
          auVar292._16_16_ = auVar237;
          auVar292._0_16_ = auVar237;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar292),auVar292,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * uVar111 * local_240->elemsize + (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * uVar111 * local_218->elemsize + (long)local_218->data);
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vsubps_avx512f(*pauVar116,auVar123);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          auVar197 = vsubps_avx(*(undefined1 (*) [32])*pauVar116,auVar292);
          *(undefined1 (*) [32])*pauVar112 = auVar197;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar187 = vsubps_avx(*(undefined1 (*) [16])*pauVar116,auVar237);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 *(float *)(*pauVar116 + lVar107 * 4) - fVar186;
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        uVar111 = uVar111 + 1;
      } while (uVar111 != uVar103);
    }
    if ((0 < (int)uVar101 && (uint)local_1b0 == 1) && local_240->dims - 3U < 2) {
      uVar109 = uVar102 * uVar108 * iVar121 * iVar99;
      pvVar120 = (void *)0x0;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        if (iVar121 == 4) {
          auVar238 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar238._4_4_ = fVar186;
          auVar238._0_4_ = fVar186;
          auVar238._8_4_ = fVar186;
          auVar238._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar293 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar293._16_16_ = auVar238;
          auVar293._0_16_ = auVar238;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar293),auVar293,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vsubps_avx512f(*pauVar116,auVar123);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          auVar197 = vsubps_avx(*(undefined1 (*) [32])*pauVar116,auVar293);
          *(undefined1 (*) [32])*pauVar112 = auVar197;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar187 = vsubps_avx(*(undefined1 (*) [16])*pauVar116,auVar238);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 *(float *)(*pauVar116 + lVar107 * 4) - fVar186;
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1f8 = (void *)CONCAT44(local_1f8._4_4_,(uint)local_1b0);
    local_200 = (void *)(CONCAT44(local_200._4_4_,(uint)local_1b0) ^ 2);
    if ((local_240->dims == 3 && (uint)local_1b0 == 2) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99;
      auVar84._4_4_ = local_1b0._4_4_;
      auVar84._0_4_ = (uint)local_1b0;
      auVar84._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar84,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar102) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar112 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar116 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar239 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar239._4_4_ = fVar186;
              auVar239._0_4_ = fVar186;
              auVar239._8_4_ = fVar186;
              auVar239._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar294 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar294._16_16_ = auVar239;
              auVar294._0_16_ = auVar239;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar294),auVar294,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vsubps_avx512f(*pauVar116,auVar123);
                *pauVar112 = auVar124;
                pauVar116 = pauVar116 + 1;
                pauVar112 = pauVar112 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              auVar197 = vsubps_avx(*(undefined1 (*) [32])*pauVar116,auVar294);
              *(undefined1 (*) [32])*pauVar112 = auVar197;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar187 = vsubps_avx(*(undefined1 (*) [16])*pauVar116,auVar239);
              *(undefined1 (*) [16])*pauVar112 = auVar187;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar122 = 0;
              lVar110 = 0;
              do {
                *(float *)((long)*pauVar112 + lVar122 * 4) =
                     *(float *)(*pauVar116 + lVar122 * 4) - fVar186;
                lVar110 = lVar110 + -4;
                lVar122 = lVar122 + 1;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != uVar103);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    if ((local_240->dims == 4 && (uint)local_200 == 0) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99 * uVar102;
      auVar85._4_4_ = local_1b0._4_4_;
      auVar85._0_4_ = (uint)local_1b0;
      auVar85._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar85,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar240 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar240._4_4_ = fVar186;
              auVar240._0_4_ = fVar186;
              auVar240._8_4_ = fVar186;
              auVar240._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar295 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar295._16_16_ = auVar240;
              auVar295._0_16_ = auVar240;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar295),auVar295,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vsubps_avx512f(*pauVar112,auVar123);
                *pauVar116 = auVar124;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              auVar197 = vsubps_avx(*(undefined1 (*) [32])*pauVar112,auVar295);
              *(undefined1 (*) [32])*pauVar116 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar187 = vsubps_avx(*(undefined1 (*) [16])*pauVar112,auVar240);
              *(undefined1 (*) [16])*pauVar116 = auVar187;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar110 = 0;
              lVar122 = 0;
              do {
                *(float *)((long)*pauVar116 + lVar122 * 4) =
                     *(float *)(*pauVar112 + lVar122 * 4) - fVar186;
                lVar122 = lVar122 + 1;
                lVar110 = lVar110 + -4;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_1b0 == 3 && local_240->dims == 4) && 0 < (int)uVar101) {
      uVar101 = iVar99 * iVar121;
      auVar86._4_4_ = local_1b0._4_4_;
      auVar86._0_4_ = (uint)local_1b0;
      auVar86._8_8_ = uStack_1a8;
      iVar99 = vextractps_avx(auVar86,1);
      local_1d8 = local_1d8 * (long)local_208;
      local_230 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_230 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_230 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            if (0 < (int)uVar102) {
              lVar107 = (long)iVar99 * (long)local_208 * uVar111 + local_1d8 * (long)local_230;
              uVar119 = 0;
              do {
                fVar186 = *(float *)((long)local_250 + uVar119 * 4 + lVar107);
                if (iVar121 == 4) {
                  auVar241 = *(undefined1 (*) [16])((long)local_250 + uVar119 * 0x10 + lVar107);
                }
                else {
                  auVar241._4_4_ = fVar186;
                  auVar241._0_4_ = fVar186;
                  auVar241._8_4_ = fVar186;
                  auVar241._12_4_ = fVar186;
                }
                if (iVar121 == 8) {
                  auVar296 = *(undefined1 (*) [32])((long)local_250 + uVar119 * 0x20 + lVar107);
                }
                else {
                  auVar296._16_16_ = auVar241;
                  auVar296._0_16_ = auVar241;
                }
                if (iVar121 == 0x10) {
                  auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar119 * 0x40 + lVar107);
                }
                else {
                  auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar296),auVar296,1);
                }
                uVar109 = 0;
                if (0xf < (int)uVar101) {
                  iVar100 = 0xf;
                  do {
                    auVar124 = vsubps_avx512f(*pauVar112,auVar123);
                    *pauVar116 = auVar124;
                    pauVar112 = pauVar112 + 1;
                    pauVar116 = pauVar116 + 1;
                    iVar100 = iVar100 + 0x10;
                    uVar109 = uVar101 & 0xfffffff0;
                  } while (iVar100 < (int)uVar101);
                }
                uVar106 = uVar109 | 7;
                while ((int)uVar106 < (int)uVar101) {
                  auVar197 = vsubps_avx(*(undefined1 (*) [32])*pauVar112,auVar296);
                  *(undefined1 (*) [32])*pauVar116 = auVar197;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
                  uVar106 = uVar109 + 0xf;
                  uVar109 = uVar109 + 8;
                }
                uVar106 = uVar109 | 3;
                while ((int)uVar106 < (int)uVar101) {
                  auVar187 = vsubps_avx(*(undefined1 (*) [16])*pauVar112,auVar241);
                  *(undefined1 (*) [16])*pauVar116 = auVar187;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
                  uVar106 = uVar109 + 7;
                  uVar109 = uVar109 + 4;
                }
                if (uVar101 - uVar109 != 0 && (int)uVar109 <= (int)uVar101) {
                  lVar110 = 0;
                  lVar122 = 0;
                  do {
                    *(float *)((long)*pauVar116 + lVar122 * 4) =
                         *(float *)(*pauVar112 + lVar122 * 4) - fVar186;
                    lVar122 = lVar122 + 1;
                    lVar110 = lVar110 + -4;
                  } while (uVar101 - uVar109 != (int)lVar122);
                  pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
                }
                uVar119 = uVar119 + 1;
              } while (uVar119 != uVar103);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        local_230 = (void *)((long)local_230 + 1);
        local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
      } while (local_230 != local_238);
    }
    break;
  case 2:
    iVar99 = local_240->w;
    uVar102 = local_240->h;
    uVar103 = (ulong)uVar102;
    uVar108 = local_240->d;
    local_1f0._0_8_ = CONCAT44(0,uVar108);
    uVar101 = local_240->c;
    local_238 = (void *)(ulong)uVar101;
    iVar121 = local_240->elempack;
    if (0 < (int)uVar102 && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      uVar109 = iVar121 * iVar99;
      uVar111 = 0;
      do {
        fVar186 = *(float *)((long)local_250 + uVar111 * 4);
        if (iVar121 == 4) {
          auVar227 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10);
        }
        else {
          auVar227._4_4_ = fVar186;
          auVar227._0_4_ = fVar186;
          auVar227._8_4_ = fVar186;
          auVar227._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar282 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20);
        }
        else {
          auVar282._16_16_ = auVar227;
          auVar282._0_16_ = auVar227;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar282),auVar282,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * uVar111 * local_240->elemsize + (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * uVar111 * local_218->elemsize + (long)local_218->data);
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vmulps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          auVar307._0_4_ = auVar282._0_4_ * *(float *)*pauVar116;
          auVar307._4_4_ = auVar282._4_4_ * *(float *)(*pauVar116 + 4);
          auVar307._8_4_ = auVar282._8_4_ * *(float *)(*pauVar116 + 8);
          auVar307._12_4_ = auVar282._12_4_ * *(float *)(*pauVar116 + 0xc);
          auVar307._16_4_ = auVar282._16_4_ * *(float *)(*pauVar116 + 0x10);
          auVar307._20_4_ = auVar282._20_4_ * *(float *)(*pauVar116 + 0x14);
          auVar307._28_36_ = auVar123._28_36_;
          auVar307._24_4_ = auVar282._24_4_ * *(float *)(*pauVar116 + 0x18);
          auVar123 = ZEXT3264(auVar307._0_32_);
          *(undefined1 (*) [32])*pauVar112 = auVar307._0_32_;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar262._0_4_ = auVar227._0_4_ * *(float *)*pauVar116;
          auVar262._4_4_ = auVar227._4_4_ * *(float *)(*pauVar116 + 4);
          auVar262._8_4_ = auVar227._8_4_ * *(float *)(*pauVar116 + 8);
          auVar262._12_4_ = auVar227._12_4_ * *(float *)(*pauVar116 + 0xc);
          *(undefined1 (*) [16])*pauVar112 = auVar262;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 fVar186 * *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        uVar111 = uVar111 + 1;
      } while (uVar111 != uVar103);
    }
    if ((0 < (int)uVar101 && (uint)local_1b0 == 1) && local_240->dims - 3U < 2) {
      uVar109 = uVar102 * uVar108 * iVar121 * iVar99;
      pvVar120 = (void *)0x0;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        if (iVar121 == 4) {
          auVar228 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar228._4_4_ = fVar186;
          auVar228._0_4_ = fVar186;
          auVar228._8_4_ = fVar186;
          auVar228._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar283 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar283._16_16_ = auVar228;
          auVar283._0_16_ = auVar228;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar283),auVar283,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vmulps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          auVar308._0_4_ = auVar283._0_4_ * *(float *)*pauVar116;
          auVar308._4_4_ = auVar283._4_4_ * *(float *)(*pauVar116 + 4);
          auVar308._8_4_ = auVar283._8_4_ * *(float *)(*pauVar116 + 8);
          auVar308._12_4_ = auVar283._12_4_ * *(float *)(*pauVar116 + 0xc);
          auVar308._16_4_ = auVar283._16_4_ * *(float *)(*pauVar116 + 0x10);
          auVar308._20_4_ = auVar283._20_4_ * *(float *)(*pauVar116 + 0x14);
          auVar308._28_36_ = auVar123._28_36_;
          auVar308._24_4_ = auVar283._24_4_ * *(float *)(*pauVar116 + 0x18);
          auVar123 = ZEXT3264(auVar308._0_32_);
          *(undefined1 (*) [32])*pauVar112 = auVar308._0_32_;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar263._0_4_ = auVar228._0_4_ * *(float *)*pauVar116;
          auVar263._4_4_ = auVar228._4_4_ * *(float *)(*pauVar116 + 4);
          auVar263._8_4_ = auVar228._8_4_ * *(float *)(*pauVar116 + 8);
          auVar263._12_4_ = auVar228._12_4_ * *(float *)(*pauVar116 + 0xc);
          *(undefined1 (*) [16])*pauVar112 = auVar263;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 fVar186 * *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1f8 = (void *)CONCAT44(local_1f8._4_4_,(uint)local_1b0);
    local_200 = (void *)(CONCAT44(local_200._4_4_,(uint)local_1b0) ^ 2);
    if ((local_240->dims == 3 && (uint)local_1b0 == 2) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99;
      auVar75._4_4_ = local_1b0._4_4_;
      auVar75._0_4_ = (uint)local_1b0;
      auVar75._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar75,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar102) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar112 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar116 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar229 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar229._4_4_ = fVar186;
              auVar229._0_4_ = fVar186;
              auVar229._8_4_ = fVar186;
              auVar229._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar284 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar284._16_16_ = auVar229;
              auVar284._0_16_ = auVar229;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar284),auVar284,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vmulps_avx512f(auVar123,*pauVar116);
                *pauVar112 = auVar124;
                pauVar116 = pauVar116 + 1;
                pauVar112 = pauVar112 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              auVar309._0_4_ = auVar284._0_4_ * *(float *)*pauVar116;
              auVar309._4_4_ = auVar284._4_4_ * *(float *)(*pauVar116 + 4);
              auVar309._8_4_ = auVar284._8_4_ * *(float *)(*pauVar116 + 8);
              auVar309._12_4_ = auVar284._12_4_ * *(float *)(*pauVar116 + 0xc);
              auVar309._16_4_ = auVar284._16_4_ * *(float *)(*pauVar116 + 0x10);
              auVar309._20_4_ = auVar284._20_4_ * *(float *)(*pauVar116 + 0x14);
              auVar309._28_36_ = auVar123._28_36_;
              auVar309._24_4_ = auVar284._24_4_ * *(float *)(*pauVar116 + 0x18);
              auVar123 = ZEXT3264(auVar309._0_32_);
              *(undefined1 (*) [32])*pauVar112 = auVar309._0_32_;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar264._0_4_ = auVar229._0_4_ * *(float *)*pauVar116;
              auVar264._4_4_ = auVar229._4_4_ * *(float *)(*pauVar116 + 4);
              auVar264._8_4_ = auVar229._8_4_ * *(float *)(*pauVar116 + 8);
              auVar264._12_4_ = auVar229._12_4_ * *(float *)(*pauVar116 + 0xc);
              *(undefined1 (*) [16])*pauVar112 = auVar264;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar122 = 0;
              lVar110 = 0;
              do {
                *(float *)((long)*pauVar112 + lVar122 * 4) =
                     fVar186 * *(float *)(*pauVar116 + lVar122 * 4);
                lVar110 = lVar110 + -4;
                lVar122 = lVar122 + 1;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != uVar103);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    if ((local_240->dims == 4 && (uint)local_200 == 0) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99 * uVar102;
      auVar76._4_4_ = local_1b0._4_4_;
      auVar76._0_4_ = (uint)local_1b0;
      auVar76._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar76,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar230 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar230._4_4_ = fVar186;
              auVar230._0_4_ = fVar186;
              auVar230._8_4_ = fVar186;
              auVar230._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar285 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar285._16_16_ = auVar230;
              auVar285._0_16_ = auVar230;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar285),auVar285,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vmulps_avx512f(auVar123,*pauVar112);
                *pauVar116 = auVar124;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              auVar310._0_4_ = auVar285._0_4_ * *(float *)*pauVar112;
              auVar310._4_4_ = auVar285._4_4_ * *(float *)(*pauVar112 + 4);
              auVar310._8_4_ = auVar285._8_4_ * *(float *)(*pauVar112 + 8);
              auVar310._12_4_ = auVar285._12_4_ * *(float *)(*pauVar112 + 0xc);
              auVar310._16_4_ = auVar285._16_4_ * *(float *)(*pauVar112 + 0x10);
              auVar310._20_4_ = auVar285._20_4_ * *(float *)(*pauVar112 + 0x14);
              auVar310._28_36_ = auVar123._28_36_;
              auVar310._24_4_ = auVar285._24_4_ * *(float *)(*pauVar112 + 0x18);
              auVar123 = ZEXT3264(auVar310._0_32_);
              *(undefined1 (*) [32])*pauVar116 = auVar310._0_32_;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar265._0_4_ = auVar230._0_4_ * *(float *)*pauVar112;
              auVar265._4_4_ = auVar230._4_4_ * *(float *)(*pauVar112 + 4);
              auVar265._8_4_ = auVar230._8_4_ * *(float *)(*pauVar112 + 8);
              auVar265._12_4_ = auVar230._12_4_ * *(float *)(*pauVar112 + 0xc);
              *(undefined1 (*) [16])*pauVar116 = auVar265;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar110 = 0;
              lVar122 = 0;
              do {
                *(float *)((long)*pauVar116 + lVar122 * 4) =
                     fVar186 * *(float *)(*pauVar112 + lVar122 * 4);
                lVar122 = lVar122 + 1;
                lVar110 = lVar110 + -4;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_1b0 == 3 && local_240->dims == 4) && 0 < (int)uVar101) {
      uVar101 = iVar99 * iVar121;
      auVar77._4_4_ = local_1b0._4_4_;
      auVar77._0_4_ = (uint)local_1b0;
      auVar77._8_8_ = uStack_1a8;
      iVar99 = vextractps_avx(auVar77,1);
      local_1d8 = local_1d8 * (long)local_208;
      local_230 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_230 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_230 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            if (0 < (int)uVar102) {
              lVar107 = (long)iVar99 * (long)local_208 * uVar111 + local_1d8 * (long)local_230;
              uVar119 = 0;
              do {
                fVar186 = *(float *)((long)local_250 + uVar119 * 4 + lVar107);
                if (iVar121 == 4) {
                  auVar231 = *(undefined1 (*) [16])((long)local_250 + uVar119 * 0x10 + lVar107);
                }
                else {
                  auVar231._4_4_ = fVar186;
                  auVar231._0_4_ = fVar186;
                  auVar231._8_4_ = fVar186;
                  auVar231._12_4_ = fVar186;
                }
                if (iVar121 == 8) {
                  auVar286 = *(undefined1 (*) [32])((long)local_250 + uVar119 * 0x20 + lVar107);
                }
                else {
                  auVar286._16_16_ = auVar231;
                  auVar286._0_16_ = auVar231;
                }
                if (iVar121 == 0x10) {
                  auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar119 * 0x40 + lVar107);
                }
                else {
                  auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar286),auVar286,1);
                }
                uVar109 = 0;
                if (0xf < (int)uVar101) {
                  iVar100 = 0xf;
                  do {
                    auVar124 = vmulps_avx512f(auVar123,*pauVar112);
                    *pauVar116 = auVar124;
                    pauVar112 = pauVar112 + 1;
                    pauVar116 = pauVar116 + 1;
                    iVar100 = iVar100 + 0x10;
                    uVar109 = uVar101 & 0xfffffff0;
                  } while (iVar100 < (int)uVar101);
                }
                uVar106 = uVar109 | 7;
                while ((int)uVar106 < (int)uVar101) {
                  auVar311._0_4_ = auVar286._0_4_ * *(float *)*pauVar112;
                  auVar311._4_4_ = auVar286._4_4_ * *(float *)(*pauVar112 + 4);
                  auVar311._8_4_ = auVar286._8_4_ * *(float *)(*pauVar112 + 8);
                  auVar311._12_4_ = auVar286._12_4_ * *(float *)(*pauVar112 + 0xc);
                  auVar311._16_4_ = auVar286._16_4_ * *(float *)(*pauVar112 + 0x10);
                  auVar311._20_4_ = auVar286._20_4_ * *(float *)(*pauVar112 + 0x14);
                  auVar311._28_36_ = auVar123._28_36_;
                  auVar311._24_4_ = auVar286._24_4_ * *(float *)(*pauVar112 + 0x18);
                  auVar123 = ZEXT3264(auVar311._0_32_);
                  *(undefined1 (*) [32])*pauVar116 = auVar311._0_32_;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
                  uVar106 = uVar109 + 0xf;
                  uVar109 = uVar109 + 8;
                }
                uVar106 = uVar109 | 3;
                while ((int)uVar106 < (int)uVar101) {
                  auVar266._0_4_ = auVar231._0_4_ * *(float *)*pauVar112;
                  auVar266._4_4_ = auVar231._4_4_ * *(float *)(*pauVar112 + 4);
                  auVar266._8_4_ = auVar231._8_4_ * *(float *)(*pauVar112 + 8);
                  auVar266._12_4_ = auVar231._12_4_ * *(float *)(*pauVar112 + 0xc);
                  *(undefined1 (*) [16])*pauVar116 = auVar266;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
                  uVar106 = uVar109 + 7;
                  uVar109 = uVar109 + 4;
                }
                if (uVar101 - uVar109 != 0 && (int)uVar109 <= (int)uVar101) {
                  lVar110 = 0;
                  lVar122 = 0;
                  do {
                    *(float *)((long)*pauVar116 + lVar122 * 4) =
                         fVar186 * *(float *)(*pauVar112 + lVar122 * 4);
                    lVar122 = lVar122 + 1;
                    lVar110 = lVar110 + -4;
                  } while (uVar101 - uVar109 != (int)lVar122);
                  pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
                }
                uVar119 = uVar119 + 1;
              } while (uVar119 != uVar103);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        local_230 = (void *)((long)local_230 + 1);
        local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
      } while (local_230 != local_238);
    }
    break;
  case 3:
    iVar99 = local_240->w;
    uVar102 = local_240->h;
    uVar103 = (ulong)uVar102;
    uVar108 = local_240->d;
    local_1f0._0_8_ = CONCAT44(0,uVar108);
    uVar101 = local_240->c;
    local_238 = (void *)(ulong)uVar101;
    iVar121 = local_240->elempack;
    if (0 < (int)uVar102 && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      uVar109 = iVar121 * iVar99;
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar252._8_4_ = 0x3f800000;
      auVar252._0_8_ = 0x3f8000003f800000;
      auVar252._12_4_ = 0x3f800000;
      auVar252._16_4_ = 0x3f800000;
      auVar252._20_4_ = 0x3f800000;
      auVar252._24_4_ = 0x3f800000;
      auVar252._28_4_ = 0x3f800000;
      uVar111 = 0;
      auVar267._8_4_ = 0x3f800000;
      auVar267._0_8_ = 0x3f8000003f800000;
      auVar267._12_4_ = 0x3f800000;
      do {
        fVar186 = *(float *)((long)local_250 + uVar111 * 4);
        if (iVar121 == 4) {
          auVar317 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10);
        }
        else {
          auVar317._4_4_ = fVar186;
          auVar317._0_4_ = fVar186;
          auVar317._8_4_ = fVar186;
          auVar317._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar327 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20);
        }
        else {
          auVar327._16_16_ = auVar317;
          auVar327._0_16_ = auVar317;
        }
        if (iVar121 == 0x10) {
          auVar124 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40);
        }
        else {
          auVar124 = vinsertf64x4_avx512f(ZEXT3264(auVar327),auVar327,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * uVar111 * local_240->elemsize + (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * uVar111 * local_218->elemsize + (long)local_218->data);
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          auVar125 = vrcp14ps_avx512f(auVar124);
          auVar124 = vfmsub213ps_avx512f(auVar124,auVar125,auVar123);
          auVar124 = vfnmadd132ps_avx512vl(auVar124,auVar125,auVar125);
          iVar100 = 0xf;
          do {
            auVar125 = vmulps_avx512f(auVar124,*pauVar116);
            *pauVar112 = auVar125;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        if ((int)(uVar106 | 7) < (int)uVar109) {
          auVar197 = vrcpps_avx(auVar327);
          auVar187 = vfmsub213ps_fma(auVar327,auVar197,auVar252);
          auVar187 = vfnmadd132ps_fma(ZEXT1632(auVar187),auVar197,auVar197);
          uVar105 = uVar106;
          do {
            auVar53._4_4_ = auVar187._4_4_ * *(float *)(*pauVar116 + 4);
            auVar53._0_4_ = auVar187._0_4_ * *(float *)*pauVar116;
            auVar53._8_4_ = auVar187._8_4_ * *(float *)(*pauVar116 + 8);
            auVar53._12_4_ = auVar187._12_4_ * *(float *)(*pauVar116 + 0xc);
            auVar53._16_4_ = *(float *)(*pauVar116 + 0x10) * 0.0;
            auVar53._20_4_ = *(float *)(*pauVar116 + 0x14) * 0.0;
            auVar53._24_4_ = *(float *)(*pauVar116 + 0x18) * 0.0;
            auVar53._28_4_ = auVar197._28_4_;
            *(undefined1 (*) [32])*pauVar112 = auVar53;
            pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
            pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
            uVar106 = uVar105 + 8;
            iVar100 = uVar105 + 0xf;
            uVar105 = uVar106;
            auVar197 = auVar53;
          } while (iVar100 < (int)uVar109);
        }
        if ((int)(uVar106 | 3) < (int)uVar109) {
          auVar187 = vrcpps_avx(auVar317);
          auVar188 = vfmsub213ps_fma(auVar317,auVar187,auVar267);
          auVar187 = vfnmadd132ps_fma(auVar188,auVar187,auVar187);
          uVar105 = uVar106;
          do {
            auVar322._0_4_ = auVar187._0_4_ * *(float *)*pauVar116;
            auVar322._4_4_ = auVar187._4_4_ * *(float *)(*pauVar116 + 4);
            auVar322._8_4_ = auVar187._8_4_ * *(float *)(*pauVar116 + 8);
            auVar322._12_4_ = auVar187._12_4_ * *(float *)(*pauVar116 + 0xc);
            *(undefined1 (*) [16])*pauVar112 = auVar322;
            pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
            pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
            uVar106 = uVar105 + 4;
            iVar100 = uVar105 + 7;
            uVar105 = uVar106;
          } while (iVar100 < (int)uVar109);
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 (1.0 / fVar186) * *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        uVar111 = uVar111 + 1;
      } while (uVar111 != uVar103);
    }
    if ((0 < (int)uVar101 && (uint)local_1b0 == 1) && local_240->dims - 3U < 2) {
      uVar109 = uVar102 * uVar108 * iVar121 * iVar99;
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar253._8_4_ = 0x3f800000;
      auVar253._0_8_ = 0x3f8000003f800000;
      auVar253._12_4_ = 0x3f800000;
      auVar253._16_4_ = 0x3f800000;
      auVar253._20_4_ = 0x3f800000;
      auVar253._24_4_ = 0x3f800000;
      auVar253._28_4_ = 0x3f800000;
      pvVar120 = (void *)0x0;
      auVar268._8_4_ = 0x3f800000;
      auVar268._0_8_ = 0x3f8000003f800000;
      auVar268._12_4_ = 0x3f800000;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        if (iVar121 == 4) {
          auVar318 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar318._4_4_ = fVar186;
          auVar318._0_4_ = fVar186;
          auVar318._8_4_ = fVar186;
          auVar318._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar328 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar328._16_16_ = auVar318;
          auVar328._0_16_ = auVar318;
        }
        if (iVar121 == 0x10) {
          auVar124 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar124 = vinsertf64x4_avx512f(ZEXT3264(auVar328),auVar328,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          auVar125 = vrcp14ps_avx512f(auVar124);
          auVar124 = vfmsub213ps_avx512f(auVar124,auVar125,auVar123);
          auVar124 = vfnmadd132ps_avx512vl(auVar124,auVar125,auVar125);
          iVar100 = 0xf;
          do {
            auVar125 = vmulps_avx512f(auVar124,*pauVar116);
            *pauVar112 = auVar125;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        if ((int)(uVar106 | 7) < (int)uVar109) {
          auVar197 = vrcpps_avx(auVar328);
          auVar187 = vfmsub213ps_fma(auVar328,auVar197,auVar253);
          auVar187 = vfnmadd132ps_fma(ZEXT1632(auVar187),auVar197,auVar197);
          uVar105 = uVar106;
          do {
            auVar54._4_4_ = auVar187._4_4_ * *(float *)(*pauVar116 + 4);
            auVar54._0_4_ = auVar187._0_4_ * *(float *)*pauVar116;
            auVar54._8_4_ = auVar187._8_4_ * *(float *)(*pauVar116 + 8);
            auVar54._12_4_ = auVar187._12_4_ * *(float *)(*pauVar116 + 0xc);
            auVar54._16_4_ = *(float *)(*pauVar116 + 0x10) * 0.0;
            auVar54._20_4_ = *(float *)(*pauVar116 + 0x14) * 0.0;
            auVar54._24_4_ = *(float *)(*pauVar116 + 0x18) * 0.0;
            auVar54._28_4_ = auVar197._28_4_;
            *(undefined1 (*) [32])*pauVar112 = auVar54;
            pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
            pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
            uVar106 = uVar105 + 8;
            iVar100 = uVar105 + 0xf;
            uVar105 = uVar106;
            auVar197 = auVar54;
          } while (iVar100 < (int)uVar109);
        }
        if ((int)(uVar106 | 3) < (int)uVar109) {
          auVar187 = vrcpps_avx(auVar318);
          auVar188 = vfmsub213ps_fma(auVar318,auVar187,auVar268);
          auVar187 = vfnmadd132ps_fma(auVar188,auVar187,auVar187);
          uVar105 = uVar106;
          do {
            auVar323._0_4_ = auVar187._0_4_ * *(float *)*pauVar116;
            auVar323._4_4_ = auVar187._4_4_ * *(float *)(*pauVar116 + 4);
            auVar323._8_4_ = auVar187._8_4_ * *(float *)(*pauVar116 + 8);
            auVar323._12_4_ = auVar187._12_4_ * *(float *)(*pauVar116 + 0xc);
            *(undefined1 (*) [16])*pauVar112 = auVar323;
            pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
            pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
            uVar106 = uVar105 + 4;
            iVar100 = uVar105 + 7;
            uVar105 = uVar106;
          } while (iVar100 < (int)uVar109);
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 (1.0 / fVar186) * *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1f8 = (void *)CONCAT44(local_1f8._4_4_,(uint)local_1b0);
    local_200 = (void *)(CONCAT44(local_200._4_4_,(uint)local_1b0) ^ 2);
    if ((local_240->dims == 3 && (uint)local_1b0 == 2) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99;
      auVar78._4_4_ = local_1b0._4_4_;
      auVar78._0_4_ = (uint)local_1b0;
      auVar78._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar78,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar254._8_4_ = 0x3f800000;
      auVar254._0_8_ = 0x3f8000003f800000;
      auVar254._12_4_ = 0x3f800000;
      auVar254._16_4_ = 0x3f800000;
      auVar254._20_4_ = 0x3f800000;
      auVar254._24_4_ = 0x3f800000;
      auVar254._28_4_ = 0x3f800000;
      pvVar120 = (void *)0x0;
      auVar269._8_4_ = 0x3f800000;
      auVar269._0_8_ = 0x3f8000003f800000;
      auVar269._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar102) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar112 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar116 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar319 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar319._4_4_ = fVar186;
              auVar319._0_4_ = fVar186;
              auVar319._8_4_ = fVar186;
              auVar319._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar329 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar329._16_16_ = auVar319;
              auVar329._0_16_ = auVar319;
            }
            if (iVar121 == 0x10) {
              auVar124 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar124 = vinsertf64x4_avx512f(ZEXT3264(auVar329),auVar329,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              auVar125 = vrcp14ps_avx512f(auVar124);
              auVar124 = vfmsub213ps_avx512f(auVar124,auVar125,auVar123);
              auVar124 = vfnmadd132ps_avx512vl(auVar124,auVar125,auVar125);
              iVar100 = 0xf;
              do {
                auVar125 = vmulps_avx512f(auVar124,*pauVar116);
                *pauVar112 = auVar125;
                pauVar116 = pauVar116 + 1;
                pauVar112 = pauVar112 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            if ((int)(uVar106 | 7) < (int)uVar109) {
              auVar197 = vrcpps_avx(auVar329);
              auVar187 = vfmsub213ps_fma(auVar329,auVar197,auVar254);
              auVar187 = vfnmadd132ps_fma(ZEXT1632(auVar187),auVar197,auVar197);
              uVar105 = uVar106;
              do {
                auVar55._4_4_ = auVar187._4_4_ * *(float *)(*pauVar116 + 4);
                auVar55._0_4_ = auVar187._0_4_ * *(float *)*pauVar116;
                auVar55._8_4_ = auVar187._8_4_ * *(float *)(*pauVar116 + 8);
                auVar55._12_4_ = auVar187._12_4_ * *(float *)(*pauVar116 + 0xc);
                auVar55._16_4_ = *(float *)(*pauVar116 + 0x10) * 0.0;
                auVar55._20_4_ = *(float *)(*pauVar116 + 0x14) * 0.0;
                auVar55._24_4_ = *(float *)(*pauVar116 + 0x18) * 0.0;
                auVar55._28_4_ = auVar197._28_4_;
                *(undefined1 (*) [32])*pauVar112 = auVar55;
                pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
                pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
                uVar106 = uVar105 + 8;
                iVar100 = uVar105 + 0xf;
                uVar105 = uVar106;
                auVar197 = auVar55;
              } while (iVar100 < (int)uVar109);
            }
            if ((int)(uVar106 | 3) < (int)uVar109) {
              auVar187 = vrcpps_avx(auVar319);
              auVar188 = vfmsub213ps_fma(auVar319,auVar187,auVar269);
              auVar187 = vfnmadd132ps_fma(auVar188,auVar187,auVar187);
              uVar105 = uVar106;
              do {
                auVar324._0_4_ = auVar187._0_4_ * *(float *)*pauVar116;
                auVar324._4_4_ = auVar187._4_4_ * *(float *)(*pauVar116 + 4);
                auVar324._8_4_ = auVar187._8_4_ * *(float *)(*pauVar116 + 8);
                auVar324._12_4_ = auVar187._12_4_ * *(float *)(*pauVar116 + 0xc);
                *(undefined1 (*) [16])*pauVar112 = auVar324;
                pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
                pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
                uVar106 = uVar105 + 4;
                iVar100 = uVar105 + 7;
                uVar105 = uVar106;
              } while (iVar100 < (int)uVar109);
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar122 = 0;
              lVar110 = 0;
              do {
                *(float *)((long)*pauVar112 + lVar122 * 4) =
                     (1.0 / fVar186) * *(float *)(*pauVar116 + lVar122 * 4);
                lVar110 = lVar110 + -4;
                lVar122 = lVar122 + 1;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != uVar103);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    if ((local_240->dims == 4 && (uint)local_200 == 0) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99 * uVar102;
      auVar79._4_4_ = local_1b0._4_4_;
      auVar79._0_4_ = (uint)local_1b0;
      auVar79._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar79,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar255._8_4_ = 0x3f800000;
      auVar255._0_8_ = 0x3f8000003f800000;
      auVar255._12_4_ = 0x3f800000;
      auVar255._16_4_ = 0x3f800000;
      auVar255._20_4_ = 0x3f800000;
      auVar255._24_4_ = 0x3f800000;
      auVar255._28_4_ = 0x3f800000;
      pvVar120 = (void *)0x0;
      auVar270._8_4_ = 0x3f800000;
      auVar270._0_8_ = 0x3f8000003f800000;
      auVar270._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar108) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar320 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar320._4_4_ = fVar186;
              auVar320._0_4_ = fVar186;
              auVar320._8_4_ = fVar186;
              auVar320._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar330 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar330._16_16_ = auVar320;
              auVar330._0_16_ = auVar320;
            }
            if (iVar121 == 0x10) {
              auVar124 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar124 = vinsertf64x4_avx512f(ZEXT3264(auVar330),auVar330,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              auVar125 = vrcp14ps_avx512f(auVar124);
              auVar124 = vfmsub213ps_avx512f(auVar124,auVar125,auVar123);
              auVar124 = vfnmadd132ps_avx512vl(auVar124,auVar125,auVar125);
              iVar100 = 0xf;
              do {
                auVar125 = vmulps_avx512f(auVar124,*pauVar112);
                *pauVar116 = auVar125;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            if ((int)(uVar106 | 7) < (int)uVar109) {
              auVar197 = vrcpps_avx(auVar330);
              auVar187 = vfmsub213ps_fma(auVar330,auVar197,auVar255);
              auVar187 = vfnmadd132ps_fma(ZEXT1632(auVar187),auVar197,auVar197);
              uVar105 = uVar106;
              do {
                auVar56._4_4_ = auVar187._4_4_ * *(float *)(*pauVar112 + 4);
                auVar56._0_4_ = auVar187._0_4_ * *(float *)*pauVar112;
                auVar56._8_4_ = auVar187._8_4_ * *(float *)(*pauVar112 + 8);
                auVar56._12_4_ = auVar187._12_4_ * *(float *)(*pauVar112 + 0xc);
                auVar56._16_4_ = *(float *)(*pauVar112 + 0x10) * 0.0;
                auVar56._20_4_ = *(float *)(*pauVar112 + 0x14) * 0.0;
                auVar56._24_4_ = *(float *)(*pauVar112 + 0x18) * 0.0;
                auVar56._28_4_ = auVar197._28_4_;
                *(undefined1 (*) [32])*pauVar116 = auVar56;
                pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
                uVar106 = uVar105 + 8;
                iVar100 = uVar105 + 0xf;
                auVar197 = auVar56;
                uVar105 = uVar106;
              } while (iVar100 < (int)uVar109);
            }
            if ((int)(uVar106 | 3) < (int)uVar109) {
              auVar187 = vrcpps_avx(auVar320);
              auVar188 = vfmsub213ps_fma(auVar320,auVar187,auVar270);
              auVar187 = vfnmadd132ps_fma(auVar188,auVar187,auVar187);
              uVar105 = uVar106;
              do {
                auVar325._0_4_ = auVar187._0_4_ * *(float *)*pauVar112;
                auVar325._4_4_ = auVar187._4_4_ * *(float *)(*pauVar112 + 4);
                auVar325._8_4_ = auVar187._8_4_ * *(float *)(*pauVar112 + 8);
                auVar325._12_4_ = auVar187._12_4_ * *(float *)(*pauVar112 + 0xc);
                *(undefined1 (*) [16])*pauVar116 = auVar325;
                pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
                uVar106 = uVar105 + 4;
                iVar100 = uVar105 + 7;
                uVar105 = uVar106;
              } while (iVar100 < (int)uVar109);
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar110 = 0;
              lVar122 = 0;
              do {
                *(float *)((long)*pauVar116 + lVar122 * 4) =
                     (1.0 / fVar186) * *(float *)(*pauVar112 + lVar122 * 4);
                lVar122 = lVar122 + 1;
                lVar110 = lVar110 + -4;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_1b0 == 3 && local_240->dims == 4) && 0 < (int)uVar101) {
      uVar101 = iVar99 * iVar121;
      local_1d8 = local_1d8 * (long)local_208;
      auVar80._4_4_ = local_1b0._4_4_;
      auVar80._0_4_ = (uint)local_1b0;
      auVar80._8_8_ = uStack_1a8;
      iVar99 = vextractps_avx(auVar80,1);
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar256._8_4_ = 0x3f800000;
      auVar256._0_8_ = 0x3f8000003f800000;
      auVar256._12_4_ = 0x3f800000;
      auVar256._16_4_ = 0x3f800000;
      auVar256._20_4_ = 0x3f800000;
      auVar256._24_4_ = 0x3f800000;
      auVar256._28_4_ = 0x3f800000;
      local_230 = (void *)0x0;
      auVar271._8_4_ = 0x3f800000;
      auVar271._0_8_ = 0x3f8000003f800000;
      auVar271._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar108) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_230 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_230 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            if (0 < (int)uVar102) {
              lVar107 = (long)iVar99 * (long)local_208 * uVar111 + local_1d8 * (long)local_230;
              uVar119 = 0;
              do {
                fVar186 = *(float *)((long)local_250 + uVar119 * 4 + lVar107);
                if (iVar121 == 4) {
                  auVar321 = *(undefined1 (*) [16])((long)local_250 + uVar119 * 0x10 + lVar107);
                }
                else {
                  auVar321._4_4_ = fVar186;
                  auVar321._0_4_ = fVar186;
                  auVar321._8_4_ = fVar186;
                  auVar321._12_4_ = fVar186;
                }
                if (iVar121 == 8) {
                  auVar331 = *(undefined1 (*) [32])((long)local_250 + uVar119 * 0x20 + lVar107);
                }
                else {
                  auVar331._16_16_ = auVar321;
                  auVar331._0_16_ = auVar321;
                }
                if (iVar121 == 0x10) {
                  auVar124 = *(undefined1 (*) [64])((long)local_250 + uVar119 * 0x40 + lVar107);
                }
                else {
                  auVar124 = vinsertf64x4_avx512f(ZEXT3264(auVar331),auVar331,1);
                }
                uVar109 = 0;
                if (0xf < (int)uVar101) {
                  auVar125 = vrcp14ps_avx512f(auVar124);
                  auVar124 = vfmsub213ps_avx512f(auVar124,auVar125,auVar123);
                  auVar124 = vfnmadd132ps_avx512vl(auVar124,auVar125,auVar125);
                  iVar100 = 0xf;
                  do {
                    auVar125 = vmulps_avx512f(auVar124,*pauVar112);
                    *pauVar116 = auVar125;
                    pauVar112 = pauVar112 + 1;
                    pauVar116 = pauVar116 + 1;
                    iVar100 = iVar100 + 0x10;
                    uVar109 = uVar101 & 0xfffffff0;
                  } while (iVar100 < (int)uVar101);
                }
                if ((int)(uVar109 | 7) < (int)uVar101) {
                  auVar197 = vrcpps_avx(auVar331);
                  auVar187 = vfmsub213ps_fma(auVar331,auVar197,auVar256);
                  auVar187 = vfnmadd132ps_fma(ZEXT1632(auVar187),auVar197,auVar197);
                  uVar106 = uVar109;
                  do {
                    auVar57._4_4_ = auVar187._4_4_ * *(float *)(*pauVar112 + 4);
                    auVar57._0_4_ = auVar187._0_4_ * *(float *)*pauVar112;
                    auVar57._8_4_ = auVar187._8_4_ * *(float *)(*pauVar112 + 8);
                    auVar57._12_4_ = auVar187._12_4_ * *(float *)(*pauVar112 + 0xc);
                    auVar57._16_4_ = *(float *)(*pauVar112 + 0x10) * 0.0;
                    auVar57._20_4_ = *(float *)(*pauVar112 + 0x14) * 0.0;
                    auVar57._24_4_ = *(float *)(*pauVar112 + 0x18) * 0.0;
                    auVar57._28_4_ = auVar197._28_4_;
                    *(undefined1 (*) [32])*pauVar116 = auVar57;
                    pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                    pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
                    uVar109 = uVar106 + 8;
                    iVar100 = uVar106 + 0xf;
                    uVar106 = uVar109;
                    auVar197 = auVar57;
                  } while (iVar100 < (int)uVar101);
                }
                if ((int)(uVar109 | 3) < (int)uVar101) {
                  auVar187 = vrcpps_avx(auVar321);
                  auVar188 = vfmsub213ps_fma(auVar321,auVar187,auVar271);
                  auVar187 = vfnmadd132ps_fma(auVar188,auVar187,auVar187);
                  uVar106 = uVar109;
                  do {
                    auVar326._0_4_ = auVar187._0_4_ * *(float *)*pauVar112;
                    auVar326._4_4_ = auVar187._4_4_ * *(float *)(*pauVar112 + 4);
                    auVar326._8_4_ = auVar187._8_4_ * *(float *)(*pauVar112 + 8);
                    auVar326._12_4_ = auVar187._12_4_ * *(float *)(*pauVar112 + 0xc);
                    *(undefined1 (*) [16])*pauVar116 = auVar326;
                    pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                    pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
                    uVar109 = uVar106 + 4;
                    iVar100 = uVar106 + 7;
                    uVar106 = uVar109;
                  } while (iVar100 < (int)uVar101);
                }
                if (uVar101 - uVar109 != 0 && (int)uVar109 <= (int)uVar101) {
                  lVar110 = 0;
                  lVar122 = 0;
                  do {
                    *(float *)((long)*pauVar116 + lVar122 * 4) =
                         (1.0 / fVar186) * *(float *)(*pauVar112 + lVar122 * 4);
                    lVar122 = lVar122 + 1;
                    lVar110 = lVar110 + -4;
                  } while (uVar101 - uVar109 != (int)lVar122);
                  pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
                }
                uVar119 = uVar119 + 1;
              } while (uVar119 != uVar103);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        local_230 = (void *)((long)local_230 + 1);
        local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
      } while (local_230 != local_238);
    }
    break;
  case 4:
    iVar99 = local_240->w;
    uVar102 = local_240->h;
    uVar103 = (ulong)uVar102;
    uVar108 = local_240->d;
    local_1f0._0_8_ = CONCAT44(0,uVar108);
    uVar101 = local_240->c;
    local_238 = (void *)(ulong)uVar101;
    iVar121 = local_240->elempack;
    if (0 < (int)uVar102 && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      uVar109 = iVar121 * iVar99;
      uVar111 = 0;
      do {
        uVar106 = *(uint *)((long)local_250 + uVar111 * 4);
        if (iVar121 == 4) {
          auVar222 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10);
        }
        else {
          auVar222._4_4_ = uVar106;
          auVar222._0_4_ = uVar106;
          auVar222._8_4_ = uVar106;
          auVar222._12_4_ = uVar106;
        }
        if (iVar121 == 8) {
          auVar277 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20);
        }
        else {
          auVar277._16_16_ = auVar222;
          auVar277._0_16_ = auVar222;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar277),auVar277,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * uVar111 * local_240->elemsize + (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * uVar111 * local_218->elemsize + (long)local_218->data);
        uVar105 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vmaxps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar105 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar104 = uVar105 | 7;
        while ((int)uVar104 < (int)uVar109) {
          auVar197 = vmaxps_avx(auVar277,*(undefined1 (*) [32])*pauVar116);
          *(undefined1 (*) [32])*pauVar112 = auVar197;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar104 = uVar105 + 0xf;
          uVar105 = uVar105 + 8;
        }
        uVar104 = uVar105 | 3;
        while ((int)uVar104 < (int)uVar109) {
          auVar187 = vmaxps_avx(auVar222,*(undefined1 (*) [16])*pauVar116);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar104 = uVar105 + 7;
          uVar105 = uVar105 + 4;
        }
        if (uVar109 - uVar105 != 0 && (int)uVar105 <= (int)uVar109) {
          lVar107 = 0;
          do {
            auVar187 = vmaxss_avx(ZEXT416(uVar106),ZEXT416(*(uint *)(*pauVar116 + lVar107 * 4)));
            *(int *)((long)*pauVar112 + lVar107 * 4) = auVar187._0_4_;
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar105 != (int)lVar107);
        }
        uVar111 = uVar111 + 1;
      } while (uVar111 != uVar103);
    }
    if ((0 < (int)uVar101 && (uint)local_1b0 == 1) && local_240->dims - 3U < 2) {
      uVar109 = uVar102 * uVar108 * iVar121 * iVar99;
      pvVar120 = (void *)0x0;
      do {
        uVar106 = *(uint *)((long)local_250 + (long)pvVar120 * 4);
        if (iVar121 == 4) {
          auVar223 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar223._4_4_ = uVar106;
          auVar223._0_4_ = uVar106;
          auVar223._8_4_ = uVar106;
          auVar223._12_4_ = uVar106;
        }
        if (iVar121 == 8) {
          auVar278 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar278._16_16_ = auVar223;
          auVar278._0_16_ = auVar223;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar278),auVar278,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        uVar105 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vmaxps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar105 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar104 = uVar105 | 7;
        while ((int)uVar104 < (int)uVar109) {
          auVar197 = vmaxps_avx(auVar278,*(undefined1 (*) [32])*pauVar116);
          *(undefined1 (*) [32])*pauVar112 = auVar197;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar104 = uVar105 + 0xf;
          uVar105 = uVar105 + 8;
        }
        uVar104 = uVar105 | 3;
        while ((int)uVar104 < (int)uVar109) {
          auVar187 = vmaxps_avx(auVar223,*(undefined1 (*) [16])*pauVar116);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar104 = uVar105 + 7;
          uVar105 = uVar105 + 4;
        }
        if (uVar109 - uVar105 != 0 && (int)uVar105 <= (int)uVar109) {
          lVar107 = 0;
          do {
            auVar187 = vmaxss_avx(ZEXT416(uVar106),ZEXT416(*(uint *)(*pauVar116 + lVar107 * 4)));
            *(int *)((long)*pauVar112 + lVar107 * 4) = auVar187._0_4_;
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar105 != (int)lVar107);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1f8 = (void *)CONCAT44(local_1f8._4_4_,(uint)local_1b0);
    local_200 = (void *)(CONCAT44(local_200._4_4_,(uint)local_1b0) ^ 2);
    if ((local_240->dims == 3 && (uint)local_1b0 == 2) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99;
      auVar71._4_4_ = local_1b0._4_4_;
      auVar71._0_4_ = (uint)local_1b0;
      auVar71._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar71,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar102) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar112 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar116 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            uVar106 = *(uint *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar224 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar224._4_4_ = uVar106;
              auVar224._0_4_ = uVar106;
              auVar224._8_4_ = uVar106;
              auVar224._12_4_ = uVar106;
            }
            if (iVar121 == 8) {
              auVar279 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar279._16_16_ = auVar224;
              auVar279._0_16_ = auVar224;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar279),auVar279,1);
            }
            uVar105 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vmaxps_avx512f(auVar123,*pauVar116);
                *pauVar112 = auVar124;
                pauVar116 = pauVar116 + 1;
                pauVar112 = pauVar112 + 1;
                iVar100 = iVar100 + 0x10;
                uVar105 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar104 = uVar105 | 7;
            while ((int)uVar104 < (int)uVar109) {
              auVar197 = vmaxps_avx(auVar279,*(undefined1 (*) [32])*pauVar116);
              *(undefined1 (*) [32])*pauVar112 = auVar197;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
              uVar104 = uVar105 + 0xf;
              uVar105 = uVar105 + 8;
            }
            uVar104 = uVar105 | 3;
            while ((int)uVar104 < (int)uVar109) {
              auVar187 = vmaxps_avx(auVar224,*(undefined1 (*) [16])*pauVar116);
              *(undefined1 (*) [16])*pauVar112 = auVar187;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
              uVar104 = uVar105 + 7;
              uVar105 = uVar105 + 4;
            }
            if (uVar109 - uVar105 != 0 && (int)uVar105 <= (int)uVar109) {
              lVar122 = 0;
              lVar110 = 0;
              do {
                auVar187 = vmaxss_avx(ZEXT416(uVar106),ZEXT416(*(uint *)(*pauVar116 + lVar122 * 4)))
                ;
                *(int *)((long)*pauVar112 + lVar122 * 4) = auVar187._0_4_;
                lVar110 = lVar110 + -4;
                lVar122 = lVar122 + 1;
              } while (uVar109 - uVar105 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != uVar103);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    if ((local_240->dims == 4 && (uint)local_200 == 0) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99 * uVar102;
      auVar72._4_4_ = local_1b0._4_4_;
      auVar72._0_4_ = (uint)local_1b0;
      auVar72._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar72,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            uVar106 = *(uint *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar225 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar225._4_4_ = uVar106;
              auVar225._0_4_ = uVar106;
              auVar225._8_4_ = uVar106;
              auVar225._12_4_ = uVar106;
            }
            if (iVar121 == 8) {
              auVar280 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar280._16_16_ = auVar225;
              auVar280._0_16_ = auVar225;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar280),auVar280,1);
            }
            uVar105 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vmaxps_avx512f(auVar123,*pauVar112);
                *pauVar116 = auVar124;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                iVar100 = iVar100 + 0x10;
                uVar105 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar104 = uVar105 | 7;
            while ((int)uVar104 < (int)uVar109) {
              auVar197 = vmaxps_avx(auVar280,*(undefined1 (*) [32])*pauVar112);
              *(undefined1 (*) [32])*pauVar116 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
              uVar104 = uVar105 + 0xf;
              uVar105 = uVar105 + 8;
            }
            uVar104 = uVar105 | 3;
            while ((int)uVar104 < (int)uVar109) {
              auVar187 = vmaxps_avx(auVar225,*(undefined1 (*) [16])*pauVar112);
              *(undefined1 (*) [16])*pauVar116 = auVar187;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
              uVar104 = uVar105 + 7;
              uVar105 = uVar105 + 4;
            }
            if (uVar109 - uVar105 != 0 && (int)uVar105 <= (int)uVar109) {
              lVar110 = 0;
              lVar122 = 0;
              do {
                auVar187 = vmaxss_avx(ZEXT416(uVar106),ZEXT416(*(uint *)(*pauVar112 + lVar122 * 4)))
                ;
                *(int *)((long)*pauVar116 + lVar122 * 4) = auVar187._0_4_;
                lVar122 = lVar122 + 1;
                lVar110 = lVar110 + -4;
              } while (uVar109 - uVar105 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_1b0 == 3 && local_240->dims == 4) && 0 < (int)uVar101) {
      uVar101 = iVar99 * iVar121;
      auVar73._4_4_ = local_1b0._4_4_;
      auVar73._0_4_ = (uint)local_1b0;
      auVar73._8_8_ = uStack_1a8;
      iVar99 = vextractps_avx(auVar73,1);
      local_1d8 = local_1d8 * (long)local_208;
      local_230 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_230 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_230 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            if (0 < (int)uVar102) {
              lVar107 = (long)iVar99 * (long)local_208 * uVar111 + local_1d8 * (long)local_230;
              uVar119 = 0;
              do {
                uVar109 = *(uint *)((long)local_250 + uVar119 * 4 + lVar107);
                if (iVar121 == 4) {
                  auVar226 = *(undefined1 (*) [16])((long)local_250 + uVar119 * 0x10 + lVar107);
                }
                else {
                  auVar226._4_4_ = uVar109;
                  auVar226._0_4_ = uVar109;
                  auVar226._8_4_ = uVar109;
                  auVar226._12_4_ = uVar109;
                }
                if (iVar121 == 8) {
                  auVar281 = *(undefined1 (*) [32])((long)local_250 + uVar119 * 0x20 + lVar107);
                }
                else {
                  auVar281._16_16_ = auVar226;
                  auVar281._0_16_ = auVar226;
                }
                if (iVar121 == 0x10) {
                  auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar119 * 0x40 + lVar107);
                }
                else {
                  auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar281),auVar281,1);
                }
                uVar106 = 0;
                if (0xf < (int)uVar101) {
                  iVar100 = 0xf;
                  do {
                    auVar124 = vmaxps_avx512f(auVar123,*pauVar112);
                    *pauVar116 = auVar124;
                    pauVar112 = pauVar112 + 1;
                    pauVar116 = pauVar116 + 1;
                    iVar100 = iVar100 + 0x10;
                    uVar106 = uVar101 & 0xfffffff0;
                  } while (iVar100 < (int)uVar101);
                }
                uVar105 = uVar106 | 7;
                while ((int)uVar105 < (int)uVar101) {
                  auVar197 = vmaxps_avx(auVar281,*(undefined1 (*) [32])*pauVar112);
                  *(undefined1 (*) [32])*pauVar116 = auVar197;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
                  uVar105 = uVar106 + 0xf;
                  uVar106 = uVar106 + 8;
                }
                uVar105 = uVar106 | 3;
                while ((int)uVar105 < (int)uVar101) {
                  auVar187 = vmaxps_avx(auVar226,*(undefined1 (*) [16])*pauVar112);
                  *(undefined1 (*) [16])*pauVar116 = auVar187;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
                  uVar105 = uVar106 + 7;
                  uVar106 = uVar106 + 4;
                }
                if (uVar101 - uVar106 != 0 && (int)uVar106 <= (int)uVar101) {
                  lVar110 = 0;
                  lVar122 = 0;
                  do {
                    auVar187 = vmaxss_avx(ZEXT416(uVar109),
                                          ZEXT416(*(uint *)(*pauVar112 + lVar122 * 4)));
                    *(int *)((long)*pauVar116 + lVar122 * 4) = auVar187._0_4_;
                    lVar122 = lVar122 + 1;
                    lVar110 = lVar110 + -4;
                  } while (uVar101 - uVar106 != (int)lVar122);
                  pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
                }
                uVar119 = uVar119 + 1;
              } while (uVar119 != uVar103);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        local_230 = (void *)((long)local_230 + 1);
        local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
      } while (local_230 != local_238);
    }
    break;
  case 5:
    iVar99 = local_240->w;
    uVar102 = local_240->h;
    uVar103 = (ulong)uVar102;
    uVar108 = local_240->d;
    local_1f0._0_8_ = CONCAT44(0,uVar108);
    uVar101 = local_240->c;
    local_238 = (void *)(ulong)uVar101;
    iVar121 = local_240->elempack;
    if (0 < (int)uVar102 && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      uVar109 = iVar121 * iVar99;
      uVar111 = 0;
      do {
        uVar106 = *(uint *)((long)local_250 + uVar111 * 4);
        if (iVar121 == 4) {
          auVar242 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10);
        }
        else {
          auVar242._4_4_ = uVar106;
          auVar242._0_4_ = uVar106;
          auVar242._8_4_ = uVar106;
          auVar242._12_4_ = uVar106;
        }
        if (iVar121 == 8) {
          auVar297 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20);
        }
        else {
          auVar297._16_16_ = auVar242;
          auVar297._0_16_ = auVar242;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar297),auVar297,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * uVar111 * local_240->elemsize + (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * uVar111 * local_218->elemsize + (long)local_218->data);
        uVar105 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vminps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar105 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar104 = uVar105 | 7;
        while ((int)uVar104 < (int)uVar109) {
          auVar197 = vminps_avx(auVar297,*(undefined1 (*) [32])*pauVar116);
          *(undefined1 (*) [32])*pauVar112 = auVar197;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar104 = uVar105 + 0xf;
          uVar105 = uVar105 + 8;
        }
        uVar104 = uVar105 | 3;
        while ((int)uVar104 < (int)uVar109) {
          auVar187 = vminps_avx(auVar242,*(undefined1 (*) [16])*pauVar116);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar104 = uVar105 + 7;
          uVar105 = uVar105 + 4;
        }
        if (uVar109 - uVar105 != 0 && (int)uVar105 <= (int)uVar109) {
          lVar107 = 0;
          do {
            auVar187 = vminss_avx(ZEXT416(uVar106),ZEXT416(*(uint *)(*pauVar116 + lVar107 * 4)));
            *(int *)((long)*pauVar112 + lVar107 * 4) = auVar187._0_4_;
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar105 != (int)lVar107);
        }
        uVar111 = uVar111 + 1;
      } while (uVar111 != uVar103);
    }
    if ((0 < (int)uVar101 && (uint)local_1b0 == 1) && local_240->dims - 3U < 2) {
      uVar109 = uVar102 * uVar108 * iVar121 * iVar99;
      pvVar120 = (void *)0x0;
      do {
        uVar106 = *(uint *)((long)local_250 + (long)pvVar120 * 4);
        if (iVar121 == 4) {
          auVar243 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar243._4_4_ = uVar106;
          auVar243._0_4_ = uVar106;
          auVar243._8_4_ = uVar106;
          auVar243._12_4_ = uVar106;
        }
        if (iVar121 == 8) {
          auVar298 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar298._16_16_ = auVar243;
          auVar298._0_16_ = auVar243;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar298),auVar298,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        uVar105 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vminps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar105 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar104 = uVar105 | 7;
        while ((int)uVar104 < (int)uVar109) {
          auVar197 = vminps_avx(auVar298,*(undefined1 (*) [32])*pauVar116);
          *(undefined1 (*) [32])*pauVar112 = auVar197;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar104 = uVar105 + 0xf;
          uVar105 = uVar105 + 8;
        }
        uVar104 = uVar105 | 3;
        while ((int)uVar104 < (int)uVar109) {
          auVar187 = vminps_avx(auVar243,*(undefined1 (*) [16])*pauVar116);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar104 = uVar105 + 7;
          uVar105 = uVar105 + 4;
        }
        if (uVar109 - uVar105 != 0 && (int)uVar105 <= (int)uVar109) {
          lVar107 = 0;
          do {
            auVar187 = vminss_avx(ZEXT416(uVar106),ZEXT416(*(uint *)(*pauVar116 + lVar107 * 4)));
            *(int *)((long)*pauVar112 + lVar107 * 4) = auVar187._0_4_;
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar105 != (int)lVar107);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1f8 = (void *)CONCAT44(local_1f8._4_4_,(uint)local_1b0);
    local_200 = (void *)(CONCAT44(local_200._4_4_,(uint)local_1b0) ^ 2);
    if ((local_240->dims == 3 && (uint)local_1b0 == 2) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99;
      auVar87._4_4_ = local_1b0._4_4_;
      auVar87._0_4_ = (uint)local_1b0;
      auVar87._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar87,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar102) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar112 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar116 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            uVar106 = *(uint *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar244 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar244._4_4_ = uVar106;
              auVar244._0_4_ = uVar106;
              auVar244._8_4_ = uVar106;
              auVar244._12_4_ = uVar106;
            }
            if (iVar121 == 8) {
              auVar299 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar299._16_16_ = auVar244;
              auVar299._0_16_ = auVar244;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar299),auVar299,1);
            }
            uVar105 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vminps_avx512f(auVar123,*pauVar116);
                *pauVar112 = auVar124;
                pauVar116 = pauVar116 + 1;
                pauVar112 = pauVar112 + 1;
                iVar100 = iVar100 + 0x10;
                uVar105 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar104 = uVar105 | 7;
            while ((int)uVar104 < (int)uVar109) {
              auVar197 = vminps_avx(auVar299,*(undefined1 (*) [32])*pauVar116);
              *(undefined1 (*) [32])*pauVar112 = auVar197;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
              uVar104 = uVar105 + 0xf;
              uVar105 = uVar105 + 8;
            }
            uVar104 = uVar105 | 3;
            while ((int)uVar104 < (int)uVar109) {
              auVar187 = vminps_avx(auVar244,*(undefined1 (*) [16])*pauVar116);
              *(undefined1 (*) [16])*pauVar112 = auVar187;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
              uVar104 = uVar105 + 7;
              uVar105 = uVar105 + 4;
            }
            if (uVar109 - uVar105 != 0 && (int)uVar105 <= (int)uVar109) {
              lVar122 = 0;
              lVar110 = 0;
              do {
                auVar187 = vminss_avx(ZEXT416(uVar106),ZEXT416(*(uint *)(*pauVar116 + lVar122 * 4)))
                ;
                *(int *)((long)*pauVar112 + lVar122 * 4) = auVar187._0_4_;
                lVar110 = lVar110 + -4;
                lVar122 = lVar122 + 1;
              } while (uVar109 - uVar105 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != uVar103);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    if ((local_240->dims == 4 && (uint)local_200 == 0) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99 * uVar102;
      auVar88._4_4_ = local_1b0._4_4_;
      auVar88._0_4_ = (uint)local_1b0;
      auVar88._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar88,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            uVar106 = *(uint *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar245 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar245._4_4_ = uVar106;
              auVar245._0_4_ = uVar106;
              auVar245._8_4_ = uVar106;
              auVar245._12_4_ = uVar106;
            }
            if (iVar121 == 8) {
              auVar300 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar300._16_16_ = auVar245;
              auVar300._0_16_ = auVar245;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar300),auVar300,1);
            }
            uVar105 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vminps_avx512f(auVar123,*pauVar112);
                *pauVar116 = auVar124;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                iVar100 = iVar100 + 0x10;
                uVar105 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar104 = uVar105 | 7;
            while ((int)uVar104 < (int)uVar109) {
              auVar197 = vminps_avx(auVar300,*(undefined1 (*) [32])*pauVar112);
              *(undefined1 (*) [32])*pauVar116 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
              uVar104 = uVar105 + 0xf;
              uVar105 = uVar105 + 8;
            }
            uVar104 = uVar105 | 3;
            while ((int)uVar104 < (int)uVar109) {
              auVar187 = vminps_avx(auVar245,*(undefined1 (*) [16])*pauVar112);
              *(undefined1 (*) [16])*pauVar116 = auVar187;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
              uVar104 = uVar105 + 7;
              uVar105 = uVar105 + 4;
            }
            if (uVar109 - uVar105 != 0 && (int)uVar105 <= (int)uVar109) {
              lVar110 = 0;
              lVar122 = 0;
              do {
                auVar187 = vminss_avx(ZEXT416(uVar106),ZEXT416(*(uint *)(*pauVar112 + lVar122 * 4)))
                ;
                *(int *)((long)*pauVar116 + lVar122 * 4) = auVar187._0_4_;
                lVar122 = lVar122 + 1;
                lVar110 = lVar110 + -4;
              } while (uVar109 - uVar105 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_1b0 == 3 && local_240->dims == 4) && 0 < (int)uVar101) {
      uVar101 = iVar99 * iVar121;
      auVar89._4_4_ = local_1b0._4_4_;
      auVar89._0_4_ = (uint)local_1b0;
      auVar89._8_8_ = uStack_1a8;
      iVar99 = vextractps_avx(auVar89,1);
      local_1d8 = local_1d8 * (long)local_208;
      local_230 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_230 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_230 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            if (0 < (int)uVar102) {
              lVar107 = (long)iVar99 * (long)local_208 * uVar111 + local_1d8 * (long)local_230;
              uVar119 = 0;
              do {
                uVar109 = *(uint *)((long)local_250 + uVar119 * 4 + lVar107);
                if (iVar121 == 4) {
                  auVar246 = *(undefined1 (*) [16])((long)local_250 + uVar119 * 0x10 + lVar107);
                }
                else {
                  auVar246._4_4_ = uVar109;
                  auVar246._0_4_ = uVar109;
                  auVar246._8_4_ = uVar109;
                  auVar246._12_4_ = uVar109;
                }
                if (iVar121 == 8) {
                  auVar301 = *(undefined1 (*) [32])((long)local_250 + uVar119 * 0x20 + lVar107);
                }
                else {
                  auVar301._16_16_ = auVar246;
                  auVar301._0_16_ = auVar246;
                }
                if (iVar121 == 0x10) {
                  auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar119 * 0x40 + lVar107);
                }
                else {
                  auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar301),auVar301,1);
                }
                uVar106 = 0;
                if (0xf < (int)uVar101) {
                  iVar100 = 0xf;
                  do {
                    auVar124 = vminps_avx512f(auVar123,*pauVar112);
                    *pauVar116 = auVar124;
                    pauVar112 = pauVar112 + 1;
                    pauVar116 = pauVar116 + 1;
                    iVar100 = iVar100 + 0x10;
                    uVar106 = uVar101 & 0xfffffff0;
                  } while (iVar100 < (int)uVar101);
                }
                uVar105 = uVar106 | 7;
                while ((int)uVar105 < (int)uVar101) {
                  auVar197 = vminps_avx(auVar301,*(undefined1 (*) [32])*pauVar112);
                  *(undefined1 (*) [32])*pauVar116 = auVar197;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
                  uVar105 = uVar106 + 0xf;
                  uVar106 = uVar106 + 8;
                }
                uVar105 = uVar106 | 3;
                while ((int)uVar105 < (int)uVar101) {
                  auVar187 = vminps_avx(auVar246,*(undefined1 (*) [16])*pauVar112);
                  *(undefined1 (*) [16])*pauVar116 = auVar187;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
                  uVar105 = uVar106 + 7;
                  uVar106 = uVar106 + 4;
                }
                if (uVar101 - uVar106 != 0 && (int)uVar106 <= (int)uVar101) {
                  lVar110 = 0;
                  lVar122 = 0;
                  do {
                    auVar187 = vminss_avx(ZEXT416(uVar109),
                                          ZEXT416(*(uint *)(*pauVar112 + lVar122 * 4)));
                    *(int *)((long)*pauVar116 + lVar122 * 4) = auVar187._0_4_;
                    lVar122 = lVar122 + 1;
                    lVar110 = lVar110 + -4;
                  } while (uVar101 - uVar106 != (int)lVar122);
                  pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
                }
                uVar119 = uVar119 + 1;
              } while (uVar119 != uVar103);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        local_230 = (void *)((long)local_230 + 1);
        local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
      } while (local_230 != local_238);
    }
    break;
  case 6:
    local_20c = local_240->w;
    local_1f8 = (void *)(ulong)(uint)local_240->h;
    local_1a0 = (void *)(ulong)(uint)local_240->d;
    local_1d0 = (void *)(ulong)(uint)local_240->c;
    iVar99 = local_240->elempack;
    local_108 = CONCAT44(local_108._4_4_,(uint)local_1b0);
    local_230 = (void *)CONCAT44(local_230._4_4_,iVar99);
    if (0 < local_240->h && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      iVar121 = iVar99 * local_20c;
      pvVar120 = (void *)0x0;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        if (iVar99 == 4) {
          local_190 = *(__m128 *)((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          local_190[1] = fVar186;
          local_190[0] = fVar186;
          local_190[2] = fVar186;
          local_190[3] = fVar186;
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * (long)pvVar120 * local_240->elemsize +
                    (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * (long)pvVar120 * local_218->elemsize +
                    (long)local_218->data);
        if (iVar99 == 8) {
          local_a0 = *(__m256 *)((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          local_a0._0_16_ =
               ZEXT116(0) * (undefined1  [16])local_190 + ZEXT116(1) * (undefined1  [16])local_190;
          local_a0._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * (undefined1  [16])local_190;
        }
        if (iVar99 == 0x10) {
          auVar123 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_250 + (long)pvVar120 * 0x40));
        }
        else {
          auVar123 = vinserti64x4_avx512f
                               (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,1);
        }
        local_1f0 = ZEXT416((uint)fVar186);
        uVar102 = 0;
        local_180._0_64_ = vmovdqa64_avx512f(auVar123);
        local_238 = pvVar120;
        if (0xf < iVar121) {
          uVar108 = 0;
          do {
            auVar123 = vmovdqu64_avx512f(*pauVar116);
            _local_100 = (__m512)vmovdqa64_avx512f(auVar123);
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                      ((binary_op_pow *)&local_241,(__m512 *)local_100,(__m512 *)&local_180);
            auVar123 = vmovdqu64_avx512f(auVar123);
            *pauVar112 = auVar123;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            uVar102 = uVar108 + 0x10;
            iVar99 = uVar108 + 0x1f;
            uVar108 = uVar102;
          } while (iVar99 < iVar121);
        }
        uVar108 = uVar102 | 7;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)*pauVar116;
          uVar208 = *(undefined8 *)(*pauVar116 + 8);
          uVar211 = *(undefined8 *)(*pauVar116 + 0x10);
          uVar212 = *(undefined8 *)(*pauVar116 + 0x18);
          local_100 = *(undefined1 (*) [32])*pauVar116;
          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                    ((binary_op_pow *)&local_241,(__m256 *)local_100,&local_a0);
          *(undefined8 *)*pauVar112 = uVar209;
          *(undefined8 *)(*pauVar112 + 8) = uVar208;
          *(undefined8 *)(*pauVar112 + 0x10) = uVar211;
          *(undefined8 *)(*pauVar112 + 0x18) = uVar212;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
          uVar108 = uVar102 + 0xf;
          uVar102 = uVar102 + 8;
        }
        uVar108 = uVar102 | 3;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)(*pauVar116 + 8);
          local_100._0_16_ = *(undefined1 (*) [16])*pauVar116;
          afVar333 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                               ((binary_op_pow *)&local_241,(__m128 *)local_100,&local_190);
          *(long *)*pauVar112 = afVar333._0_8_;
          *(undefined8 *)(*pauVar112 + 8) = uVar209;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
          uVar108 = uVar102 + 7;
          uVar102 = uVar102 + 4;
        }
        if (iVar121 - uVar102 != 0 && (int)uVar102 <= iVar121) {
          lVar107 = 0;
          do {
            fVar186 = powf(*(float *)(*pauVar116 + lVar107 * 4),local_1f0._0_4_);
            *(float *)(*pauVar112 + lVar107 * 4) = fVar186;
            lVar107 = lVar107 + 1;
          } while (iVar121 - uVar102 != (int)lVar107);
        }
        pvVar120 = (void *)((long)local_238 + 1);
        iVar99 = (int)local_230;
      } while (pvVar120 != local_1f8);
    }
    if ((0 < (int)local_1d0 && (uint)local_108 == 1) && local_240->dims - 3U < 2) {
      iVar121 = (int)local_1f8 * (int)local_1a0 * iVar99 * local_20c;
      pvVar120 = (void *)0x0;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        local_1f0 = ZEXT416((uint)fVar186);
        if (iVar99 == 4) {
          local_190 = *(__m128 *)((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          local_190[1] = fVar186;
          local_190[0] = fVar186;
          local_190[2] = fVar186;
          local_190[3] = fVar186;
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        if (iVar99 == 8) {
          local_a0 = *(__m256 *)((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          local_a0._0_16_ =
               ZEXT116(0) * (undefined1  [16])local_190 + ZEXT116(1) * (undefined1  [16])local_190;
          local_a0._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * (undefined1  [16])local_190;
        }
        if (iVar99 == 0x10) {
          auVar123 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_250 + (long)pvVar120 * 0x40));
        }
        else {
          auVar123 = vinserti64x4_avx512f
                               (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,1);
        }
        uVar102 = 0;
        local_180._0_64_ = vmovdqa64_avx512f(auVar123);
        local_238 = pvVar120;
        if (0xf < iVar121) {
          uVar108 = 0;
          do {
            auVar123 = vmovdqu64_avx512f(*pauVar116);
            _local_100 = (__m512)vmovdqa64_avx512f(auVar123);
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                      ((binary_op_pow *)&local_241,(__m512 *)local_100,(__m512 *)&local_180);
            auVar123 = vmovdqu64_avx512f(auVar123);
            *pauVar112 = auVar123;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            uVar102 = uVar108 + 0x10;
            iVar99 = uVar108 + 0x1f;
            uVar108 = uVar102;
          } while (iVar99 < iVar121);
        }
        uVar108 = uVar102 | 7;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)*pauVar116;
          uVar208 = *(undefined8 *)(*pauVar116 + 8);
          uVar211 = *(undefined8 *)(*pauVar116 + 0x10);
          uVar212 = *(undefined8 *)(*pauVar116 + 0x18);
          local_100 = *(undefined1 (*) [32])*pauVar116;
          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                    ((binary_op_pow *)&local_241,(__m256 *)local_100,&local_a0);
          *(undefined8 *)*pauVar112 = uVar209;
          *(undefined8 *)(*pauVar112 + 8) = uVar208;
          *(undefined8 *)(*pauVar112 + 0x10) = uVar211;
          *(undefined8 *)(*pauVar112 + 0x18) = uVar212;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
          uVar108 = uVar102 + 0xf;
          uVar102 = uVar102 + 8;
        }
        uVar108 = uVar102 | 3;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)(*pauVar116 + 8);
          local_100._0_16_ = *(undefined1 (*) [16])*pauVar116;
          afVar333 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                               ((binary_op_pow *)&local_241,(__m128 *)local_100,&local_190);
          *(long *)*pauVar112 = afVar333._0_8_;
          *(undefined8 *)(*pauVar112 + 8) = uVar209;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
          uVar108 = uVar102 + 7;
          uVar102 = uVar102 + 4;
        }
        if (iVar121 - uVar102 != 0 && (int)uVar102 <= iVar121) {
          lVar107 = 0;
          do {
            fVar186 = powf(*(float *)(*pauVar116 + lVar107 * 4),local_1f0._0_4_);
            *(float *)(*pauVar112 + lVar107 * 4) = fVar186;
            lVar107 = lVar107 + 1;
          } while (iVar121 - uVar102 != (int)lVar107);
        }
        pvVar120 = (void *)((long)local_238 + 1);
        iVar99 = (int)local_230;
      } while (pvVar120 != local_1d0);
    }
    local_194 = (float)((uint)local_108 ^ 2);
    iVar121 = local_20c;
    if ((local_240->dims == 3 && local_194 == 0.0) && 0 < (int)local_1d0) {
      iVar100 = iVar99 * local_20c;
      local_1c8 = (void *)((long)local_1b0._4_4_ * (long)local_208);
      local_1c0 = (void *)0x0;
      local_1b8 = (void *)CONCAT44(local_1b8._4_4_,iVar100);
      do {
        if (0 < (int)local_1f8) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_1c0 * local_218->elemsize +
                      (long)local_218->data);
          local_200 = (void *)((long)local_1c8 * (long)local_1c0 + (long)local_250);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_1c0 * local_240->elemsize +
                      (long)local_240->data);
          pvVar120 = (void *)0x0;
          do {
            fVar186 = *(float *)((long)local_200 + (long)pvVar120 * 4);
            local_1f0 = ZEXT416((uint)fVar186);
            if (iVar99 == 4) {
              local_190 = *(__m128 *)((long)local_200 + (long)pvVar120 * 0x10);
            }
            else {
              local_190[1] = fVar186;
              local_190[0] = fVar186;
              local_190[2] = fVar186;
              local_190[3] = fVar186;
            }
            if (iVar99 == 8) {
              local_a0 = *(__m256 *)((long)local_200 + (long)pvVar120 * 0x20);
            }
            else {
              local_a0._0_16_ =
                   ZEXT116(0) * (undefined1  [16])local_190 +
                   ZEXT116(1) * (undefined1  [16])local_190;
              local_a0._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])local_190;
            }
            if (iVar99 == 0x10) {
              auVar123 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_200 + (long)pvVar120 * 0x40));
            }
            else {
              auVar123 = vinserti64x4_avx512f
                                   (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,
                                    1);
            }
            uVar102 = 0;
            local_180._0_64_ = vmovdqa64_avx512f(auVar123);
            local_238 = pvVar120;
            if (0xf < iVar100) {
              uVar108 = 0;
              do {
                auVar123 = vmovdqu64_avx512f(*pauVar112);
                _local_100 = (__m512)vmovdqa64_avx512f(auVar123);
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          ((binary_op_pow *)&local_241,(__m512 *)local_100,(__m512 *)&local_180);
                auVar123 = vmovdqu64_avx512f(auVar123);
                *pauVar116 = auVar123;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                uVar102 = uVar108 + 0x10;
                iVar99 = uVar108 + 0x1f;
                uVar108 = uVar102;
              } while (iVar99 < iVar100);
            }
            uVar108 = uVar102 | 7;
            while ((int)uVar108 < iVar100) {
              auVar197 = *(undefined1 (*) [32])*pauVar112;
              local_100._0_4_ = auVar197._0_4_;
              local_100._4_4_ = auVar197._4_4_;
              local_100._8_4_ = auVar197._8_4_;
              local_100._12_4_ = auVar197._12_4_;
              local_100._16_4_ = auVar197._16_4_;
              local_100._20_4_ = auVar197._20_4_;
              local_100._24_4_ = auVar197._24_4_;
              local_100._28_4_ = auVar197._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                        ((binary_op_pow *)&local_241,(__m256 *)local_100,&local_a0);
              *(undefined1 (*) [32])*pauVar116 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              uVar108 = uVar102 + 0xf;
              uVar102 = uVar102 + 8;
            }
            uVar108 = uVar102 | 3;
            while ((int)uVar108 < iVar100) {
              local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
              auVar210 = ZEXT856(*(ulong *)(*pauVar112 + 8));
              afVar333 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                   ((binary_op_pow *)&local_241,(__m128 *)local_100,&local_190);
              auVar135._0_8_ = afVar333._0_8_;
              auVar135._8_56_ = auVar210;
              *(undefined1 (*) [16])*pauVar116 = auVar135._0_16_;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              uVar108 = uVar102 + 7;
              uVar102 = uVar102 + 4;
            }
            if ((int)uVar102 < iVar100) {
              lVar107 = 0;
              lVar122 = 0;
              do {
                fVar186 = powf(*(float *)(*pauVar112 + lVar107 * 4),local_1f0._0_4_);
                *(float *)(*pauVar116 + lVar107 * 4) = fVar186;
                lVar122 = lVar122 + -4;
                lVar107 = lVar107 + 1;
              } while (iVar100 - uVar102 != (int)lVar107);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar122);
              iVar99 = (int)local_230;
              iVar100 = (int)local_1b8;
            }
            else {
              iVar99 = (int)local_230;
            }
            pvVar120 = (void *)((long)local_238 + 1);
            iVar121 = local_20c;
          } while (pvVar120 != local_1f8);
        }
        local_1c0 = (void *)((long)local_1c0 + 1);
      } while (local_1c0 != local_1d0);
    }
    if ((local_240->dims == 4 && local_194 == 0.0) && 0 < (int)local_1d0) {
      iVar100 = iVar99 * iVar121 * (int)local_1f8;
      local_1c8 = (void *)((long)local_1b0._4_4_ * (long)local_208);
      local_1c0 = (void *)0x0;
      local_1b8 = (void *)CONCAT44(local_1b8._4_4_,iVar100);
      do {
        if (0 < (int)local_1a0) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_1c0 * local_218->elemsize +
                      (long)local_218->data);
          local_200 = (void *)((long)local_1c8 * (long)local_1c0 + (long)local_250);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_1c0 * local_240->elemsize +
                      (long)local_240->data);
          pvVar120 = (void *)0x0;
          do {
            fVar186 = *(float *)((long)local_200 + (long)pvVar120 * 4);
            if (iVar99 == 4) {
              local_190 = *(__m128 *)((long)local_200 + (long)pvVar120 * 0x10);
            }
            else {
              local_190[1] = fVar186;
              local_190[0] = fVar186;
              local_190[2] = fVar186;
              local_190[3] = fVar186;
            }
            if (iVar99 == 8) {
              local_a0 = *(__m256 *)((long)local_200 + (long)pvVar120 * 0x20);
            }
            else {
              local_a0._0_16_ =
                   ZEXT116(0) * (undefined1  [16])local_190 +
                   ZEXT116(1) * (undefined1  [16])local_190;
              local_a0._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])local_190;
            }
            if (iVar99 == 0x10) {
              auVar123 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_200 + (long)pvVar120 * 0x40));
            }
            else {
              auVar123 = vinserti64x4_avx512f
                                   (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,
                                    1);
            }
            local_1f0 = ZEXT416((uint)fVar186);
            uVar102 = 0;
            local_180._0_64_ = vmovdqa64_avx512f(auVar123);
            local_238 = pvVar120;
            if (0xf < iVar100) {
              uVar108 = 0;
              do {
                auVar123 = vmovdqu64_avx512f(*pauVar112);
                _local_100 = (__m512)vmovdqa64_avx512f(auVar123);
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          ((binary_op_pow *)&local_241,(__m512 *)local_100,(__m512 *)&local_180);
                auVar123 = vmovdqu64_avx512f(auVar123);
                *pauVar116 = auVar123;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                uVar102 = uVar108 + 0x10;
                iVar99 = uVar108 + 0x1f;
                uVar108 = uVar102;
              } while (iVar99 < iVar100);
            }
            uVar108 = uVar102 | 7;
            while ((int)uVar108 < iVar100) {
              auVar197 = *(undefined1 (*) [32])*pauVar112;
              local_100._0_4_ = auVar197._0_4_;
              local_100._4_4_ = auVar197._4_4_;
              local_100._8_4_ = auVar197._8_4_;
              local_100._12_4_ = auVar197._12_4_;
              local_100._16_4_ = auVar197._16_4_;
              local_100._20_4_ = auVar197._20_4_;
              local_100._24_4_ = auVar197._24_4_;
              local_100._28_4_ = auVar197._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                        ((binary_op_pow *)&local_241,(__m256 *)local_100,&local_a0);
              *(undefined1 (*) [32])*pauVar116 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              uVar108 = uVar102 + 0xf;
              uVar102 = uVar102 + 8;
            }
            uVar108 = uVar102 | 3;
            while ((int)uVar108 < iVar100) {
              local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
              auVar210 = ZEXT856(*(ulong *)(*pauVar112 + 8));
              afVar333 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                   ((binary_op_pow *)&local_241,(__m128 *)local_100,&local_190);
              auVar332._0_8_ = afVar333._0_8_;
              auVar332._8_56_ = auVar210;
              *(undefined1 (*) [16])*pauVar116 = auVar332._0_16_;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              uVar108 = uVar102 + 7;
              uVar102 = uVar102 + 4;
            }
            if ((int)uVar102 < iVar100) {
              lVar122 = 0;
              lVar107 = 0;
              do {
                fVar186 = powf(*(float *)(*pauVar112 + lVar107 * 4),(float)local_1f0._0_4_);
                *(float *)(*pauVar116 + lVar107 * 4) = fVar186;
                lVar107 = lVar107 + 1;
                lVar122 = lVar122 + -4;
              } while (iVar100 - uVar102 != (int)lVar107);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar122);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar122);
              iVar99 = (int)local_230;
              iVar100 = (int)local_1b8;
            }
            else {
              iVar99 = (int)local_230;
            }
            pvVar120 = (void *)((long)local_238 + 1);
            iVar121 = local_20c;
          } while (pvVar120 != local_1a0);
        }
        local_1c0 = (void *)((long)local_1c0 + 1);
      } while (local_1c0 != local_1d0);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_108 == 3 && local_240->dims == 4) && 0 < (int)local_1d0) {
      iVar121 = iVar121 * iVar99;
      local_1d8 = local_1d8 * (long)local_208;
      auVar90._4_4_ = local_1b0._4_4_;
      auVar90._0_4_ = (uint)local_1b0;
      auVar90._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar90,1);
      local_1b0 = (void *)((long)iVar100 * (long)local_208);
      local_1c8 = (void *)0x0;
      local_20c = iVar121;
      do {
        if (0 < (int)local_1a0) {
          pfVar118 = (float *)(local_218->cstep * (long)local_1c8 * local_218->elemsize +
                              (long)local_218->data);
          pfVar113 = (float *)(local_240->cstep * (long)local_1c8 * local_240->elemsize +
                              (long)local_240->data);
          local_1c0 = (void *)(local_1d8 * (long)local_1c8 + (long)local_250);
          local_1b8 = (void *)0x0;
          do {
            if (0 < (int)local_1f8) {
              local_200 = (void *)((long)local_1b0 * (long)local_1b8 + (long)local_1c0);
              pvVar120 = (void *)0x0;
              do {
                fVar186 = *(float *)((long)local_200 + (long)pvVar120 * 4);
                if (iVar99 == 4) {
                  local_190 = *(__m128 *)((long)local_200 + (long)pvVar120 * 0x10);
                }
                else {
                  local_190[1] = fVar186;
                  local_190[0] = fVar186;
                  local_190[2] = fVar186;
                  local_190[3] = fVar186;
                }
                if (iVar99 == 8) {
                  local_a0 = *(__m256 *)((long)local_200 + (long)pvVar120 * 0x20);
                }
                else {
                  local_a0[4] = local_190[0];
                  local_a0[5] = local_190[1];
                  local_a0[6] = local_190[2];
                  local_a0[7] = local_190[3];
                  local_a0[0] = local_190[0];
                  local_a0[1] = local_190[1];
                  local_a0[2] = local_190[2];
                  local_a0[3] = local_190[3];
                }
                if (iVar99 == 0x10) {
                  local_180._0_64_ = *(undefined1 (*) [64])((long)local_200 + (long)pvVar120 * 0x40)
                  ;
                }
                else {
                  local_180._0_64_ =
                       vinsertf64x4_avx512f
                                 (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,1)
                  ;
                }
                local_1f0 = ZEXT416((uint)fVar186);
                uVar102 = 0;
                local_238 = pvVar120;
                if (0xf < iVar121) {
                  uVar108 = 0;
                  do {
                    afVar207 = *(__m512 *)pfVar113;
                    _local_100 = afVar207;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              ((binary_op_pow *)&local_241,(__m512 *)local_100,(__m512 *)&local_180)
                    ;
                    *(__m512 *)pfVar118 = afVar207;
                    pfVar113 = pfVar113 + 0x10;
                    pfVar118 = pfVar118 + 0x10;
                    uVar102 = uVar108 + 0x10;
                    iVar99 = uVar108 + 0x1f;
                    uVar108 = uVar102;
                  } while (iVar99 < iVar121);
                }
                uVar108 = uVar102 | 7;
                while ((int)uVar108 < iVar121) {
                  auVar197 = *(undefined1 (*) [32])pfVar113;
                  local_100._0_4_ = auVar197._0_4_;
                  local_100._4_4_ = auVar197._4_4_;
                  local_100._8_4_ = auVar197._8_4_;
                  local_100._12_4_ = auVar197._12_4_;
                  local_100._16_4_ = auVar197._16_4_;
                  local_100._20_4_ = auVar197._20_4_;
                  local_100._24_4_ = auVar197._24_4_;
                  local_100._28_4_ = auVar197._28_4_;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            ((binary_op_pow *)&local_241,(__m256 *)local_100,&local_a0);
                  *(undefined1 (*) [32])pfVar118 = auVar197;
                  pfVar113 = pfVar113 + 8;
                  pfVar118 = pfVar118 + 8;
                  uVar108 = uVar102 + 0xf;
                  uVar102 = uVar102 + 8;
                }
                uVar108 = uVar102 | 3;
                while ((int)uVar108 < iVar121) {
                  local_100._0_16_ = *(undefined1 (*) [16])pfVar113;
                  auVar210 = ZEXT856(*(ulong *)(pfVar113 + 2));
                  afVar333 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                       ((binary_op_pow *)&local_241,(__m128 *)local_100,&local_190);
                  auVar156._0_8_ = afVar333._0_8_;
                  auVar156._8_56_ = auVar210;
                  *(undefined1 (*) [16])pfVar118 = auVar156._0_16_;
                  pfVar113 = pfVar113 + 4;
                  pfVar118 = pfVar118 + 4;
                  uVar108 = uVar102 + 7;
                  uVar102 = uVar102 + 4;
                }
                if ((int)uVar102 < iVar121) {
                  lVar122 = 0;
                  lVar107 = 0;
                  do {
                    fVar186 = powf(pfVar113[lVar107],(float)local_1f0._0_4_);
                    pfVar118[lVar107] = fVar186;
                    lVar107 = lVar107 + 1;
                    lVar122 = lVar122 + -4;
                  } while (iVar121 - uVar102 != (int)lVar107);
                  pfVar118 = (float *)((long)pfVar118 - lVar122);
                  pfVar113 = (float *)((long)pfVar113 - lVar122);
                  iVar121 = local_20c;
                }
                pvVar120 = (void *)((long)local_238 + 1);
                iVar99 = (int)local_230;
              } while (pvVar120 != local_1f8);
            }
            local_1b8 = (void *)((long)local_1b8 + 1);
          } while (local_1b8 != local_1a0);
        }
        local_1c8 = (void *)((long)local_1c8 + 1);
      } while (local_1c8 != local_1d0);
    }
    break;
  case 7:
    iVar99 = local_240->w;
    uVar102 = local_240->h;
    uVar103 = (ulong)uVar102;
    uVar108 = local_240->d;
    local_1f0._0_8_ = CONCAT44(0,uVar108);
    uVar101 = local_240->c;
    local_238 = (void *)(ulong)uVar101;
    iVar121 = local_240->elempack;
    if (0 < (int)uVar102 && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      uVar109 = iVar121 * iVar99;
      uVar111 = 0;
      do {
        fVar186 = *(float *)((long)local_250 + uVar111 * 4);
        if (iVar121 == 4) {
          auVar232 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10);
        }
        else {
          auVar232._4_4_ = fVar186;
          auVar232._0_4_ = fVar186;
          auVar232._8_4_ = fVar186;
          auVar232._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar287 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20);
        }
        else {
          auVar287._16_16_ = auVar232;
          auVar287._0_16_ = auVar232;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar287),auVar287,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * uVar111 * local_240->elemsize + (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * uVar111 * local_218->elemsize + (long)local_218->data);
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vsubps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          auVar197 = vsubps_avx(auVar287,*(undefined1 (*) [32])*pauVar116);
          *(undefined1 (*) [32])*pauVar112 = auVar197;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar187 = vsubps_avx(auVar232,*(undefined1 (*) [16])*pauVar116);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 fVar186 - *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        uVar111 = uVar111 + 1;
      } while (uVar111 != uVar103);
    }
    if ((0 < (int)uVar101 && (uint)local_1b0 == 1) && local_240->dims - 3U < 2) {
      uVar109 = uVar102 * uVar108 * iVar121 * iVar99;
      pvVar120 = (void *)0x0;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        if (iVar121 == 4) {
          auVar233 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar233._4_4_ = fVar186;
          auVar233._0_4_ = fVar186;
          auVar233._8_4_ = fVar186;
          auVar233._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar288 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar288._16_16_ = auVar233;
          auVar288._0_16_ = auVar233;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar288),auVar288,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            auVar124 = vsubps_avx512f(auVar123,*pauVar116);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          auVar197 = vsubps_avx(auVar288,*(undefined1 (*) [32])*pauVar116);
          *(undefined1 (*) [32])*pauVar112 = auVar197;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar187 = vsubps_avx(auVar233,*(undefined1 (*) [16])*pauVar116);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 fVar186 - *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1f8 = (void *)CONCAT44(local_1f8._4_4_,(uint)local_1b0);
    local_200 = (void *)(CONCAT44(local_200._4_4_,(uint)local_1b0) ^ 2);
    if ((local_240->dims == 3 && (uint)local_1b0 == 2) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99;
      auVar81._4_4_ = local_1b0._4_4_;
      auVar81._0_4_ = (uint)local_1b0;
      auVar81._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar81,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar102) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar112 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar116 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar234 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar234._4_4_ = fVar186;
              auVar234._0_4_ = fVar186;
              auVar234._8_4_ = fVar186;
              auVar234._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar289 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar289._16_16_ = auVar234;
              auVar289._0_16_ = auVar234;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar289),auVar289,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vsubps_avx512f(auVar123,*pauVar116);
                *pauVar112 = auVar124;
                pauVar116 = pauVar116 + 1;
                pauVar112 = pauVar112 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              auVar197 = vsubps_avx(auVar289,*(undefined1 (*) [32])*pauVar116);
              *(undefined1 (*) [32])*pauVar112 = auVar197;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar187 = vsubps_avx(auVar234,*(undefined1 (*) [16])*pauVar116);
              *(undefined1 (*) [16])*pauVar112 = auVar187;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar122 = 0;
              lVar110 = 0;
              do {
                *(float *)((long)*pauVar112 + lVar122 * 4) =
                     fVar186 - *(float *)(*pauVar116 + lVar122 * 4);
                lVar110 = lVar110 + -4;
                lVar122 = lVar122 + 1;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != uVar103);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    if ((local_240->dims == 4 && (uint)local_200 == 0) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99 * uVar102;
      auVar82._4_4_ = local_1b0._4_4_;
      auVar82._0_4_ = (uint)local_1b0;
      auVar82._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar82,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar235 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar235._4_4_ = fVar186;
              auVar235._0_4_ = fVar186;
              auVar235._8_4_ = fVar186;
              auVar235._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar290 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar290._16_16_ = auVar235;
              auVar290._0_16_ = auVar235;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar290),auVar290,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                auVar124 = vsubps_avx512f(auVar123,*pauVar112);
                *pauVar116 = auVar124;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              auVar197 = vsubps_avx(auVar290,*(undefined1 (*) [32])*pauVar112);
              *(undefined1 (*) [32])*pauVar116 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar187 = vsubps_avx(auVar235,*(undefined1 (*) [16])*pauVar112);
              *(undefined1 (*) [16])*pauVar116 = auVar187;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar110 = 0;
              lVar122 = 0;
              do {
                *(float *)((long)*pauVar116 + lVar122 * 4) =
                     fVar186 - *(float *)(*pauVar112 + lVar122 * 4);
                lVar122 = lVar122 + 1;
                lVar110 = lVar110 + -4;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_1b0 == 3 && local_240->dims == 4) && 0 < (int)uVar101) {
      uVar101 = iVar99 * iVar121;
      auVar83._4_4_ = local_1b0._4_4_;
      auVar83._0_4_ = (uint)local_1b0;
      auVar83._8_8_ = uStack_1a8;
      iVar99 = vextractps_avx(auVar83,1);
      local_1d8 = local_1d8 * (long)local_208;
      local_230 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_230 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_230 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            if (0 < (int)uVar102) {
              lVar107 = (long)iVar99 * (long)local_208 * uVar111 + local_1d8 * (long)local_230;
              uVar119 = 0;
              do {
                fVar186 = *(float *)((long)local_250 + uVar119 * 4 + lVar107);
                if (iVar121 == 4) {
                  auVar236 = *(undefined1 (*) [16])((long)local_250 + uVar119 * 0x10 + lVar107);
                }
                else {
                  auVar236._4_4_ = fVar186;
                  auVar236._0_4_ = fVar186;
                  auVar236._8_4_ = fVar186;
                  auVar236._12_4_ = fVar186;
                }
                if (iVar121 == 8) {
                  auVar291 = *(undefined1 (*) [32])((long)local_250 + uVar119 * 0x20 + lVar107);
                }
                else {
                  auVar291._16_16_ = auVar236;
                  auVar291._0_16_ = auVar236;
                }
                if (iVar121 == 0x10) {
                  auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar119 * 0x40 + lVar107);
                }
                else {
                  auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar291),auVar291,1);
                }
                uVar109 = 0;
                if (0xf < (int)uVar101) {
                  iVar100 = 0xf;
                  do {
                    auVar124 = vsubps_avx512f(auVar123,*pauVar112);
                    *pauVar116 = auVar124;
                    pauVar112 = pauVar112 + 1;
                    pauVar116 = pauVar116 + 1;
                    iVar100 = iVar100 + 0x10;
                    uVar109 = uVar101 & 0xfffffff0;
                  } while (iVar100 < (int)uVar101);
                }
                uVar106 = uVar109 | 7;
                while ((int)uVar106 < (int)uVar101) {
                  auVar197 = vsubps_avx(auVar291,*(undefined1 (*) [32])*pauVar112);
                  *(undefined1 (*) [32])*pauVar116 = auVar197;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
                  uVar106 = uVar109 + 0xf;
                  uVar109 = uVar109 + 8;
                }
                uVar106 = uVar109 | 3;
                while ((int)uVar106 < (int)uVar101) {
                  auVar187 = vsubps_avx(auVar236,*(undefined1 (*) [16])*pauVar112);
                  *(undefined1 (*) [16])*pauVar116 = auVar187;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
                  uVar106 = uVar109 + 7;
                  uVar109 = uVar109 + 4;
                }
                if (uVar101 - uVar109 != 0 && (int)uVar109 <= (int)uVar101) {
                  lVar110 = 0;
                  lVar122 = 0;
                  do {
                    *(float *)((long)*pauVar116 + lVar122 * 4) =
                         fVar186 - *(float *)(*pauVar112 + lVar122 * 4);
                    lVar122 = lVar122 + 1;
                    lVar110 = lVar110 + -4;
                  } while (uVar101 - uVar109 != (int)lVar122);
                  pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
                }
                uVar119 = uVar119 + 1;
              } while (uVar119 != uVar103);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        local_230 = (void *)((long)local_230 + 1);
        local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
      } while (local_230 != local_238);
    }
    break;
  case 8:
    iVar99 = local_240->w;
    uVar102 = local_240->h;
    uVar103 = (ulong)uVar102;
    uVar108 = local_240->d;
    local_1f0._0_8_ = CONCAT44(0,uVar108);
    uVar101 = local_240->c;
    local_238 = (void *)(ulong)uVar101;
    iVar121 = local_240->elempack;
    if (0 < (int)uVar102 && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      uVar109 = iVar121 * iVar99;
      uVar111 = 0;
      do {
        fVar186 = *(float *)((long)local_250 + uVar111 * 4);
        if (iVar121 == 4) {
          auVar247 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10);
        }
        else {
          auVar247._4_4_ = fVar186;
          auVar247._0_4_ = fVar186;
          auVar247._8_4_ = fVar186;
          auVar247._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar302 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20);
        }
        else {
          auVar302._16_16_ = auVar247;
          auVar302._0_16_ = auVar247;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar302),auVar302,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * uVar111 * local_240->elemsize + (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * uVar111 * local_218->elemsize + (long)local_218->data);
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            in_ZMM5 = vrcp14ps_avx512f(*pauVar116);
            auVar124 = vmulps_avx512f(auVar123,in_ZMM5);
            auVar125 = vfmsub213ps_avx512f(*pauVar116,auVar124,auVar123);
            auVar124 = vfnmadd213ps_avx512f(auVar125,in_ZMM5,auVar124);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          auVar197 = vrcpps_avx(*(undefined1 (*) [32])*pauVar116);
          auVar130._0_4_ = auVar302._0_4_ * auVar197._0_4_;
          auVar130._4_4_ = auVar302._4_4_ * auVar197._4_4_;
          auVar130._8_4_ = auVar302._8_4_ * auVar197._8_4_;
          auVar130._12_4_ = auVar302._12_4_ * auVar197._12_4_;
          auVar130._16_4_ = auVar302._16_4_ * auVar197._16_4_;
          auVar130._20_4_ = auVar302._20_4_ * auVar197._20_4_;
          auVar130._28_36_ = in_ZMM5._28_36_;
          auVar130._24_4_ = auVar302._24_4_ * auVar197._24_4_;
          auVar198 = auVar130._0_32_;
          in_ZMM5 = ZEXT3264(auVar198);
          auVar187 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar116,auVar198,auVar302);
          auVar187 = vfnmadd213ps_fma(ZEXT1632(auVar187),auVar197,auVar198);
          *(undefined1 (*) [32])*pauVar112 = ZEXT1632(auVar187);
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar187 = vrcpps_avx(*(undefined1 (*) [16])*pauVar116);
          auVar312._0_4_ = auVar247._0_4_ * auVar187._0_4_;
          auVar312._4_4_ = auVar247._4_4_ * auVar187._4_4_;
          auVar312._8_4_ = auVar247._8_4_ * auVar187._8_4_;
          auVar312._12_4_ = auVar247._12_4_ * auVar187._12_4_;
          auVar188 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar116,auVar312,auVar247);
          auVar187 = vfnmadd213ps_fma(auVar188,auVar187,auVar312);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 fVar186 / *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        uVar111 = uVar111 + 1;
      } while (uVar111 != uVar103);
    }
    if ((0 < (int)uVar101 && (uint)local_1b0 == 1) && local_240->dims - 3U < 2) {
      uVar109 = uVar102 * uVar108 * iVar121 * iVar99;
      pvVar120 = (void *)0x0;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        if (iVar121 == 4) {
          auVar248 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar248._4_4_ = fVar186;
          auVar248._0_4_ = fVar186;
          auVar248._8_4_ = fVar186;
          auVar248._12_4_ = fVar186;
        }
        if (iVar121 == 8) {
          auVar303 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar303._16_16_ = auVar248;
          auVar303._0_16_ = auVar248;
        }
        if (iVar121 == 0x10) {
          auVar123 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar303),auVar303,1);
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        uVar106 = 0;
        if (0xf < (int)uVar109) {
          iVar100 = 0xf;
          do {
            in_ZMM5 = vrcp14ps_avx512f(*pauVar116);
            auVar124 = vmulps_avx512f(auVar123,in_ZMM5);
            auVar125 = vfmsub213ps_avx512f(*pauVar116,auVar124,auVar123);
            auVar124 = vfnmadd213ps_avx512f(auVar125,in_ZMM5,auVar124);
            *pauVar112 = auVar124;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            iVar100 = iVar100 + 0x10;
            uVar106 = uVar109 & 0xfffffff0;
          } while (iVar100 < (int)uVar109);
        }
        uVar105 = uVar106 | 7;
        while ((int)uVar105 < (int)uVar109) {
          auVar197 = vrcpps_avx(*(undefined1 (*) [32])*pauVar116);
          auVar131._0_4_ = auVar303._0_4_ * auVar197._0_4_;
          auVar131._4_4_ = auVar303._4_4_ * auVar197._4_4_;
          auVar131._8_4_ = auVar303._8_4_ * auVar197._8_4_;
          auVar131._12_4_ = auVar303._12_4_ * auVar197._12_4_;
          auVar131._16_4_ = auVar303._16_4_ * auVar197._16_4_;
          auVar131._20_4_ = auVar303._20_4_ * auVar197._20_4_;
          auVar131._28_36_ = in_ZMM5._28_36_;
          auVar131._24_4_ = auVar303._24_4_ * auVar197._24_4_;
          auVar198 = auVar131._0_32_;
          in_ZMM5 = ZEXT3264(auVar198);
          auVar187 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar116,auVar198,auVar303);
          auVar187 = vfnmadd213ps_fma(ZEXT1632(auVar187),auVar197,auVar198);
          *(undefined1 (*) [32])*pauVar112 = ZEXT1632(auVar187);
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
          uVar105 = uVar106 + 0xf;
          uVar106 = uVar106 + 8;
        }
        uVar105 = uVar106 | 3;
        while ((int)uVar105 < (int)uVar109) {
          auVar187 = vrcpps_avx(*(undefined1 (*) [16])*pauVar116);
          auVar313._0_4_ = auVar248._0_4_ * auVar187._0_4_;
          auVar313._4_4_ = auVar248._4_4_ * auVar187._4_4_;
          auVar313._8_4_ = auVar248._8_4_ * auVar187._8_4_;
          auVar313._12_4_ = auVar248._12_4_ * auVar187._12_4_;
          auVar188 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar116,auVar313,auVar248);
          auVar187 = vfnmadd213ps_fma(auVar188,auVar187,auVar313);
          *(undefined1 (*) [16])*pauVar112 = auVar187;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
          uVar105 = uVar106 + 7;
          uVar106 = uVar106 + 4;
        }
        if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
          lVar107 = 0;
          do {
            *(float *)((long)*pauVar112 + lVar107 * 4) =
                 fVar186 / *(float *)(*pauVar116 + lVar107 * 4);
            lVar107 = lVar107 + 1;
          } while (uVar109 - uVar106 != (int)lVar107);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1f8 = (void *)CONCAT44(local_1f8._4_4_,(uint)local_1b0);
    local_200 = (void *)(CONCAT44(local_200._4_4_,(uint)local_1b0) ^ 2);
    if ((local_240->dims == 3 && (uint)local_1b0 == 2) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99;
      auVar94._4_4_ = local_1b0._4_4_;
      auVar94._0_4_ = (uint)local_1b0;
      auVar94._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar94,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar102) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar112 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar116 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar249 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar249._4_4_ = fVar186;
              auVar249._0_4_ = fVar186;
              auVar249._8_4_ = fVar186;
              auVar249._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar304 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar304._16_16_ = auVar249;
              auVar304._0_16_ = auVar249;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar304),auVar304,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                in_ZMM5 = vrcp14ps_avx512f(*pauVar116);
                auVar124 = vmulps_avx512f(auVar123,in_ZMM5);
                auVar125 = vfmsub213ps_avx512f(*pauVar116,auVar124,auVar123);
                auVar124 = vfnmadd213ps_avx512f(auVar125,in_ZMM5,auVar124);
                *pauVar112 = auVar124;
                pauVar116 = pauVar116 + 1;
                pauVar112 = pauVar112 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              auVar197 = vrcpps_avx(*(undefined1 (*) [32])*pauVar116);
              auVar132._0_4_ = auVar304._0_4_ * auVar197._0_4_;
              auVar132._4_4_ = auVar304._4_4_ * auVar197._4_4_;
              auVar132._8_4_ = auVar304._8_4_ * auVar197._8_4_;
              auVar132._12_4_ = auVar304._12_4_ * auVar197._12_4_;
              auVar132._16_4_ = auVar304._16_4_ * auVar197._16_4_;
              auVar132._20_4_ = auVar304._20_4_ * auVar197._20_4_;
              auVar132._28_36_ = in_ZMM5._28_36_;
              auVar132._24_4_ = auVar304._24_4_ * auVar197._24_4_;
              auVar198 = auVar132._0_32_;
              in_ZMM5 = ZEXT3264(auVar198);
              auVar187 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar116,auVar198,auVar304);
              auVar187 = vfnmadd213ps_fma(ZEXT1632(auVar187),auVar197,auVar198);
              *(undefined1 (*) [32])*pauVar112 = ZEXT1632(auVar187);
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar187 = vrcpps_avx(*(undefined1 (*) [16])*pauVar116);
              auVar314._0_4_ = auVar249._0_4_ * auVar187._0_4_;
              auVar314._4_4_ = auVar249._4_4_ * auVar187._4_4_;
              auVar314._8_4_ = auVar249._8_4_ * auVar187._8_4_;
              auVar314._12_4_ = auVar249._12_4_ * auVar187._12_4_;
              auVar188 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar116,auVar314,auVar249);
              auVar187 = vfnmadd213ps_fma(auVar188,auVar187,auVar314);
              *(undefined1 (*) [16])*pauVar112 = auVar187;
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              pauVar112 = (undefined1 (*) [64])((long)*pauVar112 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar122 = 0;
              lVar110 = 0;
              do {
                *(float *)((long)*pauVar112 + lVar122 * 4) =
                     fVar186 / *(float *)(*pauVar116 + lVar122 * 4);
                lVar110 = lVar110 + -4;
                lVar122 = lVar122 + 1;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != uVar103);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    if ((local_240->dims == 4 && (uint)local_200 == 0) && 0 < (int)uVar101) {
      uVar109 = iVar121 * iVar99 * uVar102;
      auVar95._4_4_ = local_1b0._4_4_;
      auVar95._0_4_ = (uint)local_1b0;
      auVar95._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar95,1);
      local_230 = (void *)((long)iVar100 * (long)local_208);
      pvVar120 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          lVar107 = (long)local_230 * (long)pvVar120;
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)pvVar120 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)pvVar120 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            fVar186 = *(float *)((long)local_250 + uVar111 * 4 + lVar107);
            if (iVar121 == 4) {
              auVar250 = *(undefined1 (*) [16])((long)local_250 + uVar111 * 0x10 + lVar107);
            }
            else {
              auVar250._4_4_ = fVar186;
              auVar250._0_4_ = fVar186;
              auVar250._8_4_ = fVar186;
              auVar250._12_4_ = fVar186;
            }
            if (iVar121 == 8) {
              auVar305 = *(undefined1 (*) [32])((long)local_250 + uVar111 * 0x20 + lVar107);
            }
            else {
              auVar305._16_16_ = auVar250;
              auVar305._0_16_ = auVar250;
            }
            if (iVar121 == 0x10) {
              auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar111 * 0x40 + lVar107);
            }
            else {
              auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar305),auVar305,1);
            }
            uVar106 = 0;
            if (0xf < (int)uVar109) {
              iVar100 = 0xf;
              do {
                in_ZMM5 = vrcp14ps_avx512f(*pauVar112);
                auVar124 = vmulps_avx512f(auVar123,in_ZMM5);
                auVar125 = vfmsub213ps_avx512f(*pauVar112,auVar124,auVar123);
                auVar124 = vfnmadd213ps_avx512f(auVar125,in_ZMM5,auVar124);
                *pauVar116 = auVar124;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                iVar100 = iVar100 + 0x10;
                uVar106 = uVar109 & 0xfffffff0;
              } while (iVar100 < (int)uVar109);
            }
            uVar105 = uVar106 | 7;
            while ((int)uVar105 < (int)uVar109) {
              auVar197 = vrcpps_avx(*(undefined1 (*) [32])*pauVar112);
              auVar133._0_4_ = auVar305._0_4_ * auVar197._0_4_;
              auVar133._4_4_ = auVar305._4_4_ * auVar197._4_4_;
              auVar133._8_4_ = auVar305._8_4_ * auVar197._8_4_;
              auVar133._12_4_ = auVar305._12_4_ * auVar197._12_4_;
              auVar133._16_4_ = auVar305._16_4_ * auVar197._16_4_;
              auVar133._20_4_ = auVar305._20_4_ * auVar197._20_4_;
              auVar133._28_36_ = in_ZMM5._28_36_;
              auVar133._24_4_ = auVar305._24_4_ * auVar197._24_4_;
              auVar198 = auVar133._0_32_;
              in_ZMM5 = ZEXT3264(auVar198);
              auVar187 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar112,auVar198,auVar305);
              auVar187 = vfnmadd213ps_fma(ZEXT1632(auVar187),auVar197,auVar198);
              *(undefined1 (*) [32])*pauVar116 = ZEXT1632(auVar187);
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
              uVar105 = uVar106 + 0xf;
              uVar106 = uVar106 + 8;
            }
            uVar105 = uVar106 | 3;
            while ((int)uVar105 < (int)uVar109) {
              auVar187 = vrcpps_avx(*(undefined1 (*) [16])*pauVar112);
              auVar315._0_4_ = auVar250._0_4_ * auVar187._0_4_;
              auVar315._4_4_ = auVar250._4_4_ * auVar187._4_4_;
              auVar315._8_4_ = auVar250._8_4_ * auVar187._8_4_;
              auVar315._12_4_ = auVar250._12_4_ * auVar187._12_4_;
              auVar188 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar112,auVar315,auVar250);
              auVar187 = vfnmadd213ps_fma(auVar188,auVar187,auVar315);
              *(undefined1 (*) [16])*pauVar116 = auVar187;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
              uVar105 = uVar106 + 7;
              uVar106 = uVar106 + 4;
            }
            if (uVar109 - uVar106 != 0 && (int)uVar106 <= (int)uVar109) {
              lVar110 = 0;
              lVar122 = 0;
              do {
                *(float *)((long)*pauVar116 + lVar122 * 4) =
                     fVar186 / *(float *)(*pauVar112 + lVar122 * 4);
                lVar122 = lVar122 + 1;
                lVar110 = lVar110 + -4;
              } while (uVar109 - uVar106 != (int)lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        pvVar120 = (void *)((long)pvVar120 + 1);
      } while (pvVar120 != local_238);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_1b0 == 3 && local_240->dims == 4) && 0 < (int)uVar101) {
      uVar101 = iVar99 * iVar121;
      auVar96._4_4_ = local_1b0._4_4_;
      auVar96._0_4_ = (uint)local_1b0;
      auVar96._8_8_ = uStack_1a8;
      iVar99 = vextractps_avx(auVar96,1);
      local_1d8 = local_1d8 * (long)local_208;
      local_230 = (void *)0x0;
      do {
        if (0 < (int)uVar108) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_230 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_230 * local_240->elemsize +
                      (long)local_240->data);
          uVar111 = 0;
          do {
            if (0 < (int)uVar102) {
              lVar107 = (long)iVar99 * (long)local_208 * uVar111 + local_1d8 * (long)local_230;
              uVar119 = 0;
              do {
                fVar186 = *(float *)((long)local_250 + uVar119 * 4 + lVar107);
                if (iVar121 == 4) {
                  auVar251 = *(undefined1 (*) [16])((long)local_250 + uVar119 * 0x10 + lVar107);
                }
                else {
                  auVar251._4_4_ = fVar186;
                  auVar251._0_4_ = fVar186;
                  auVar251._8_4_ = fVar186;
                  auVar251._12_4_ = fVar186;
                }
                if (iVar121 == 8) {
                  auVar306 = *(undefined1 (*) [32])((long)local_250 + uVar119 * 0x20 + lVar107);
                }
                else {
                  auVar306._16_16_ = auVar251;
                  auVar306._0_16_ = auVar251;
                }
                if (iVar121 == 0x10) {
                  auVar123 = *(undefined1 (*) [64])((long)local_250 + uVar119 * 0x40 + lVar107);
                }
                else {
                  auVar123 = vinsertf64x4_avx512f(ZEXT3264(auVar306),auVar306,1);
                }
                uVar109 = 0;
                if (0xf < (int)uVar101) {
                  iVar100 = 0xf;
                  do {
                    in_ZMM5 = vrcp14ps_avx512f(*pauVar112);
                    auVar124 = vmulps_avx512f(auVar123,in_ZMM5);
                    auVar125 = vfmsub213ps_avx512f(*pauVar112,auVar124,auVar123);
                    auVar124 = vfnmadd213ps_avx512f(auVar125,in_ZMM5,auVar124);
                    *pauVar116 = auVar124;
                    pauVar112 = pauVar112 + 1;
                    pauVar116 = pauVar116 + 1;
                    iVar100 = iVar100 + 0x10;
                    uVar109 = uVar101 & 0xfffffff0;
                  } while (iVar100 < (int)uVar101);
                }
                uVar106 = uVar109 | 7;
                while ((int)uVar106 < (int)uVar101) {
                  auVar197 = vrcpps_avx(*(undefined1 (*) [32])*pauVar112);
                  auVar134._0_4_ = auVar306._0_4_ * auVar197._0_4_;
                  auVar134._4_4_ = auVar306._4_4_ * auVar197._4_4_;
                  auVar134._8_4_ = auVar306._8_4_ * auVar197._8_4_;
                  auVar134._12_4_ = auVar306._12_4_ * auVar197._12_4_;
                  auVar134._16_4_ = auVar306._16_4_ * auVar197._16_4_;
                  auVar134._20_4_ = auVar306._20_4_ * auVar197._20_4_;
                  auVar134._28_36_ = in_ZMM5._28_36_;
                  auVar134._24_4_ = auVar306._24_4_ * auVar197._24_4_;
                  auVar198 = auVar134._0_32_;
                  in_ZMM5 = ZEXT3264(auVar198);
                  auVar187 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar112,auVar198,auVar306);
                  auVar187 = vfnmadd213ps_fma(ZEXT1632(auVar187),auVar197,auVar198);
                  *(undefined1 (*) [32])*pauVar116 = ZEXT1632(auVar187);
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x20);
                  uVar106 = uVar109 + 0xf;
                  uVar109 = uVar109 + 8;
                }
                uVar106 = uVar109 | 3;
                while ((int)uVar106 < (int)uVar101) {
                  auVar187 = vrcpps_avx(*(undefined1 (*) [16])*pauVar112);
                  auVar316._0_4_ = auVar251._0_4_ * auVar187._0_4_;
                  auVar316._4_4_ = auVar251._4_4_ * auVar187._4_4_;
                  auVar316._8_4_ = auVar251._8_4_ * auVar187._8_4_;
                  auVar316._12_4_ = auVar251._12_4_ * auVar187._12_4_;
                  auVar188 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar112,auVar316,auVar251);
                  auVar187 = vfnmadd213ps_fma(auVar188,auVar187,auVar316);
                  *(undefined1 (*) [16])*pauVar116 = auVar187;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                  pauVar116 = (undefined1 (*) [64])((long)*pauVar116 + 0x10);
                  uVar106 = uVar109 + 7;
                  uVar109 = uVar109 + 4;
                }
                if (uVar101 - uVar109 != 0 && (int)uVar109 <= (int)uVar101) {
                  lVar110 = 0;
                  lVar122 = 0;
                  do {
                    *(float *)((long)*pauVar116 + lVar122 * 4) =
                         fVar186 / *(float *)(*pauVar112 + lVar122 * 4);
                    lVar122 = lVar122 + 1;
                    lVar110 = lVar110 + -4;
                  } while (uVar101 - uVar109 != (int)lVar122);
                  pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar110);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar110);
                }
                uVar119 = uVar119 + 1;
              } while (uVar119 != uVar103);
            }
            uVar111 = uVar111 + 1;
          } while (uVar111 != local_1f0._0_8_);
        }
        local_230 = (void *)((long)local_230 + 1);
        local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
      } while (local_230 != local_238);
    }
    break;
  case 9:
    local_20c = local_240->w;
    local_1f8 = (void *)(ulong)(uint)local_240->h;
    local_1a0 = (void *)(ulong)(uint)local_240->d;
    local_1d0 = (void *)(ulong)(uint)local_240->c;
    iVar99 = local_240->elempack;
    local_108 = CONCAT44(local_108._4_4_,(uint)local_1b0);
    local_230 = (void *)CONCAT44(local_230._4_4_,iVar99);
    if (0 < local_240->h && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      iVar121 = iVar99 * local_20c;
      pvVar120 = (void *)0x0;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        local_1f0 = ZEXT416((uint)fVar186);
        if (iVar99 == 4) {
          local_190 = *(__m128 *)((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          local_190[1] = fVar186;
          local_190[0] = fVar186;
          local_190[2] = fVar186;
          local_190[3] = fVar186;
        }
        pauVar116 = (undefined1 (*) [64])
                    ((long)local_240->w * (long)pvVar120 * local_240->elemsize +
                    (long)local_240->data);
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_218->w * (long)pvVar120 * local_218->elemsize +
                    (long)local_218->data);
        if (iVar99 == 8) {
          local_a0 = *(__m256 *)((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          local_a0._0_16_ =
               ZEXT116(0) * (undefined1  [16])local_190 + ZEXT116(1) * (undefined1  [16])local_190;
          local_a0._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * (undefined1  [16])local_190;
        }
        if (iVar99 == 0x10) {
          auVar123 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_250 + (long)pvVar120 * 0x40));
        }
        else {
          auVar123 = vinserti64x4_avx512f
                               (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,1);
        }
        uVar102 = 0;
        local_180._0_64_ = vmovdqa64_avx512f(auVar123);
        local_238 = pvVar120;
        if (0xf < iVar121) {
          uVar108 = 0;
          do {
            auVar123 = vmovdqu64_avx512f(*pauVar116);
            _local_100 = (__m512)vmovdqa64_avx512f(auVar123);
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                      (&local_241,(__m512 *)local_100,(__m512 *)&local_180);
            auVar123 = vmovdqu64_avx512f(auVar123);
            *pauVar112 = auVar123;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            uVar102 = uVar108 + 0x10;
            iVar99 = uVar108 + 0x1f;
            uVar108 = uVar102;
          } while (iVar99 < iVar121);
        }
        uVar108 = uVar102 | 7;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)*pauVar116;
          uVar208 = *(undefined8 *)(*pauVar116 + 8);
          uVar211 = *(undefined8 *)(*pauVar116 + 0x10);
          uVar212 = *(undefined8 *)(*pauVar116 + 0x18);
          local_100 = *(undefined1 (*) [32])*pauVar116;
          BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                    (&local_241,(__m256 *)local_100,&local_a0);
          *(undefined8 *)*pauVar112 = uVar209;
          *(undefined8 *)(*pauVar112 + 8) = uVar208;
          *(undefined8 *)(*pauVar112 + 0x10) = uVar211;
          *(undefined8 *)(*pauVar112 + 0x18) = uVar212;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
          uVar108 = uVar102 + 0xf;
          uVar102 = uVar102 + 8;
        }
        uVar108 = uVar102 | 3;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)(*pauVar116 + 8);
          local_100._0_16_ = *(undefined1 (*) [16])*pauVar116;
          afVar333 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                               (&local_241,(__m128 *)local_100,&local_190);
          *(long *)*pauVar112 = afVar333._0_8_;
          *(undefined8 *)(*pauVar112 + 8) = uVar209;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
          uVar108 = uVar102 + 7;
          uVar102 = uVar102 + 4;
        }
        if (iVar121 - uVar102 != 0 && (int)uVar102 <= iVar121) {
          lVar107 = 0;
          do {
            fVar186 = powf((float)local_1f0._0_4_,*(float *)(*pauVar116 + lVar107 * 4));
            *(float *)(*pauVar112 + lVar107 * 4) = fVar186;
            lVar107 = lVar107 + 1;
          } while (iVar121 - uVar102 != (int)lVar107);
        }
        pvVar120 = (void *)((long)local_238 + 1);
        iVar99 = (int)local_230;
      } while (pvVar120 != local_1f8);
    }
    if ((0 < (int)local_1d0 && (uint)local_108 == 1) && local_240->dims - 3U < 2) {
      iVar121 = (int)local_1f8 * (int)local_1a0 * iVar99 * local_20c;
      pvVar120 = (void *)0x0;
      do {
        fVar186 = *(float *)((long)local_250 + (long)pvVar120 * 4);
        local_1f0 = ZEXT416((uint)fVar186);
        if (iVar99 == 4) {
          local_190 = *(__m128 *)((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          local_190[1] = fVar186;
          local_190[0] = fVar186;
          local_190[2] = fVar186;
          local_190[3] = fVar186;
        }
        pauVar116 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        pauVar112 = (undefined1 (*) [64])
                    (local_218->cstep * (long)pvVar120 * local_218->elemsize + (long)local_218->data
                    );
        if (iVar99 == 8) {
          local_a0 = *(__m256 *)((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          local_a0._0_16_ =
               ZEXT116(0) * (undefined1  [16])local_190 + ZEXT116(1) * (undefined1  [16])local_190;
          local_a0._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * (undefined1  [16])local_190;
        }
        if (iVar99 == 0x10) {
          auVar123 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_250 + (long)pvVar120 * 0x40));
        }
        else {
          auVar123 = vinserti64x4_avx512f
                               (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,1);
        }
        uVar102 = 0;
        local_180._0_64_ = vmovdqa64_avx512f(auVar123);
        local_238 = pvVar120;
        if (0xf < iVar121) {
          uVar108 = 0;
          do {
            auVar123 = vmovdqu64_avx512f(*pauVar116);
            _local_100 = (__m512)vmovdqa64_avx512f(auVar123);
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                      (&local_241,(__m512 *)local_100,(__m512 *)&local_180);
            auVar123 = vmovdqu64_avx512f(auVar123);
            *pauVar112 = auVar123;
            pauVar116 = pauVar116 + 1;
            pauVar112 = pauVar112 + 1;
            uVar102 = uVar108 + 0x10;
            iVar99 = uVar108 + 0x1f;
            uVar108 = uVar102;
          } while (iVar99 < iVar121);
        }
        uVar108 = uVar102 | 7;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)*pauVar116;
          uVar208 = *(undefined8 *)(*pauVar116 + 8);
          uVar211 = *(undefined8 *)(*pauVar116 + 0x10);
          uVar212 = *(undefined8 *)(*pauVar116 + 0x18);
          local_100 = *(undefined1 (*) [32])*pauVar116;
          BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                    (&local_241,(__m256 *)local_100,&local_a0);
          *(undefined8 *)*pauVar112 = uVar209;
          *(undefined8 *)(*pauVar112 + 8) = uVar208;
          *(undefined8 *)(*pauVar112 + 0x10) = uVar211;
          *(undefined8 *)(*pauVar112 + 0x18) = uVar212;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
          uVar108 = uVar102 + 0xf;
          uVar102 = uVar102 + 8;
        }
        uVar108 = uVar102 | 3;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)(*pauVar116 + 8);
          local_100._0_16_ = *(undefined1 (*) [16])*pauVar116;
          afVar333 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                               (&local_241,(__m128 *)local_100,&local_190);
          *(long *)*pauVar112 = afVar333._0_8_;
          *(undefined8 *)(*pauVar112 + 8) = uVar209;
          pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
          uVar108 = uVar102 + 7;
          uVar102 = uVar102 + 4;
        }
        if (iVar121 - uVar102 != 0 && (int)uVar102 <= iVar121) {
          lVar107 = 0;
          do {
            fVar186 = powf((float)local_1f0._0_4_,*(float *)(*pauVar116 + lVar107 * 4));
            *(float *)(*pauVar112 + lVar107 * 4) = fVar186;
            lVar107 = lVar107 + 1;
          } while (iVar121 - uVar102 != (int)lVar107);
        }
        pvVar120 = (void *)((long)local_238 + 1);
        iVar99 = (int)local_230;
      } while (pvVar120 != local_1d0);
    }
    local_194 = (float)((uint)local_108 ^ 2);
    iVar121 = local_20c;
    if ((local_240->dims == 3 && local_194 == 0.0) && 0 < (int)local_1d0) {
      iVar100 = iVar99 * local_20c;
      local_1c8 = (void *)((long)local_1b0._4_4_ * (long)local_208);
      local_1c0 = (void *)0x0;
      local_1b8 = (void *)CONCAT44(local_1b8._4_4_,iVar100);
      do {
        if (0 < (int)local_1f8) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_1c0 * local_218->elemsize +
                      (long)local_218->data);
          local_200 = (void *)((long)local_1c8 * (long)local_1c0 + (long)local_250);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_1c0 * local_240->elemsize +
                      (long)local_240->data);
          pvVar120 = (void *)0x0;
          do {
            fVar186 = *(float *)((long)local_200 + (long)pvVar120 * 4);
            local_1f0 = ZEXT416((uint)fVar186);
            if (iVar99 == 4) {
              local_190 = *(__m128 *)((long)local_200 + (long)pvVar120 * 0x10);
            }
            else {
              local_190[1] = fVar186;
              local_190[0] = fVar186;
              local_190[2] = fVar186;
              local_190[3] = fVar186;
            }
            if (iVar99 == 8) {
              local_a0 = *(__m256 *)((long)local_200 + (long)pvVar120 * 0x20);
            }
            else {
              local_a0._0_16_ =
                   ZEXT116(0) * (undefined1  [16])local_190 +
                   ZEXT116(1) * (undefined1  [16])local_190;
              local_a0._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])local_190;
            }
            if (iVar99 == 0x10) {
              auVar123 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_200 + (long)pvVar120 * 0x40));
            }
            else {
              auVar123 = vinserti64x4_avx512f
                                   (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,
                                    1);
            }
            uVar102 = 0;
            local_180._0_64_ = vmovdqa64_avx512f(auVar123);
            local_238 = pvVar120;
            if (0xf < iVar100) {
              uVar108 = 0;
              do {
                auVar123 = vmovdqu64_avx512f(*pauVar112);
                _local_100 = (__m512)vmovdqa64_avx512f(auVar123);
                BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                          (&local_241,(__m512 *)local_100,(__m512 *)&local_180);
                auVar123 = vmovdqu64_avx512f(auVar123);
                *pauVar116 = auVar123;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                uVar102 = uVar108 + 0x10;
                iVar99 = uVar108 + 0x1f;
                uVar108 = uVar102;
              } while (iVar99 < iVar100);
            }
            uVar108 = uVar102 | 7;
            while ((int)uVar108 < iVar100) {
              auVar197 = *(undefined1 (*) [32])*pauVar112;
              local_100._0_4_ = auVar197._0_4_;
              local_100._4_4_ = auVar197._4_4_;
              local_100._8_4_ = auVar197._8_4_;
              local_100._12_4_ = auVar197._12_4_;
              local_100._16_4_ = auVar197._16_4_;
              local_100._20_4_ = auVar197._20_4_;
              local_100._24_4_ = auVar197._24_4_;
              local_100._28_4_ = auVar197._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                        (&local_241,(__m256 *)local_100,&local_a0);
              *(undefined1 (*) [32])*pauVar116 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              uVar108 = uVar102 + 0xf;
              uVar102 = uVar102 + 8;
            }
            uVar108 = uVar102 | 3;
            while ((int)uVar108 < iVar100) {
              local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
              auVar210 = ZEXT856(*(ulong *)(*pauVar112 + 8));
              afVar333 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                   (&local_241,(__m128 *)local_100,&local_190);
              auVar128._0_8_ = afVar333._0_8_;
              auVar128._8_56_ = auVar210;
              *(undefined1 (*) [16])*pauVar116 = auVar128._0_16_;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              uVar108 = uVar102 + 7;
              uVar102 = uVar102 + 4;
            }
            if ((int)uVar102 < iVar100) {
              lVar107 = 0;
              lVar122 = 0;
              do {
                fVar186 = powf((float)local_1f0._0_4_,*(float *)(*pauVar112 + lVar107 * 4));
                *(float *)(*pauVar116 + lVar107 * 4) = fVar186;
                lVar122 = lVar122 + -4;
                lVar107 = lVar107 + 1;
              } while (iVar100 - uVar102 != (int)lVar107);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar122);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar122);
              iVar99 = (int)local_230;
              iVar100 = (int)local_1b8;
            }
            else {
              iVar99 = (int)local_230;
            }
            pvVar120 = (void *)((long)local_238 + 1);
            iVar121 = local_20c;
          } while (pvVar120 != local_1f8);
        }
        local_1c0 = (void *)((long)local_1c0 + 1);
      } while (local_1c0 != local_1d0);
    }
    if ((local_240->dims == 4 && local_194 == 0.0) && 0 < (int)local_1d0) {
      iVar100 = iVar99 * iVar121 * (int)local_1f8;
      local_1c8 = (void *)((long)local_1b0._4_4_ * (long)local_208);
      local_1c0 = (void *)0x0;
      local_1b8 = (void *)CONCAT44(local_1b8._4_4_,iVar100);
      do {
        if (0 < (int)local_1a0) {
          pauVar116 = (undefined1 (*) [64])
                      (local_218->cstep * (long)local_1c0 * local_218->elemsize +
                      (long)local_218->data);
          local_200 = (void *)((long)local_1c8 * (long)local_1c0 + (long)local_250);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_1c0 * local_240->elemsize +
                      (long)local_240->data);
          pvVar120 = (void *)0x0;
          do {
            fVar186 = *(float *)((long)local_200 + (long)pvVar120 * 4);
            local_1f0 = ZEXT416((uint)fVar186);
            if (iVar99 == 4) {
              local_190 = *(__m128 *)((long)local_200 + (long)pvVar120 * 0x10);
            }
            else {
              local_190[1] = fVar186;
              local_190[0] = fVar186;
              local_190[2] = fVar186;
              local_190[3] = fVar186;
            }
            if (iVar99 == 8) {
              local_a0 = *(__m256 *)((long)local_200 + (long)pvVar120 * 0x20);
            }
            else {
              local_a0._0_16_ =
                   ZEXT116(0) * (undefined1  [16])local_190 +
                   ZEXT116(1) * (undefined1  [16])local_190;
              local_a0._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])local_190;
            }
            if (iVar99 == 0x10) {
              auVar123 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_200 + (long)pvVar120 * 0x40));
            }
            else {
              auVar123 = vinserti64x4_avx512f
                                   (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,
                                    1);
            }
            uVar102 = 0;
            local_180._0_64_ = vmovdqa64_avx512f(auVar123);
            local_238 = pvVar120;
            if (0xf < iVar100) {
              uVar108 = 0;
              do {
                auVar123 = vmovdqu64_avx512f(*pauVar112);
                _local_100 = (__m512)vmovdqa64_avx512f(auVar123);
                BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                          (&local_241,(__m512 *)local_100,(__m512 *)&local_180);
                auVar123 = vmovdqu64_avx512f(auVar123);
                *pauVar116 = auVar123;
                pauVar112 = pauVar112 + 1;
                pauVar116 = pauVar116 + 1;
                uVar102 = uVar108 + 0x10;
                iVar99 = uVar108 + 0x1f;
                uVar108 = uVar102;
              } while (iVar99 < iVar100);
            }
            uVar108 = uVar102 | 7;
            while ((int)uVar108 < iVar100) {
              auVar197 = *(undefined1 (*) [32])*pauVar112;
              local_100._0_4_ = auVar197._0_4_;
              local_100._4_4_ = auVar197._4_4_;
              local_100._8_4_ = auVar197._8_4_;
              local_100._12_4_ = auVar197._12_4_;
              local_100._16_4_ = auVar197._16_4_;
              local_100._20_4_ = auVar197._20_4_;
              local_100._24_4_ = auVar197._24_4_;
              local_100._28_4_ = auVar197._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                        (&local_241,(__m256 *)local_100,&local_a0);
              *(undefined1 (*) [32])*pauVar116 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x20);
              uVar108 = uVar102 + 0xf;
              uVar102 = uVar102 + 8;
            }
            uVar108 = uVar102 | 3;
            while ((int)uVar108 < iVar100) {
              local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
              auVar210 = ZEXT856(*(ulong *)(*pauVar112 + 8));
              afVar333 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                   (&local_241,(__m128 *)local_100,&local_190);
              auVar129._0_8_ = afVar333._0_8_;
              auVar129._8_56_ = auVar210;
              *(undefined1 (*) [16])*pauVar116 = auVar129._0_16_;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar116 = (undefined1 (*) [64])(*pauVar116 + 0x10);
              uVar108 = uVar102 + 7;
              uVar102 = uVar102 + 4;
            }
            if ((int)uVar102 < iVar100) {
              lVar122 = 0;
              lVar107 = 0;
              do {
                fVar186 = powf((float)local_1f0._0_4_,*(float *)(*pauVar112 + lVar107 * 4));
                *(float *)(*pauVar116 + lVar107 * 4) = fVar186;
                lVar107 = lVar107 + 1;
                lVar122 = lVar122 + -4;
              } while (iVar100 - uVar102 != (int)lVar107);
              pauVar116 = (undefined1 (*) [64])((long)pauVar116 - lVar122);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar122);
              iVar99 = (int)local_230;
              iVar100 = (int)local_1b8;
            }
            else {
              iVar99 = (int)local_230;
            }
            pvVar120 = (void *)((long)local_238 + 1);
            iVar121 = local_20c;
          } while (pvVar120 != local_1a0);
        }
        local_1c0 = (void *)((long)local_1c0 + 1);
      } while (local_1c0 != local_1d0);
    }
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,(uint)local_1b0);
    if (((uint)local_108 == 3 && local_240->dims == 4) && 0 < (int)local_1d0) {
      iVar121 = iVar121 * iVar99;
      local_1d8 = local_1d8 * (long)local_208;
      auVar74._4_4_ = local_1b0._4_4_;
      auVar74._0_4_ = (uint)local_1b0;
      auVar74._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar74,1);
      local_1b0 = (void *)((long)iVar100 * (long)local_208);
      local_1c8 = (void *)0x0;
      local_20c = iVar121;
      do {
        if (0 < (int)local_1a0) {
          puVar117 = (undefined8 *)
                     (local_218->cstep * (long)local_1c8 * local_218->elemsize +
                     (long)local_218->data);
          pfVar113 = (float *)(local_240->cstep * (long)local_1c8 * local_240->elemsize +
                              (long)local_240->data);
          local_1c0 = (void *)(local_1d8 * (long)local_1c8 + (long)local_250);
          local_1b8 = (void *)0x0;
          do {
            if (0 < (int)local_1f8) {
              local_200 = (void *)((long)local_1b0 * (long)local_1b8 + (long)local_1c0);
              pvVar120 = (void *)0x0;
              do {
                fVar186 = *(float *)((long)local_200 + (long)pvVar120 * 4);
                local_1f0 = ZEXT416((uint)fVar186);
                if (iVar99 == 4) {
                  local_190 = *(__m128 *)((long)local_200 + (long)pvVar120 * 0x10);
                }
                else {
                  local_190[1] = fVar186;
                  local_190[0] = fVar186;
                  local_190[2] = fVar186;
                  local_190[3] = fVar186;
                }
                if (iVar99 == 8) {
                  local_a0 = *(__m256 *)((long)local_200 + (long)pvVar120 * 0x20);
                }
                else {
                  local_a0[4] = local_190[0];
                  local_a0[5] = local_190[1];
                  local_a0[6] = local_190[2];
                  local_a0[7] = local_190[3];
                  local_a0[0] = local_190[0];
                  local_a0[1] = local_190[1];
                  local_a0[2] = local_190[2];
                  local_a0[3] = local_190[3];
                }
                if (iVar99 == 0x10) {
                  local_180._0_64_ = *(undefined1 (*) [64])((long)local_200 + (long)pvVar120 * 0x40)
                  ;
                }
                else {
                  local_180._0_64_ =
                       vinsertf64x4_avx512f
                                 (ZEXT3264((undefined1  [32])local_a0),(undefined1  [32])local_a0,1)
                  ;
                }
                uVar102 = 0;
                local_238 = pvVar120;
                if (0xf < iVar121) {
                  uVar108 = 0;
                  do {
                    uVar209 = *(undefined8 *)pfVar113;
                    uVar208 = *(undefined8 *)(pfVar113 + 2);
                    uVar211 = *(undefined8 *)(pfVar113 + 4);
                    uVar212 = *(undefined8 *)(pfVar113 + 6);
                    uVar213 = *(undefined8 *)(pfVar113 + 8);
                    uVar214 = *(undefined8 *)(pfVar113 + 10);
                    uVar215 = *(undefined8 *)(pfVar113 + 0xc);
                    uVar216 = *(undefined8 *)(pfVar113 + 0xe);
                    _local_100 = *(__m512 *)pfVar113;
                    BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                              (&local_241,(__m512 *)local_100,(__m512 *)&local_180);
                    *puVar117 = uVar209;
                    puVar117[1] = uVar208;
                    puVar117[2] = uVar211;
                    puVar117[3] = uVar212;
                    puVar117[4] = uVar213;
                    puVar117[5] = uVar214;
                    puVar117[6] = uVar215;
                    puVar117[7] = uVar216;
                    pfVar113 = pfVar113 + 0x10;
                    puVar117 = puVar117 + 8;
                    uVar102 = uVar108 + 0x10;
                    iVar99 = uVar108 + 0x1f;
                    uVar108 = uVar102;
                  } while (iVar99 < iVar121);
                }
                uVar108 = uVar102 | 7;
                while ((int)uVar108 < iVar121) {
                  uVar209 = *(undefined8 *)pfVar113;
                  uVar208 = *(undefined8 *)(pfVar113 + 2);
                  uVar211 = *(undefined8 *)(pfVar113 + 4);
                  uVar212 = *(undefined8 *)(pfVar113 + 6);
                  local_100 = *(undefined1 (*) [32])pfVar113;
                  BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                            (&local_241,(__m256 *)local_100,&local_a0);
                  *puVar117 = uVar209;
                  puVar117[1] = uVar208;
                  puVar117[2] = uVar211;
                  puVar117[3] = uVar212;
                  pfVar113 = pfVar113 + 8;
                  puVar117 = puVar117 + 4;
                  uVar108 = uVar102 + 0xf;
                  uVar102 = uVar102 + 8;
                }
                uVar108 = uVar102 | 3;
                while ((int)uVar108 < iVar121) {
                  uVar209 = *(undefined8 *)(pfVar113 + 2);
                  local_100._0_16_ = *(undefined1 (*) [16])pfVar113;
                  afVar333 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                       (&local_241,(__m128 *)local_100,&local_190);
                  *puVar117 = afVar333._0_8_;
                  puVar117[1] = uVar209;
                  pfVar113 = pfVar113 + 4;
                  puVar117 = puVar117 + 2;
                  uVar108 = uVar102 + 7;
                  uVar102 = uVar102 + 4;
                }
                if ((int)uVar102 < iVar121) {
                  lVar122 = 0;
                  lVar107 = 0;
                  do {
                    fVar186 = powf((float)local_1f0._0_4_,pfVar113[lVar107]);
                    *(float *)((long)puVar117 + lVar107 * 4) = fVar186;
                    lVar107 = lVar107 + 1;
                    lVar122 = lVar122 + -4;
                  } while (iVar121 - uVar102 != (int)lVar107);
                  puVar117 = (undefined8 *)((long)puVar117 - lVar122);
                  pfVar113 = (float *)((long)pfVar113 - lVar122);
                  iVar121 = local_20c;
                }
                pvVar120 = (void *)((long)local_238 + 1);
                iVar99 = (int)local_230;
              } while (pvVar120 != local_1f8);
            }
            local_1b8 = (void *)((long)local_1b8 + 1);
          } while (local_1b8 != local_1a0);
        }
        local_1c8 = (void *)((long)local_1c8 + 1);
      } while (local_1c8 != local_1d0);
    }
    break;
  case 10:
    local_20c = local_240->w;
    local_1f8 = (void *)(ulong)(uint)local_240->h;
    local_1c0 = (void *)(ulong)(uint)local_240->d;
    local_1c8 = (void *)(ulong)(uint)local_240->c;
    iVar99 = local_240->elempack;
    local_194 = (float)(uint)local_1b0;
    local_230 = (void *)CONCAT44(local_230._4_4_,iVar99);
    if (0 < local_240->h && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      iVar121 = iVar99 * local_20c;
      local_200 = (void *)(CONCAT44(local_200._4_4_,iVar121) & 0xfffffffffffffff0);
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      pvVar120 = (void *)0x0;
      auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      do {
        auVar156 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar102 = *(uint *)((long)local_250 + (long)pvVar120 * 4);
        local_1f0 = ZEXT416(uVar102);
        if (iVar99 == 4) {
          auVar192 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar192._4_4_ = uVar102;
          auVar192._0_4_ = uVar102;
          auVar192._8_4_ = uVar102;
          auVar192._12_4_ = uVar102;
        }
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_240->w * (long)pvVar120 * local_240->elemsize +
                    (long)local_240->data);
        puVar114 = (uint *)((long)local_218->w * (long)pvVar120 * local_218->elemsize +
                           (long)local_218->data);
        local_a0[0] = (float)auVar192._0_4_;
        local_a0[1] = (float)auVar192._4_4_;
        local_a0[2] = (float)auVar192._8_4_;
        local_a0[3] = (float)auVar192._12_4_;
        if (iVar99 == 8) {
          auVar202 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar202._16_16_ = auVar192;
          auVar202._0_16_ = auVar192;
        }
        local_180._0_32_ = auVar202;
        if (iVar99 == 0x10) {
          auVar137 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar137 = vinsertf64x4_avx512f(ZEXT3264(auVar202),auVar202,1);
        }
        uVar102 = 0;
        if (0xf < iVar121) {
          auVar136 = vrcp14ps_avx512f(auVar137);
          auVar144 = vfmsub213ps_avx512f(auVar136,auVar137,auVar123);
          auVar138 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar138 = vpternlogd_avx512f(auVar138,auVar137,auVar124,0xf8);
          uVar103 = vcmpps_avx512f(auVar138,auVar156,1);
          auVar138 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar161._4_4_ = (uint)((byte)(uVar103 >> 1) & 1) * auVar138._4_4_;
          auVar161._0_4_ = (uint)((byte)uVar103 & 1) * auVar138._0_4_;
          auVar161._8_4_ = (uint)((byte)(uVar103 >> 2) & 1) * auVar138._8_4_;
          auVar161._12_4_ = (uint)((byte)(uVar103 >> 3) & 1) * auVar138._12_4_;
          auVar161._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_;
          auVar161._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_;
          auVar161._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_;
          auVar161._28_4_ = (uint)((byte)(uVar103 >> 7) & 1) * auVar138._28_4_;
          auVar161._32_4_ = (uint)((byte)(uVar103 >> 8) & 1) * auVar138._32_4_;
          auVar161._36_4_ = (uint)((byte)(uVar103 >> 9) & 1) * auVar138._36_4_;
          auVar161._40_4_ = (uint)((byte)(uVar103 >> 10) & 1) * auVar138._40_4_;
          auVar161._44_4_ = (uint)((byte)(uVar103 >> 0xb) & 1) * auVar138._44_4_;
          auVar161._48_4_ = (uint)((byte)(uVar103 >> 0xc) & 1) * auVar138._48_4_;
          auVar161._52_4_ = (uint)((byte)(uVar103 >> 0xd) & 1) * auVar138._52_4_;
          auVar161._56_4_ = (uint)((byte)(uVar103 >> 0xe) & 1) * auVar138._56_4_;
          auVar161._60_4_ = (uint)(byte)(uVar103 >> 0xf) * auVar138._60_4_;
          auVar144 = vfnmadd132ps_avx512vl(auVar144,auVar136,auVar136);
          iVar99 = 0xf;
          uVar103 = vcmpps_avx512f(auVar137,auVar156,1);
          uVar111 = vcmpps_avx512f(auVar137,auVar156,4);
          do {
            auVar137 = *pauVar112;
            uVar119 = vcmpps_avx512f(auVar137,auVar156,1);
            auVar43._8_4_ = 0xc0490fdb;
            auVar43._0_8_ = 0xc0490fdbc0490fdb;
            auVar43._12_4_ = 0xc0490fdb;
            auVar43._16_4_ = 0xc0490fdb;
            auVar43._20_4_ = 0xc0490fdb;
            auVar43._24_4_ = 0xc0490fdb;
            auVar43._28_4_ = 0xc0490fdb;
            auVar43._32_4_ = 0xc0490fdb;
            auVar43._36_4_ = 0xc0490fdb;
            auVar43._40_4_ = 0xc0490fdb;
            auVar43._44_4_ = 0xc0490fdb;
            auVar43._48_4_ = 0xc0490fdb;
            auVar43._52_4_ = 0xc0490fdb;
            auVar43._56_4_ = 0xc0490fdb;
            auVar43._60_4_ = 0xc0490fdb;
            auVar138 = vblendmps_avx512f(auVar125,auVar43);
            bVar3 = (bool)((byte)uVar119 & 1);
            auVar162._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_;
            bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
            auVar162._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar136._4_4_;
            bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
            auVar162._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar136._8_4_;
            bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
            auVar162._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar136._12_4_;
            bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
            auVar162._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar136._16_4_;
            bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
            auVar162._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar136._20_4_;
            bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
            auVar162._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar136._24_4_;
            bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
            auVar162._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar136._28_4_;
            bVar3 = (bool)((byte)(uVar119 >> 8) & 1);
            auVar162._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar136._32_4_;
            bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
            auVar162._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar136._36_4_;
            bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
            auVar162._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar136._40_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
            auVar162._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar136._44_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
            auVar162._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar136._48_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
            auVar162._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar136._52_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
            auVar162._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar136._56_4_;
            bVar3 = SUB81(uVar119 >> 0xf,0);
            auVar162._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar136._60_4_;
            auVar136 = vmulps_avx512f(auVar137,auVar144);
            auVar138 = vandps_avx512dq(auVar136,auVar126);
            uVar119 = vcmpps_avx512f(auVar123,auVar138,1);
            auVar139 = vmaxps_avx512f(auVar138,auVar123);
            auVar44._8_4_ = 0xbf800000;
            auVar44._0_8_ = 0xbf800000bf800000;
            auVar44._12_4_ = 0xbf800000;
            auVar44._16_4_ = 0xbf800000;
            auVar44._20_4_ = 0xbf800000;
            auVar44._24_4_ = 0xbf800000;
            auVar44._28_4_ = 0xbf800000;
            auVar44._32_4_ = 0xbf800000;
            auVar44._36_4_ = 0xbf800000;
            auVar44._40_4_ = 0xbf800000;
            auVar44._44_4_ = 0xbf800000;
            auVar44._48_4_ = 0xbf800000;
            auVar44._52_4_ = 0xbf800000;
            auVar44._56_4_ = 0xbf800000;
            auVar44._60_4_ = 0xbf800000;
            auVar140 = vblendmps_avx512f(auVar138,auVar44);
            bVar3 = (bool)((byte)uVar119 & 1);
            auVar163._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
            bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
            auVar163._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
            bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
            auVar163._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
            bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
            auVar163._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_;
            bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
            auVar163._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_;
            bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
            auVar163._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_;
            bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
            auVar163._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_;
            bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
            auVar163._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_;
            bVar19 = (byte)(uVar119 >> 8);
            bVar3 = (bool)(bVar19 & 1);
            auVar163._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_;
            bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
            auVar163._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_;
            bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
            auVar163._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
            auVar163._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
            auVar163._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
            auVar163._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
            auVar163._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_;
            bVar3 = SUB81(uVar119 >> 0xf,0);
            auVar163._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_;
            auVar138 = vrcp14ps_avx512f(auVar139);
            auVar140 = vmulps_avx512f(auVar163,auVar138);
            auVar139 = vfmsub213ps_avx512f(auVar139,auVar140,auVar163);
            auVar138 = vfnmadd213ps_avx512f(auVar139,auVar138,auVar140);
            auVar139 = vmulps_avx512f(auVar138,auVar138);
            auVar140 = vmulps_avx512f(auVar139,auVar139);
            auVar141 = vfmadd213ps_avx512f(auVar127,auVar140,auVar128);
            auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar129);
            auVar142 = vfmadd213ps_avx512f(auVar131,auVar140,auVar132);
            auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar133);
            auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar134);
            auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar130);
            auVar140 = vfmadd213ps_avx512f(auVar142,auVar140,auVar123);
            auVar139 = vfmadd231ps_avx512f(auVar140,auVar139,auVar141);
            auVar138 = vmulps_avx512f(auVar139,auVar138);
            uVar36 = vcmpps_avx512f(auVar137,auVar156,4);
            auVar139 = vaddps_avx512f(auVar138,auVar135);
            bVar3 = (bool)((byte)uVar119 & 1);
            auVar164._0_4_ = (uint)bVar3 * auVar139._0_4_ | (uint)!bVar3 * auVar138._0_4_;
            bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
            auVar164._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * auVar138._4_4_;
            bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
            auVar164._8_4_ = (uint)bVar3 * auVar139._8_4_ | (uint)!bVar3 * auVar138._8_4_;
            bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
            auVar164._12_4_ = (uint)bVar3 * auVar139._12_4_ | (uint)!bVar3 * auVar138._12_4_;
            bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
            auVar164._16_4_ = (uint)bVar3 * auVar139._16_4_ | (uint)!bVar3 * auVar138._16_4_;
            bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
            auVar164._20_4_ = (uint)bVar3 * auVar139._20_4_ | (uint)!bVar3 * auVar138._20_4_;
            bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
            auVar164._24_4_ = (uint)bVar3 * auVar139._24_4_ | (uint)!bVar3 * auVar138._24_4_;
            bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
            auVar164._28_4_ = (uint)bVar3 * auVar139._28_4_ | (uint)!bVar3 * auVar138._28_4_;
            bVar3 = (bool)(bVar19 & 1);
            auVar164._32_4_ = (uint)bVar3 * auVar139._32_4_ | (uint)!bVar3 * auVar138._32_4_;
            bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
            auVar164._36_4_ = (uint)bVar3 * auVar139._36_4_ | (uint)!bVar3 * auVar138._36_4_;
            bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
            auVar164._40_4_ = (uint)bVar3 * auVar139._40_4_ | (uint)!bVar3 * auVar138._40_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
            auVar164._44_4_ = (uint)bVar3 * auVar139._44_4_ | (uint)!bVar3 * auVar138._44_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
            auVar164._48_4_ = (uint)bVar3 * auVar139._48_4_ | (uint)!bVar3 * auVar138._48_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
            auVar164._52_4_ = (uint)bVar3 * auVar139._52_4_ | (uint)!bVar3 * auVar138._52_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
            auVar164._56_4_ = (uint)bVar3 * auVar139._56_4_ | (uint)!bVar3 * auVar138._56_4_;
            bVar3 = SUB81(uVar119 >> 0xf,0);
            auVar164._60_4_ = (uint)bVar3 * auVar139._60_4_ | (uint)!bVar3 * auVar138._60_4_;
            auVar136 = vpternlogd_avx512f(auVar164,auVar136,auVar124,0xf8);
            auVar138 = vaddps_avx512f(auVar136,auVar162);
            bVar3 = (bool)((byte)uVar103 & 1);
            bVar5 = (bool)((byte)(uVar103 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar103 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar103 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar103 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar103 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar103 >> 6) & 1);
            bVar11 = (bool)((byte)(uVar103 >> 7) & 1);
            bVar12 = (bool)((byte)(uVar103 >> 8) & 1);
            bVar13 = (bool)((byte)(uVar103 >> 9) & 1);
            bVar14 = (bool)((byte)(uVar103 >> 10) & 1);
            bVar15 = (bool)((byte)(uVar103 >> 0xb) & 1);
            bVar16 = (bool)((byte)(uVar103 >> 0xc) & 1);
            bVar17 = (bool)((byte)(uVar103 >> 0xd) & 1);
            bVar18 = (bool)((byte)(uVar103 >> 0xe) & 1);
            bVar20 = SUB81(uVar103 >> 0xf,0);
            auVar137 = vpternlogd_avx512f(auVar137,auVar124,auVar332,0xea);
            bVar4 = (bool)((byte)uVar111 & 1);
            auVar165._0_4_ =
                 (uint)bVar4 * ((uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_) |
                 (uint)!bVar4 * auVar137._0_4_;
            bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
            auVar165._4_4_ =
                 (uint)bVar3 * ((uint)bVar5 * auVar138._4_4_ | (uint)!bVar5 * auVar136._4_4_) |
                 (uint)!bVar3 * auVar137._4_4_;
            bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
            auVar165._8_4_ =
                 (uint)bVar3 * ((uint)bVar6 * auVar138._8_4_ | (uint)!bVar6 * auVar136._8_4_) |
                 (uint)!bVar3 * auVar137._8_4_;
            bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
            auVar165._12_4_ =
                 (uint)bVar3 * ((uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * auVar136._12_4_) |
                 (uint)!bVar3 * auVar137._12_4_;
            bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
            auVar165._16_4_ =
                 (uint)bVar3 * ((uint)bVar8 * auVar138._16_4_ | (uint)!bVar8 * auVar136._16_4_) |
                 (uint)!bVar3 * auVar137._16_4_;
            bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
            auVar165._20_4_ =
                 (uint)bVar3 * ((uint)bVar9 * auVar138._20_4_ | (uint)!bVar9 * auVar136._20_4_) |
                 (uint)!bVar3 * auVar137._20_4_;
            bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
            auVar165._24_4_ =
                 (uint)bVar3 * ((uint)bVar10 * auVar138._24_4_ | (uint)!bVar10 * auVar136._24_4_) |
                 (uint)!bVar3 * auVar137._24_4_;
            bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
            auVar165._28_4_ =
                 (uint)bVar3 * ((uint)bVar11 * auVar138._28_4_ | (uint)!bVar11 * auVar136._28_4_) |
                 (uint)!bVar3 * auVar137._28_4_;
            bVar3 = (bool)((byte)(uVar111 >> 8) & 1);
            auVar165._32_4_ =
                 (uint)bVar3 * ((uint)bVar12 * auVar138._32_4_ | (uint)!bVar12 * auVar136._32_4_) |
                 (uint)!bVar3 * auVar137._32_4_;
            bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
            auVar165._36_4_ =
                 (uint)bVar3 * ((uint)bVar13 * auVar138._36_4_ | (uint)!bVar13 * auVar136._36_4_) |
                 (uint)!bVar3 * auVar137._36_4_;
            bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
            auVar165._40_4_ =
                 (uint)bVar3 * ((uint)bVar14 * auVar138._40_4_ | (uint)!bVar14 * auVar136._40_4_) |
                 (uint)!bVar3 * auVar137._40_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
            auVar165._44_4_ =
                 (uint)bVar3 * ((uint)bVar15 * auVar138._44_4_ | (uint)!bVar15 * auVar136._44_4_) |
                 (uint)!bVar3 * auVar137._44_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
            auVar165._48_4_ =
                 (uint)bVar3 * ((uint)bVar16 * auVar138._48_4_ | (uint)!bVar16 * auVar136._48_4_) |
                 (uint)!bVar3 * auVar137._48_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
            auVar165._52_4_ =
                 (uint)bVar3 * ((uint)bVar17 * auVar138._52_4_ | (uint)!bVar17 * auVar136._52_4_) |
                 (uint)!bVar3 * auVar137._52_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
            auVar165._56_4_ =
                 (uint)bVar3 * ((uint)bVar18 * auVar138._56_4_ | (uint)!bVar18 * auVar136._56_4_) |
                 (uint)!bVar3 * auVar137._56_4_;
            bVar3 = SUB81(uVar111 >> 0xf,0);
            auVar165._60_4_ =
                 (uint)bVar3 * ((uint)bVar20 * auVar138._60_4_ | (uint)!bVar20 * auVar136._60_4_) |
                 (uint)!bVar3 * auVar137._60_4_;
            auVar137 = vblendmps_avx512f(auVar161,auVar165);
            bVar3 = (bool)((byte)uVar36 & 1);
            bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar36 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar36 >> 6) & 1);
            bVar10 = (bool)((byte)(uVar36 >> 7) & 1);
            bVar11 = (bool)((byte)(uVar36 >> 8) & 1);
            bVar12 = (bool)((byte)(uVar36 >> 9) & 1);
            bVar13 = (bool)((byte)(uVar36 >> 10) & 1);
            bVar14 = (bool)((byte)(uVar36 >> 0xb) & 1);
            bVar15 = (bool)((byte)(uVar36 >> 0xc) & 1);
            bVar16 = (bool)((byte)(uVar36 >> 0xd) & 1);
            bVar17 = (bool)((byte)(uVar36 >> 0xe) & 1);
            bVar18 = SUB81(uVar36 >> 0xf,0);
            *puVar114 = (uint)bVar3 * auVar137._0_4_ | !bVar3 * auVar165._0_4_;
            puVar114[1] = (uint)bVar4 * auVar137._4_4_ | !bVar4 * auVar165._4_4_;
            puVar114[2] = (uint)bVar5 * auVar137._8_4_ | !bVar5 * auVar165._8_4_;
            puVar114[3] = (uint)bVar6 * auVar137._12_4_ | !bVar6 * auVar165._12_4_;
            puVar114[4] = (uint)bVar7 * auVar137._16_4_ | !bVar7 * auVar165._16_4_;
            puVar114[5] = (uint)bVar8 * auVar137._20_4_ | !bVar8 * auVar165._20_4_;
            puVar114[6] = (uint)bVar9 * auVar137._24_4_ | !bVar9 * auVar165._24_4_;
            puVar114[7] = (uint)bVar10 * auVar137._28_4_ | !bVar10 * auVar165._28_4_;
            puVar114[8] = (uint)bVar11 * auVar137._32_4_ | !bVar11 * auVar165._32_4_;
            puVar114[9] = (uint)bVar12 * auVar137._36_4_ | !bVar12 * auVar165._36_4_;
            puVar114[10] = (uint)bVar13 * auVar137._40_4_ | !bVar13 * auVar165._40_4_;
            puVar114[0xb] = (uint)bVar14 * auVar137._44_4_ | !bVar14 * auVar165._44_4_;
            puVar114[0xc] = (uint)bVar15 * auVar137._48_4_ | !bVar15 * auVar165._48_4_;
            puVar114[0xd] = (uint)bVar16 * auVar137._52_4_ | !bVar16 * auVar165._52_4_;
            puVar114[0xe] = (uint)bVar17 * auVar137._56_4_ | !bVar17 * auVar165._56_4_;
            puVar114[0xf] = (uint)bVar18 * auVar137._60_4_ | !bVar18 * auVar165._60_4_;
            pauVar112 = pauVar112 + 1;
            puVar114 = puVar114 + 0x10;
            iVar99 = iVar99 + 0x10;
            auVar136 = auVar162;
          } while (iVar99 < iVar121);
          uVar102 = (uint)local_200;
        }
        uVar108 = uVar102 | 7;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)*pauVar112;
          uVar208 = *(undefined8 *)(*pauVar112 + 8);
          uVar211 = *(undefined8 *)(*pauVar112 + 0x10);
          uVar212 = *(undefined8 *)(*pauVar112 + 0x18);
          local_100 = *(undefined1 (*) [32])*pauVar112;
          BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                    ((binary_op_atan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180);
          *(undefined8 *)puVar114 = uVar209;
          *(undefined8 *)(puVar114 + 2) = uVar208;
          *(undefined8 *)(puVar114 + 4) = uVar211;
          *(undefined8 *)(puVar114 + 6) = uVar212;
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
          puVar114 = puVar114 + 8;
          uVar108 = uVar102 + 0xf;
          uVar102 = uVar102 + 8;
        }
        uVar108 = uVar102 | 3;
        local_238 = pvVar120;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)(*pauVar112 + 8);
          local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
          afVar333 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                               ((binary_op_atan2 *)local_190,(__m128 *)local_100,(__m128 *)local_a0)
          ;
          *(long *)puVar114 = afVar333._0_8_;
          *(undefined8 *)(puVar114 + 2) = uVar209;
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
          puVar114 = puVar114 + 4;
          uVar108 = uVar102 + 7;
          uVar102 = uVar102 + 4;
        }
        if (iVar121 - uVar102 != 0 && (int)uVar102 <= iVar121) {
          lVar107 = 0;
          do {
            fVar186 = atan2f(*(float *)(*pauVar112 + lVar107 * 4),local_1f0._0_4_);
            puVar114[lVar107] = (uint)fVar186;
            lVar107 = lVar107 + 1;
          } while (iVar121 - uVar102 != (int)lVar107);
        }
        pvVar120 = (void *)((long)local_238 + 1);
        auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        iVar99 = (int)local_230;
      } while (pvVar120 != local_1f8);
    }
    if ((0 < (int)local_1c8 && local_194 == 1.4013e-45) && local_240->dims - 3U < 2) {
      iVar121 = (int)local_1f8 * (int)local_1c0 * iVar99 * local_20c;
      local_200 = (void *)(CONCAT44(local_200._4_4_,iVar121) & 0xfffffffffffffff0);
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      pvVar120 = (void *)0x0;
      auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      do {
        auVar156 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar102 = *(uint *)((long)local_250 + (long)pvVar120 * 4);
        local_1f0 = ZEXT416(uVar102);
        if (iVar99 == 4) {
          auVar193 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar193._4_4_ = uVar102;
          auVar193._0_4_ = uVar102;
          auVar193._8_4_ = uVar102;
          auVar193._12_4_ = uVar102;
        }
        pauVar112 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        puVar114 = (uint *)(local_218->cstep * (long)pvVar120 * local_218->elemsize +
                           (long)local_218->data);
        local_a0[0] = (float)auVar193._0_4_;
        local_a0[1] = (float)auVar193._4_4_;
        local_a0[2] = (float)auVar193._8_4_;
        local_a0[3] = (float)auVar193._12_4_;
        if (iVar99 == 8) {
          auVar203 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar203._16_16_ = auVar193;
          auVar203._0_16_ = auVar193;
        }
        local_180._0_32_ = auVar203;
        if (iVar99 == 0x10) {
          auVar137 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar137 = vinsertf64x4_avx512f(ZEXT3264(auVar203),auVar203,1);
        }
        uVar102 = 0;
        if (0xf < iVar121) {
          auVar136 = vrcp14ps_avx512f(auVar137);
          auVar144 = vfmsub213ps_avx512f(auVar136,auVar137,auVar123);
          auVar138 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar138 = vpternlogd_avx512f(auVar138,auVar137,auVar124,0xf8);
          uVar103 = vcmpps_avx512f(auVar138,auVar156,1);
          auVar138 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar166._4_4_ = (uint)((byte)(uVar103 >> 1) & 1) * auVar138._4_4_;
          auVar166._0_4_ = (uint)((byte)uVar103 & 1) * auVar138._0_4_;
          auVar166._8_4_ = (uint)((byte)(uVar103 >> 2) & 1) * auVar138._8_4_;
          auVar166._12_4_ = (uint)((byte)(uVar103 >> 3) & 1) * auVar138._12_4_;
          auVar166._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_;
          auVar166._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_;
          auVar166._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_;
          auVar166._28_4_ = (uint)((byte)(uVar103 >> 7) & 1) * auVar138._28_4_;
          auVar166._32_4_ = (uint)((byte)(uVar103 >> 8) & 1) * auVar138._32_4_;
          auVar166._36_4_ = (uint)((byte)(uVar103 >> 9) & 1) * auVar138._36_4_;
          auVar166._40_4_ = (uint)((byte)(uVar103 >> 10) & 1) * auVar138._40_4_;
          auVar166._44_4_ = (uint)((byte)(uVar103 >> 0xb) & 1) * auVar138._44_4_;
          auVar166._48_4_ = (uint)((byte)(uVar103 >> 0xc) & 1) * auVar138._48_4_;
          auVar166._52_4_ = (uint)((byte)(uVar103 >> 0xd) & 1) * auVar138._52_4_;
          auVar166._56_4_ = (uint)((byte)(uVar103 >> 0xe) & 1) * auVar138._56_4_;
          auVar166._60_4_ = (uint)(byte)(uVar103 >> 0xf) * auVar138._60_4_;
          auVar144 = vfnmadd132ps_avx512vl(auVar144,auVar136,auVar136);
          iVar99 = 0xf;
          uVar103 = vcmpps_avx512f(auVar137,auVar156,1);
          uVar111 = vcmpps_avx512f(auVar137,auVar156,4);
          do {
            auVar137 = *pauVar112;
            uVar119 = vcmpps_avx512f(auVar137,auVar156,1);
            auVar45._8_4_ = 0xc0490fdb;
            auVar45._0_8_ = 0xc0490fdbc0490fdb;
            auVar45._12_4_ = 0xc0490fdb;
            auVar45._16_4_ = 0xc0490fdb;
            auVar45._20_4_ = 0xc0490fdb;
            auVar45._24_4_ = 0xc0490fdb;
            auVar45._28_4_ = 0xc0490fdb;
            auVar45._32_4_ = 0xc0490fdb;
            auVar45._36_4_ = 0xc0490fdb;
            auVar45._40_4_ = 0xc0490fdb;
            auVar45._44_4_ = 0xc0490fdb;
            auVar45._48_4_ = 0xc0490fdb;
            auVar45._52_4_ = 0xc0490fdb;
            auVar45._56_4_ = 0xc0490fdb;
            auVar45._60_4_ = 0xc0490fdb;
            auVar138 = vblendmps_avx512f(auVar125,auVar45);
            bVar3 = (bool)((byte)uVar119 & 1);
            auVar167._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_;
            bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
            auVar167._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar136._4_4_;
            bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
            auVar167._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar136._8_4_;
            bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
            auVar167._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar136._12_4_;
            bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
            auVar167._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar136._16_4_;
            bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
            auVar167._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar136._20_4_;
            bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
            auVar167._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar136._24_4_;
            bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
            auVar167._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar136._28_4_;
            bVar3 = (bool)((byte)(uVar119 >> 8) & 1);
            auVar167._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar136._32_4_;
            bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
            auVar167._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar136._36_4_;
            bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
            auVar167._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar136._40_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
            auVar167._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar136._44_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
            auVar167._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar136._48_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
            auVar167._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar136._52_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
            auVar167._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar136._56_4_;
            bVar3 = SUB81(uVar119 >> 0xf,0);
            auVar167._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar136._60_4_;
            auVar136 = vmulps_avx512f(auVar137,auVar144);
            auVar138 = vandps_avx512dq(auVar136,auVar126);
            uVar119 = vcmpps_avx512f(auVar123,auVar138,1);
            auVar139 = vmaxps_avx512f(auVar138,auVar123);
            auVar46._8_4_ = 0xbf800000;
            auVar46._0_8_ = 0xbf800000bf800000;
            auVar46._12_4_ = 0xbf800000;
            auVar46._16_4_ = 0xbf800000;
            auVar46._20_4_ = 0xbf800000;
            auVar46._24_4_ = 0xbf800000;
            auVar46._28_4_ = 0xbf800000;
            auVar46._32_4_ = 0xbf800000;
            auVar46._36_4_ = 0xbf800000;
            auVar46._40_4_ = 0xbf800000;
            auVar46._44_4_ = 0xbf800000;
            auVar46._48_4_ = 0xbf800000;
            auVar46._52_4_ = 0xbf800000;
            auVar46._56_4_ = 0xbf800000;
            auVar46._60_4_ = 0xbf800000;
            auVar140 = vblendmps_avx512f(auVar138,auVar46);
            bVar3 = (bool)((byte)uVar119 & 1);
            auVar168._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
            bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
            auVar168._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
            bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
            auVar168._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
            bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
            auVar168._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_;
            bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
            auVar168._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_;
            bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
            auVar168._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_;
            bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
            auVar168._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_;
            bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
            auVar168._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_;
            bVar19 = (byte)(uVar119 >> 8);
            bVar3 = (bool)(bVar19 & 1);
            auVar168._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_;
            bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
            auVar168._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_;
            bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
            auVar168._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
            auVar168._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
            auVar168._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
            auVar168._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
            auVar168._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_;
            bVar3 = SUB81(uVar119 >> 0xf,0);
            auVar168._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_;
            auVar138 = vrcp14ps_avx512f(auVar139);
            auVar140 = vmulps_avx512f(auVar168,auVar138);
            auVar139 = vfmsub213ps_avx512f(auVar139,auVar140,auVar168);
            auVar138 = vfnmadd213ps_avx512f(auVar139,auVar138,auVar140);
            auVar139 = vmulps_avx512f(auVar138,auVar138);
            auVar140 = vmulps_avx512f(auVar139,auVar139);
            auVar141 = vfmadd213ps_avx512f(auVar127,auVar140,auVar128);
            auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar129);
            auVar142 = vfmadd213ps_avx512f(auVar131,auVar140,auVar132);
            auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar133);
            auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar134);
            auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar130);
            auVar140 = vfmadd213ps_avx512f(auVar142,auVar140,auVar123);
            auVar139 = vfmadd231ps_avx512f(auVar140,auVar139,auVar141);
            auVar138 = vmulps_avx512f(auVar139,auVar138);
            uVar36 = vcmpps_avx512f(auVar137,auVar156,4);
            auVar139 = vaddps_avx512f(auVar138,auVar135);
            bVar3 = (bool)((byte)uVar119 & 1);
            auVar169._0_4_ = (uint)bVar3 * auVar139._0_4_ | (uint)!bVar3 * auVar138._0_4_;
            bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
            auVar169._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * auVar138._4_4_;
            bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
            auVar169._8_4_ = (uint)bVar3 * auVar139._8_4_ | (uint)!bVar3 * auVar138._8_4_;
            bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
            auVar169._12_4_ = (uint)bVar3 * auVar139._12_4_ | (uint)!bVar3 * auVar138._12_4_;
            bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
            auVar169._16_4_ = (uint)bVar3 * auVar139._16_4_ | (uint)!bVar3 * auVar138._16_4_;
            bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
            auVar169._20_4_ = (uint)bVar3 * auVar139._20_4_ | (uint)!bVar3 * auVar138._20_4_;
            bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
            auVar169._24_4_ = (uint)bVar3 * auVar139._24_4_ | (uint)!bVar3 * auVar138._24_4_;
            bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
            auVar169._28_4_ = (uint)bVar3 * auVar139._28_4_ | (uint)!bVar3 * auVar138._28_4_;
            bVar3 = (bool)(bVar19 & 1);
            auVar169._32_4_ = (uint)bVar3 * auVar139._32_4_ | (uint)!bVar3 * auVar138._32_4_;
            bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
            auVar169._36_4_ = (uint)bVar3 * auVar139._36_4_ | (uint)!bVar3 * auVar138._36_4_;
            bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
            auVar169._40_4_ = (uint)bVar3 * auVar139._40_4_ | (uint)!bVar3 * auVar138._40_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
            auVar169._44_4_ = (uint)bVar3 * auVar139._44_4_ | (uint)!bVar3 * auVar138._44_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
            auVar169._48_4_ = (uint)bVar3 * auVar139._48_4_ | (uint)!bVar3 * auVar138._48_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
            auVar169._52_4_ = (uint)bVar3 * auVar139._52_4_ | (uint)!bVar3 * auVar138._52_4_;
            bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
            auVar169._56_4_ = (uint)bVar3 * auVar139._56_4_ | (uint)!bVar3 * auVar138._56_4_;
            bVar3 = SUB81(uVar119 >> 0xf,0);
            auVar169._60_4_ = (uint)bVar3 * auVar139._60_4_ | (uint)!bVar3 * auVar138._60_4_;
            auVar136 = vpternlogd_avx512f(auVar169,auVar136,auVar124,0xf8);
            auVar138 = vaddps_avx512f(auVar136,auVar167);
            bVar3 = (bool)((byte)uVar103 & 1);
            bVar5 = (bool)((byte)(uVar103 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar103 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar103 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar103 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar103 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar103 >> 6) & 1);
            bVar11 = (bool)((byte)(uVar103 >> 7) & 1);
            bVar12 = (bool)((byte)(uVar103 >> 8) & 1);
            bVar13 = (bool)((byte)(uVar103 >> 9) & 1);
            bVar14 = (bool)((byte)(uVar103 >> 10) & 1);
            bVar15 = (bool)((byte)(uVar103 >> 0xb) & 1);
            bVar16 = (bool)((byte)(uVar103 >> 0xc) & 1);
            bVar17 = (bool)((byte)(uVar103 >> 0xd) & 1);
            bVar18 = (bool)((byte)(uVar103 >> 0xe) & 1);
            bVar20 = SUB81(uVar103 >> 0xf,0);
            auVar137 = vpternlogd_avx512f(auVar137,auVar124,auVar332,0xea);
            bVar4 = (bool)((byte)uVar111 & 1);
            auVar170._0_4_ =
                 (uint)bVar4 * ((uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_) |
                 (uint)!bVar4 * auVar137._0_4_;
            bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
            auVar170._4_4_ =
                 (uint)bVar3 * ((uint)bVar5 * auVar138._4_4_ | (uint)!bVar5 * auVar136._4_4_) |
                 (uint)!bVar3 * auVar137._4_4_;
            bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
            auVar170._8_4_ =
                 (uint)bVar3 * ((uint)bVar6 * auVar138._8_4_ | (uint)!bVar6 * auVar136._8_4_) |
                 (uint)!bVar3 * auVar137._8_4_;
            bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
            auVar170._12_4_ =
                 (uint)bVar3 * ((uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * auVar136._12_4_) |
                 (uint)!bVar3 * auVar137._12_4_;
            bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
            auVar170._16_4_ =
                 (uint)bVar3 * ((uint)bVar8 * auVar138._16_4_ | (uint)!bVar8 * auVar136._16_4_) |
                 (uint)!bVar3 * auVar137._16_4_;
            bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
            auVar170._20_4_ =
                 (uint)bVar3 * ((uint)bVar9 * auVar138._20_4_ | (uint)!bVar9 * auVar136._20_4_) |
                 (uint)!bVar3 * auVar137._20_4_;
            bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
            auVar170._24_4_ =
                 (uint)bVar3 * ((uint)bVar10 * auVar138._24_4_ | (uint)!bVar10 * auVar136._24_4_) |
                 (uint)!bVar3 * auVar137._24_4_;
            bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
            auVar170._28_4_ =
                 (uint)bVar3 * ((uint)bVar11 * auVar138._28_4_ | (uint)!bVar11 * auVar136._28_4_) |
                 (uint)!bVar3 * auVar137._28_4_;
            bVar3 = (bool)((byte)(uVar111 >> 8) & 1);
            auVar170._32_4_ =
                 (uint)bVar3 * ((uint)bVar12 * auVar138._32_4_ | (uint)!bVar12 * auVar136._32_4_) |
                 (uint)!bVar3 * auVar137._32_4_;
            bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
            auVar170._36_4_ =
                 (uint)bVar3 * ((uint)bVar13 * auVar138._36_4_ | (uint)!bVar13 * auVar136._36_4_) |
                 (uint)!bVar3 * auVar137._36_4_;
            bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
            auVar170._40_4_ =
                 (uint)bVar3 * ((uint)bVar14 * auVar138._40_4_ | (uint)!bVar14 * auVar136._40_4_) |
                 (uint)!bVar3 * auVar137._40_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
            auVar170._44_4_ =
                 (uint)bVar3 * ((uint)bVar15 * auVar138._44_4_ | (uint)!bVar15 * auVar136._44_4_) |
                 (uint)!bVar3 * auVar137._44_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
            auVar170._48_4_ =
                 (uint)bVar3 * ((uint)bVar16 * auVar138._48_4_ | (uint)!bVar16 * auVar136._48_4_) |
                 (uint)!bVar3 * auVar137._48_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
            auVar170._52_4_ =
                 (uint)bVar3 * ((uint)bVar17 * auVar138._52_4_ | (uint)!bVar17 * auVar136._52_4_) |
                 (uint)!bVar3 * auVar137._52_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
            auVar170._56_4_ =
                 (uint)bVar3 * ((uint)bVar18 * auVar138._56_4_ | (uint)!bVar18 * auVar136._56_4_) |
                 (uint)!bVar3 * auVar137._56_4_;
            bVar3 = SUB81(uVar111 >> 0xf,0);
            auVar170._60_4_ =
                 (uint)bVar3 * ((uint)bVar20 * auVar138._60_4_ | (uint)!bVar20 * auVar136._60_4_) |
                 (uint)!bVar3 * auVar137._60_4_;
            auVar137 = vblendmps_avx512f(auVar166,auVar170);
            bVar3 = (bool)((byte)uVar36 & 1);
            bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar36 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar36 >> 6) & 1);
            bVar10 = (bool)((byte)(uVar36 >> 7) & 1);
            bVar11 = (bool)((byte)(uVar36 >> 8) & 1);
            bVar12 = (bool)((byte)(uVar36 >> 9) & 1);
            bVar13 = (bool)((byte)(uVar36 >> 10) & 1);
            bVar14 = (bool)((byte)(uVar36 >> 0xb) & 1);
            bVar15 = (bool)((byte)(uVar36 >> 0xc) & 1);
            bVar16 = (bool)((byte)(uVar36 >> 0xd) & 1);
            bVar17 = (bool)((byte)(uVar36 >> 0xe) & 1);
            bVar18 = SUB81(uVar36 >> 0xf,0);
            *puVar114 = (uint)bVar3 * auVar137._0_4_ | !bVar3 * auVar170._0_4_;
            puVar114[1] = (uint)bVar4 * auVar137._4_4_ | !bVar4 * auVar170._4_4_;
            puVar114[2] = (uint)bVar5 * auVar137._8_4_ | !bVar5 * auVar170._8_4_;
            puVar114[3] = (uint)bVar6 * auVar137._12_4_ | !bVar6 * auVar170._12_4_;
            puVar114[4] = (uint)bVar7 * auVar137._16_4_ | !bVar7 * auVar170._16_4_;
            puVar114[5] = (uint)bVar8 * auVar137._20_4_ | !bVar8 * auVar170._20_4_;
            puVar114[6] = (uint)bVar9 * auVar137._24_4_ | !bVar9 * auVar170._24_4_;
            puVar114[7] = (uint)bVar10 * auVar137._28_4_ | !bVar10 * auVar170._28_4_;
            puVar114[8] = (uint)bVar11 * auVar137._32_4_ | !bVar11 * auVar170._32_4_;
            puVar114[9] = (uint)bVar12 * auVar137._36_4_ | !bVar12 * auVar170._36_4_;
            puVar114[10] = (uint)bVar13 * auVar137._40_4_ | !bVar13 * auVar170._40_4_;
            puVar114[0xb] = (uint)bVar14 * auVar137._44_4_ | !bVar14 * auVar170._44_4_;
            puVar114[0xc] = (uint)bVar15 * auVar137._48_4_ | !bVar15 * auVar170._48_4_;
            puVar114[0xd] = (uint)bVar16 * auVar137._52_4_ | !bVar16 * auVar170._52_4_;
            puVar114[0xe] = (uint)bVar17 * auVar137._56_4_ | !bVar17 * auVar170._56_4_;
            puVar114[0xf] = (uint)bVar18 * auVar137._60_4_ | !bVar18 * auVar170._60_4_;
            pauVar112 = pauVar112 + 1;
            puVar114 = puVar114 + 0x10;
            iVar99 = iVar99 + 0x10;
            auVar136 = auVar167;
          } while (iVar99 < iVar121);
          uVar102 = (uint)local_200;
        }
        uVar108 = uVar102 | 7;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)*pauVar112;
          uVar208 = *(undefined8 *)(*pauVar112 + 8);
          uVar211 = *(undefined8 *)(*pauVar112 + 0x10);
          uVar212 = *(undefined8 *)(*pauVar112 + 0x18);
          local_100 = *(undefined1 (*) [32])*pauVar112;
          BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                    ((binary_op_atan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180);
          *(undefined8 *)puVar114 = uVar209;
          *(undefined8 *)(puVar114 + 2) = uVar208;
          *(undefined8 *)(puVar114 + 4) = uVar211;
          *(undefined8 *)(puVar114 + 6) = uVar212;
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
          puVar114 = puVar114 + 8;
          uVar108 = uVar102 + 0xf;
          uVar102 = uVar102 + 8;
        }
        uVar108 = uVar102 | 3;
        local_238 = pvVar120;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)(*pauVar112 + 8);
          local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
          afVar333 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                               ((binary_op_atan2 *)local_190,(__m128 *)local_100,(__m128 *)local_a0)
          ;
          *(long *)puVar114 = afVar333._0_8_;
          *(undefined8 *)(puVar114 + 2) = uVar209;
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
          puVar114 = puVar114 + 4;
          uVar108 = uVar102 + 7;
          uVar102 = uVar102 + 4;
        }
        if (iVar121 - uVar102 != 0 && (int)uVar102 <= iVar121) {
          lVar107 = 0;
          do {
            fVar186 = atan2f(*(float *)(*pauVar112 + lVar107 * 4),local_1f0._0_4_);
            puVar114[lVar107] = (uint)fVar186;
            lVar107 = lVar107 + 1;
          } while (iVar121 - uVar102 != (int)lVar107);
        }
        pvVar120 = (void *)((long)local_238 + 1);
        auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        iVar99 = (int)local_230;
      } while (pvVar120 != local_1c8);
    }
    local_7c = (uint)local_194 ^ 2;
    if ((local_240->dims == 3 && local_7c == 0) && 0 < (int)local_1c8) {
      iVar121 = iVar99 * local_20c;
      local_1a0 = (void *)(CONCAT44(local_1a0._4_4_,iVar121) & 0xfffffffffffffff0);
      auVar91._4_4_ = local_1b0._4_4_;
      auVar91._0_4_ = (uint)local_1b0;
      auVar91._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar91,1);
      local_108 = (long)iVar100 * (long)local_208;
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_1d0 = (void *)0x0;
      auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar156 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      local_1b8 = (void *)CONCAT44(local_1b8._4_4_,iVar121);
      do {
        if (0 < (int)local_1f8) {
          pauVar115 = (undefined1 (*) [32])
                      (local_218->cstep * (long)local_1d0 * local_218->elemsize +
                      (long)local_218->data);
          local_200 = (void *)(local_108 * (long)local_1d0 + (long)local_250);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_1d0 * local_240->elemsize +
                      (long)local_240->data);
          pvVar120 = (void *)0x0;
          do {
            uVar102 = *(uint *)((long)local_200 + (long)pvVar120 * 4);
            if (iVar99 == 4) {
              auVar194 = *(undefined1 (*) [16])((long)local_200 + (long)pvVar120 * 0x10);
            }
            else {
              auVar194._4_4_ = uVar102;
              auVar194._0_4_ = uVar102;
              auVar194._8_4_ = uVar102;
              auVar194._12_4_ = uVar102;
            }
            local_a0[0] = (float)auVar194._0_4_;
            local_a0[1] = (float)auVar194._4_4_;
            local_a0[2] = (float)auVar194._8_4_;
            local_a0[3] = (float)auVar194._12_4_;
            if (iVar99 == 8) {
              auVar204 = *(undefined1 (*) [32])((long)local_200 + (long)pvVar120 * 0x20);
            }
            else {
              auVar204._16_16_ = auVar194;
              auVar204._0_16_ = auVar194;
            }
            local_180._0_32_ = auVar204;
            if (iVar99 == 0x10) {
              auVar137 = *(undefined1 (*) [64])((long)local_200 + (long)pvVar120 * 0x40);
            }
            else {
              auVar137 = vinsertf64x4_avx512f(ZEXT3264(auVar204),auVar204,1);
            }
            local_1f0 = ZEXT416(uVar102);
            uVar103 = 0;
            if (0xf < iVar121) {
              auVar136 = vrcp14ps_avx512f(auVar137);
              auVar144 = vfmsub213ps_avx512f(auVar136,auVar137,auVar123);
              auVar138 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
              auVar138 = vpternlogd_avx512f(auVar138,auVar137,auVar124,0xf8);
              uVar103 = vcmpps_avx512f(auVar138,auVar156,1);
              auVar138 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
              auVar171._4_4_ = (uint)((byte)(uVar103 >> 1) & 1) * auVar138._4_4_;
              auVar171._0_4_ = (uint)((byte)uVar103 & 1) * auVar138._0_4_;
              auVar171._8_4_ = (uint)((byte)(uVar103 >> 2) & 1) * auVar138._8_4_;
              auVar171._12_4_ = (uint)((byte)(uVar103 >> 3) & 1) * auVar138._12_4_;
              auVar171._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_;
              auVar171._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_;
              auVar171._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_;
              auVar171._28_4_ = (uint)((byte)(uVar103 >> 7) & 1) * auVar138._28_4_;
              auVar171._32_4_ = (uint)((byte)(uVar103 >> 8) & 1) * auVar138._32_4_;
              auVar171._36_4_ = (uint)((byte)(uVar103 >> 9) & 1) * auVar138._36_4_;
              auVar171._40_4_ = (uint)((byte)(uVar103 >> 10) & 1) * auVar138._40_4_;
              auVar171._44_4_ = (uint)((byte)(uVar103 >> 0xb) & 1) * auVar138._44_4_;
              auVar171._48_4_ = (uint)((byte)(uVar103 >> 0xc) & 1) * auVar138._48_4_;
              auVar171._52_4_ = (uint)((byte)(uVar103 >> 0xd) & 1) * auVar138._52_4_;
              auVar171._56_4_ = (uint)((byte)(uVar103 >> 0xe) & 1) * auVar138._56_4_;
              auVar171._60_4_ = (uint)(byte)(uVar103 >> 0xf) * auVar138._60_4_;
              auVar144 = vfnmadd132ps_avx512vl(auVar144,auVar136,auVar136);
              iVar99 = 0xf;
              uVar103 = vcmpps_avx512f(auVar137,auVar156,1);
              uVar111 = vcmpps_avx512f(auVar137,auVar156,4);
              do {
                auVar137 = *pauVar112;
                uVar119 = vcmpps_avx512f(auVar137,auVar156,1);
                auVar47._8_4_ = 0xc0490fdb;
                auVar47._0_8_ = 0xc0490fdbc0490fdb;
                auVar47._12_4_ = 0xc0490fdb;
                auVar47._16_4_ = 0xc0490fdb;
                auVar47._20_4_ = 0xc0490fdb;
                auVar47._24_4_ = 0xc0490fdb;
                auVar47._28_4_ = 0xc0490fdb;
                auVar47._32_4_ = 0xc0490fdb;
                auVar47._36_4_ = 0xc0490fdb;
                auVar47._40_4_ = 0xc0490fdb;
                auVar47._44_4_ = 0xc0490fdb;
                auVar47._48_4_ = 0xc0490fdb;
                auVar47._52_4_ = 0xc0490fdb;
                auVar47._56_4_ = 0xc0490fdb;
                auVar47._60_4_ = 0xc0490fdb;
                auVar138 = vblendmps_avx512f(auVar125,auVar47);
                bVar3 = (bool)((byte)uVar119 & 1);
                auVar172._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_;
                bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
                auVar172._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar136._4_4_;
                bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
                auVar172._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar136._8_4_;
                bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
                auVar172._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar136._12_4_;
                bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
                auVar172._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar136._16_4_;
                bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
                auVar172._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar136._20_4_;
                bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
                auVar172._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar136._24_4_;
                bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
                auVar172._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar136._28_4_;
                bVar3 = (bool)((byte)(uVar119 >> 8) & 1);
                auVar172._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar136._32_4_;
                bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
                auVar172._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar136._36_4_;
                bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
                auVar172._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar136._40_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
                auVar172._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar136._44_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
                auVar172._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar136._48_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
                auVar172._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar136._52_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
                auVar172._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar136._56_4_;
                bVar3 = SUB81(uVar119 >> 0xf,0);
                auVar172._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar136._60_4_;
                auVar136 = vmulps_avx512f(auVar137,auVar144);
                auVar138 = vandps_avx512dq(auVar136,auVar126);
                uVar119 = vcmpps_avx512f(auVar123,auVar138,1);
                auVar139 = vmaxps_avx512f(auVar138,auVar123);
                auVar48._8_4_ = 0xbf800000;
                auVar48._0_8_ = 0xbf800000bf800000;
                auVar48._12_4_ = 0xbf800000;
                auVar48._16_4_ = 0xbf800000;
                auVar48._20_4_ = 0xbf800000;
                auVar48._24_4_ = 0xbf800000;
                auVar48._28_4_ = 0xbf800000;
                auVar48._32_4_ = 0xbf800000;
                auVar48._36_4_ = 0xbf800000;
                auVar48._40_4_ = 0xbf800000;
                auVar48._44_4_ = 0xbf800000;
                auVar48._48_4_ = 0xbf800000;
                auVar48._52_4_ = 0xbf800000;
                auVar48._56_4_ = 0xbf800000;
                auVar48._60_4_ = 0xbf800000;
                auVar140 = vblendmps_avx512f(auVar138,auVar48);
                bVar3 = (bool)((byte)uVar119 & 1);
                auVar173._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
                auVar173._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
                auVar173._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
                auVar173._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_;
                bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
                auVar173._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_;
                bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
                auVar173._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_;
                bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
                auVar173._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_;
                bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
                auVar173._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_;
                bVar19 = (byte)(uVar119 >> 8);
                bVar3 = (bool)(bVar19 & 1);
                auVar173._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_;
                bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
                auVar173._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_;
                bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
                auVar173._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
                auVar173._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
                auVar173._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
                auVar173._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
                auVar173._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_;
                bVar3 = SUB81(uVar119 >> 0xf,0);
                auVar173._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_;
                auVar138 = vrcp14ps_avx512f(auVar139);
                auVar140 = vmulps_avx512f(auVar173,auVar138);
                auVar139 = vfmsub213ps_avx512f(auVar139,auVar140,auVar173);
                auVar138 = vfnmadd213ps_avx512f(auVar139,auVar138,auVar140);
                auVar139 = vmulps_avx512f(auVar138,auVar138);
                auVar140 = vmulps_avx512f(auVar139,auVar139);
                auVar141 = vfmadd213ps_avx512f(auVar127,auVar140,auVar128);
                auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar129);
                auVar142 = vfmadd213ps_avx512f(auVar131,auVar140,auVar132);
                auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar133);
                auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar134);
                auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar130);
                auVar140 = vfmadd213ps_avx512f(auVar142,auVar140,auVar123);
                auVar139 = vfmadd231ps_avx512f(auVar140,auVar139,auVar141);
                auVar138 = vmulps_avx512f(auVar139,auVar138);
                uVar36 = vcmpps_avx512f(auVar137,auVar156,4);
                auVar139 = vaddps_avx512f(auVar138,auVar135);
                bVar3 = (bool)((byte)uVar119 & 1);
                auVar174._0_4_ = (uint)bVar3 * auVar139._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
                auVar174._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
                auVar174._8_4_ = (uint)bVar3 * auVar139._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
                auVar174._12_4_ = (uint)bVar3 * auVar139._12_4_ | (uint)!bVar3 * auVar138._12_4_;
                bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
                auVar174._16_4_ = (uint)bVar3 * auVar139._16_4_ | (uint)!bVar3 * auVar138._16_4_;
                bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
                auVar174._20_4_ = (uint)bVar3 * auVar139._20_4_ | (uint)!bVar3 * auVar138._20_4_;
                bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
                auVar174._24_4_ = (uint)bVar3 * auVar139._24_4_ | (uint)!bVar3 * auVar138._24_4_;
                bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
                auVar174._28_4_ = (uint)bVar3 * auVar139._28_4_ | (uint)!bVar3 * auVar138._28_4_;
                bVar3 = (bool)(bVar19 & 1);
                auVar174._32_4_ = (uint)bVar3 * auVar139._32_4_ | (uint)!bVar3 * auVar138._32_4_;
                bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
                auVar174._36_4_ = (uint)bVar3 * auVar139._36_4_ | (uint)!bVar3 * auVar138._36_4_;
                bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
                auVar174._40_4_ = (uint)bVar3 * auVar139._40_4_ | (uint)!bVar3 * auVar138._40_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
                auVar174._44_4_ = (uint)bVar3 * auVar139._44_4_ | (uint)!bVar3 * auVar138._44_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
                auVar174._48_4_ = (uint)bVar3 * auVar139._48_4_ | (uint)!bVar3 * auVar138._48_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
                auVar174._52_4_ = (uint)bVar3 * auVar139._52_4_ | (uint)!bVar3 * auVar138._52_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
                auVar174._56_4_ = (uint)bVar3 * auVar139._56_4_ | (uint)!bVar3 * auVar138._56_4_;
                bVar3 = SUB81(uVar119 >> 0xf,0);
                auVar174._60_4_ = (uint)bVar3 * auVar139._60_4_ | (uint)!bVar3 * auVar138._60_4_;
                auVar136 = vpternlogd_avx512f(auVar174,auVar136,auVar124,0xf8);
                auVar138 = vaddps_avx512f(auVar136,auVar172);
                bVar3 = (bool)((byte)uVar103 & 1);
                bVar5 = (bool)((byte)(uVar103 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar103 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar103 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar103 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar103 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar103 >> 6) & 1);
                bVar11 = (bool)((byte)(uVar103 >> 7) & 1);
                bVar12 = (bool)((byte)(uVar103 >> 8) & 1);
                bVar13 = (bool)((byte)(uVar103 >> 9) & 1);
                bVar14 = (bool)((byte)(uVar103 >> 10) & 1);
                bVar15 = (bool)((byte)(uVar103 >> 0xb) & 1);
                bVar16 = (bool)((byte)(uVar103 >> 0xc) & 1);
                bVar17 = (bool)((byte)(uVar103 >> 0xd) & 1);
                bVar18 = (bool)((byte)(uVar103 >> 0xe) & 1);
                bVar20 = SUB81(uVar103 >> 0xf,0);
                auVar137 = vpternlogd_avx512f(auVar137,auVar124,auVar332,0xea);
                bVar4 = (bool)((byte)uVar111 & 1);
                auVar175._0_4_ =
                     (uint)bVar4 * ((uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_) |
                     (uint)!bVar4 * auVar137._0_4_;
                bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
                auVar175._4_4_ =
                     (uint)bVar3 * ((uint)bVar5 * auVar138._4_4_ | (uint)!bVar5 * auVar136._4_4_) |
                     (uint)!bVar3 * auVar137._4_4_;
                bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
                auVar175._8_4_ =
                     (uint)bVar3 * ((uint)bVar6 * auVar138._8_4_ | (uint)!bVar6 * auVar136._8_4_) |
                     (uint)!bVar3 * auVar137._8_4_;
                bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
                auVar175._12_4_ =
                     (uint)bVar3 * ((uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * auVar136._12_4_)
                     | (uint)!bVar3 * auVar137._12_4_;
                bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
                auVar175._16_4_ =
                     (uint)bVar3 * ((uint)bVar8 * auVar138._16_4_ | (uint)!bVar8 * auVar136._16_4_)
                     | (uint)!bVar3 * auVar137._16_4_;
                bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
                auVar175._20_4_ =
                     (uint)bVar3 * ((uint)bVar9 * auVar138._20_4_ | (uint)!bVar9 * auVar136._20_4_)
                     | (uint)!bVar3 * auVar137._20_4_;
                bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
                auVar175._24_4_ =
                     (uint)bVar3 *
                     ((uint)bVar10 * auVar138._24_4_ | (uint)!bVar10 * auVar136._24_4_) |
                     (uint)!bVar3 * auVar137._24_4_;
                bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
                auVar175._28_4_ =
                     (uint)bVar3 *
                     ((uint)bVar11 * auVar138._28_4_ | (uint)!bVar11 * auVar136._28_4_) |
                     (uint)!bVar3 * auVar137._28_4_;
                bVar3 = (bool)((byte)(uVar111 >> 8) & 1);
                auVar175._32_4_ =
                     (uint)bVar3 *
                     ((uint)bVar12 * auVar138._32_4_ | (uint)!bVar12 * auVar136._32_4_) |
                     (uint)!bVar3 * auVar137._32_4_;
                bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
                auVar175._36_4_ =
                     (uint)bVar3 *
                     ((uint)bVar13 * auVar138._36_4_ | (uint)!bVar13 * auVar136._36_4_) |
                     (uint)!bVar3 * auVar137._36_4_;
                bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
                auVar175._40_4_ =
                     (uint)bVar3 *
                     ((uint)bVar14 * auVar138._40_4_ | (uint)!bVar14 * auVar136._40_4_) |
                     (uint)!bVar3 * auVar137._40_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
                auVar175._44_4_ =
                     (uint)bVar3 *
                     ((uint)bVar15 * auVar138._44_4_ | (uint)!bVar15 * auVar136._44_4_) |
                     (uint)!bVar3 * auVar137._44_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
                auVar175._48_4_ =
                     (uint)bVar3 *
                     ((uint)bVar16 * auVar138._48_4_ | (uint)!bVar16 * auVar136._48_4_) |
                     (uint)!bVar3 * auVar137._48_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
                auVar175._52_4_ =
                     (uint)bVar3 *
                     ((uint)bVar17 * auVar138._52_4_ | (uint)!bVar17 * auVar136._52_4_) |
                     (uint)!bVar3 * auVar137._52_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
                auVar175._56_4_ =
                     (uint)bVar3 *
                     ((uint)bVar18 * auVar138._56_4_ | (uint)!bVar18 * auVar136._56_4_) |
                     (uint)!bVar3 * auVar137._56_4_;
                bVar3 = SUB81(uVar111 >> 0xf,0);
                auVar175._60_4_ =
                     (uint)bVar3 *
                     ((uint)bVar20 * auVar138._60_4_ | (uint)!bVar20 * auVar136._60_4_) |
                     (uint)!bVar3 * auVar137._60_4_;
                auVar137 = vblendmps_avx512f(auVar171,auVar175);
                bVar3 = (bool)((byte)uVar36 & 1);
                bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar36 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar36 >> 6) & 1);
                bVar10 = (bool)((byte)(uVar36 >> 7) & 1);
                bVar11 = (bool)((byte)(uVar36 >> 8) & 1);
                bVar12 = (bool)((byte)(uVar36 >> 9) & 1);
                bVar13 = (bool)((byte)(uVar36 >> 10) & 1);
                bVar14 = (bool)((byte)(uVar36 >> 0xb) & 1);
                bVar15 = (bool)((byte)(uVar36 >> 0xc) & 1);
                bVar16 = (bool)((byte)(uVar36 >> 0xd) & 1);
                bVar17 = (bool)((byte)(uVar36 >> 0xe) & 1);
                bVar18 = SUB81(uVar36 >> 0xf,0);
                *(uint *)*pauVar115 = (uint)bVar3 * auVar137._0_4_ | !bVar3 * auVar175._0_4_;
                *(uint *)((long)*pauVar115 + 4) =
                     (uint)bVar4 * auVar137._4_4_ | !bVar4 * auVar175._4_4_;
                *(uint *)((long)*pauVar115 + 8) =
                     (uint)bVar5 * auVar137._8_4_ | !bVar5 * auVar175._8_4_;
                *(uint *)((long)*pauVar115 + 0xc) =
                     (uint)bVar6 * auVar137._12_4_ | !bVar6 * auVar175._12_4_;
                *(uint *)((long)*pauVar115 + 0x10) =
                     (uint)bVar7 * auVar137._16_4_ | !bVar7 * auVar175._16_4_;
                *(uint *)((long)*pauVar115 + 0x14) =
                     (uint)bVar8 * auVar137._20_4_ | !bVar8 * auVar175._20_4_;
                *(uint *)((long)*pauVar115 + 0x18) =
                     (uint)bVar9 * auVar137._24_4_ | !bVar9 * auVar175._24_4_;
                *(uint *)((long)*pauVar115 + 0x1c) =
                     (uint)bVar10 * auVar137._28_4_ | !bVar10 * auVar175._28_4_;
                *(uint *)pauVar115[1] = (uint)bVar11 * auVar137._32_4_ | !bVar11 * auVar175._32_4_;
                *(uint *)(pauVar115[1] + 4) =
                     (uint)bVar12 * auVar137._36_4_ | !bVar12 * auVar175._36_4_;
                *(uint *)(pauVar115[1] + 8) =
                     (uint)bVar13 * auVar137._40_4_ | !bVar13 * auVar175._40_4_;
                *(uint *)(pauVar115[1] + 0xc) =
                     (uint)bVar14 * auVar137._44_4_ | !bVar14 * auVar175._44_4_;
                *(uint *)(pauVar115[1] + 0x10) =
                     (uint)bVar15 * auVar137._48_4_ | !bVar15 * auVar175._48_4_;
                *(uint *)(pauVar115[1] + 0x14) =
                     (uint)bVar16 * auVar137._52_4_ | !bVar16 * auVar175._52_4_;
                *(uint *)(pauVar115[1] + 0x18) =
                     (uint)bVar17 * auVar137._56_4_ | !bVar17 * auVar175._56_4_;
                *(uint *)(pauVar115[1] + 0x1c) =
                     (uint)bVar18 * auVar137._60_4_ | !bVar18 * auVar175._60_4_;
                pauVar112 = pauVar112 + 1;
                pauVar115 = pauVar115 + 2;
                iVar99 = iVar99 + 0x10;
                auVar136 = auVar172;
              } while (iVar99 < iVar121);
              uVar103 = (ulong)local_1a0 & 0xffffffff;
            }
            uVar102 = (uint)uVar103 | 7;
            local_238 = pvVar120;
            while (uVar108 = (uint)uVar103, (int)uVar102 < iVar121) {
              auVar197 = *(undefined1 (*) [32])*pauVar112;
              local_100._0_4_ = auVar197._0_4_;
              local_100._4_4_ = auVar197._4_4_;
              local_100._8_4_ = auVar197._8_4_;
              local_100._12_4_ = auVar197._12_4_;
              local_100._16_4_ = auVar197._16_4_;
              local_100._20_4_ = auVar197._20_4_;
              local_100._24_4_ = auVar197._24_4_;
              local_100._28_4_ = auVar197._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                        ((binary_op_atan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180);
              *pauVar115 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar115 = pauVar115 + 1;
              uVar103 = (ulong)(uVar108 + 8);
              uVar102 = uVar108 + 0xf;
            }
            uVar102 = uVar108 | 3;
            while ((int)uVar102 < iVar121) {
              local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
              auVar210 = ZEXT856(*(ulong *)(*pauVar112 + 8));
              afVar333 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                   ((binary_op_atan2 *)local_190,(__m128 *)local_100,
                                    (__m128 *)local_a0);
              auVar125._0_8_ = afVar333._0_8_;
              auVar125._8_56_ = auVar210;
              *(undefined1 (*) [16])*pauVar115 = auVar125._0_16_;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar115 = (undefined1 (*) [32])((long)*pauVar115 + 0x10);
              iVar99 = (int)uVar103;
              uVar108 = iVar99 + 4;
              uVar103 = (ulong)uVar108;
              uVar102 = iVar99 + 7;
            }
            if ((int)uVar108 < iVar121) {
              lVar122 = 0;
              lVar107 = 0;
              do {
                fVar186 = atan2f(*(float *)(*pauVar112 + lVar122 * 4),(float)local_1f0._0_4_);
                *(float *)((long)*pauVar115 + lVar122 * 4) = fVar186;
                lVar107 = lVar107 + -4;
                lVar122 = lVar122 + 1;
              } while (iVar121 - uVar108 != (int)lVar122);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar107);
              pauVar115 = (undefined1 (*) [32])((long)pauVar115 - lVar107);
              iVar121 = (int)local_1b8;
            }
            pvVar120 = (void *)((long)local_238 + 1);
            auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar156 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            iVar99 = (int)local_230;
          } while (pvVar120 != local_1f8);
        }
        local_1d0 = (void *)((long)local_1d0 + 1);
      } while (local_1d0 != local_1c8);
    }
    if ((local_240->dims == 4 && local_7c == 0) && 0 < (int)local_1c8) {
      iVar121 = iVar99 * local_20c * (int)local_1f8;
      local_1a0 = (void *)(CONCAT44(local_1a0._4_4_,iVar121) & 0xfffffffffffffff0);
      auVar92._4_4_ = local_1b0._4_4_;
      auVar92._0_4_ = (uint)local_1b0;
      auVar92._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar92,1);
      local_108 = (long)iVar100 * (long)local_208;
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_1d0 = (void *)0x0;
      auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar156 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      local_1b8 = (void *)CONCAT44(local_1b8._4_4_,iVar121);
      do {
        if (0 < (int)local_1c0) {
          pauVar115 = (undefined1 (*) [32])
                      (local_218->cstep * (long)local_1d0 * local_218->elemsize +
                      (long)local_218->data);
          local_200 = (void *)(local_108 * (long)local_1d0 + (long)local_250);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_1d0 * local_240->elemsize +
                      (long)local_240->data);
          pvVar120 = (void *)0x0;
          do {
            uVar102 = *(uint *)((long)local_200 + (long)pvVar120 * 4);
            if (iVar99 == 4) {
              auVar195 = *(undefined1 (*) [16])((long)local_200 + (long)pvVar120 * 0x10);
            }
            else {
              auVar195._4_4_ = uVar102;
              auVar195._0_4_ = uVar102;
              auVar195._8_4_ = uVar102;
              auVar195._12_4_ = uVar102;
            }
            local_a0[0] = (float)auVar195._0_4_;
            local_a0[1] = (float)auVar195._4_4_;
            local_a0[2] = (float)auVar195._8_4_;
            local_a0[3] = (float)auVar195._12_4_;
            if (iVar99 == 8) {
              auVar205 = *(undefined1 (*) [32])((long)local_200 + (long)pvVar120 * 0x20);
            }
            else {
              auVar205._16_16_ = auVar195;
              auVar205._0_16_ = auVar195;
            }
            local_180._0_32_ = auVar205;
            if (iVar99 == 0x10) {
              auVar137 = *(undefined1 (*) [64])((long)local_200 + (long)pvVar120 * 0x40);
            }
            else {
              auVar137 = vinsertf64x4_avx512f(ZEXT3264(auVar205),auVar205,1);
            }
            local_1f0 = ZEXT416(uVar102);
            uVar103 = 0;
            if (0xf < iVar121) {
              auVar136 = vrcp14ps_avx512f(auVar137);
              auVar144 = vfmsub213ps_avx512f(auVar136,auVar137,auVar123);
              auVar138 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
              auVar138 = vpternlogd_avx512f(auVar138,auVar137,auVar124,0xf8);
              uVar103 = vcmpps_avx512f(auVar138,auVar156,1);
              auVar138 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
              auVar176._4_4_ = (uint)((byte)(uVar103 >> 1) & 1) * auVar138._4_4_;
              auVar176._0_4_ = (uint)((byte)uVar103 & 1) * auVar138._0_4_;
              auVar176._8_4_ = (uint)((byte)(uVar103 >> 2) & 1) * auVar138._8_4_;
              auVar176._12_4_ = (uint)((byte)(uVar103 >> 3) & 1) * auVar138._12_4_;
              auVar176._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_;
              auVar176._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_;
              auVar176._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_;
              auVar176._28_4_ = (uint)((byte)(uVar103 >> 7) & 1) * auVar138._28_4_;
              auVar176._32_4_ = (uint)((byte)(uVar103 >> 8) & 1) * auVar138._32_4_;
              auVar176._36_4_ = (uint)((byte)(uVar103 >> 9) & 1) * auVar138._36_4_;
              auVar176._40_4_ = (uint)((byte)(uVar103 >> 10) & 1) * auVar138._40_4_;
              auVar176._44_4_ = (uint)((byte)(uVar103 >> 0xb) & 1) * auVar138._44_4_;
              auVar176._48_4_ = (uint)((byte)(uVar103 >> 0xc) & 1) * auVar138._48_4_;
              auVar176._52_4_ = (uint)((byte)(uVar103 >> 0xd) & 1) * auVar138._52_4_;
              auVar176._56_4_ = (uint)((byte)(uVar103 >> 0xe) & 1) * auVar138._56_4_;
              auVar176._60_4_ = (uint)(byte)(uVar103 >> 0xf) * auVar138._60_4_;
              auVar144 = vfnmadd132ps_avx512vl(auVar144,auVar136,auVar136);
              iVar99 = 0xf;
              uVar103 = vcmpps_avx512f(auVar137,auVar156,1);
              uVar111 = vcmpps_avx512f(auVar137,auVar156,4);
              do {
                auVar137 = *pauVar112;
                uVar119 = vcmpps_avx512f(auVar137,auVar156,1);
                auVar49._8_4_ = 0xc0490fdb;
                auVar49._0_8_ = 0xc0490fdbc0490fdb;
                auVar49._12_4_ = 0xc0490fdb;
                auVar49._16_4_ = 0xc0490fdb;
                auVar49._20_4_ = 0xc0490fdb;
                auVar49._24_4_ = 0xc0490fdb;
                auVar49._28_4_ = 0xc0490fdb;
                auVar49._32_4_ = 0xc0490fdb;
                auVar49._36_4_ = 0xc0490fdb;
                auVar49._40_4_ = 0xc0490fdb;
                auVar49._44_4_ = 0xc0490fdb;
                auVar49._48_4_ = 0xc0490fdb;
                auVar49._52_4_ = 0xc0490fdb;
                auVar49._56_4_ = 0xc0490fdb;
                auVar49._60_4_ = 0xc0490fdb;
                auVar138 = vblendmps_avx512f(auVar125,auVar49);
                bVar3 = (bool)((byte)uVar119 & 1);
                auVar177._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_;
                bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
                auVar177._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar136._4_4_;
                bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
                auVar177._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar136._8_4_;
                bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
                auVar177._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar136._12_4_;
                bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
                auVar177._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar136._16_4_;
                bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
                auVar177._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar136._20_4_;
                bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
                auVar177._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar136._24_4_;
                bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
                auVar177._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar136._28_4_;
                bVar3 = (bool)((byte)(uVar119 >> 8) & 1);
                auVar177._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar136._32_4_;
                bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
                auVar177._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar136._36_4_;
                bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
                auVar177._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar136._40_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
                auVar177._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar136._44_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
                auVar177._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar136._48_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
                auVar177._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar136._52_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
                auVar177._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar136._56_4_;
                bVar3 = SUB81(uVar119 >> 0xf,0);
                auVar177._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar136._60_4_;
                auVar136 = vmulps_avx512f(auVar137,auVar144);
                auVar138 = vandps_avx512dq(auVar136,auVar126);
                uVar119 = vcmpps_avx512f(auVar123,auVar138,1);
                auVar139 = vmaxps_avx512f(auVar138,auVar123);
                auVar50._8_4_ = 0xbf800000;
                auVar50._0_8_ = 0xbf800000bf800000;
                auVar50._12_4_ = 0xbf800000;
                auVar50._16_4_ = 0xbf800000;
                auVar50._20_4_ = 0xbf800000;
                auVar50._24_4_ = 0xbf800000;
                auVar50._28_4_ = 0xbf800000;
                auVar50._32_4_ = 0xbf800000;
                auVar50._36_4_ = 0xbf800000;
                auVar50._40_4_ = 0xbf800000;
                auVar50._44_4_ = 0xbf800000;
                auVar50._48_4_ = 0xbf800000;
                auVar50._52_4_ = 0xbf800000;
                auVar50._56_4_ = 0xbf800000;
                auVar50._60_4_ = 0xbf800000;
                auVar140 = vblendmps_avx512f(auVar138,auVar50);
                bVar3 = (bool)((byte)uVar119 & 1);
                auVar178._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
                auVar178._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
                auVar178._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
                auVar178._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_;
                bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
                auVar178._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_;
                bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
                auVar178._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_;
                bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
                auVar178._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_;
                bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
                auVar178._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_;
                bVar19 = (byte)(uVar119 >> 8);
                bVar3 = (bool)(bVar19 & 1);
                auVar178._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_;
                bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
                auVar178._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_;
                bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
                auVar178._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
                auVar178._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
                auVar178._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
                auVar178._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
                auVar178._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_;
                bVar3 = SUB81(uVar119 >> 0xf,0);
                auVar178._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_;
                auVar138 = vrcp14ps_avx512f(auVar139);
                auVar140 = vmulps_avx512f(auVar178,auVar138);
                auVar139 = vfmsub213ps_avx512f(auVar139,auVar140,auVar178);
                auVar138 = vfnmadd213ps_avx512f(auVar139,auVar138,auVar140);
                auVar139 = vmulps_avx512f(auVar138,auVar138);
                auVar140 = vmulps_avx512f(auVar139,auVar139);
                auVar141 = vfmadd213ps_avx512f(auVar127,auVar140,auVar128);
                auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar129);
                auVar142 = vfmadd213ps_avx512f(auVar131,auVar140,auVar132);
                auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar133);
                auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar134);
                auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar130);
                auVar140 = vfmadd213ps_avx512f(auVar142,auVar140,auVar123);
                auVar139 = vfmadd231ps_avx512f(auVar140,auVar139,auVar141);
                auVar138 = vmulps_avx512f(auVar139,auVar138);
                uVar36 = vcmpps_avx512f(auVar137,auVar156,4);
                auVar139 = vaddps_avx512f(auVar138,auVar135);
                bVar3 = (bool)((byte)uVar119 & 1);
                auVar179._0_4_ = (uint)bVar3 * auVar139._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
                auVar179._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
                auVar179._8_4_ = (uint)bVar3 * auVar139._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
                auVar179._12_4_ = (uint)bVar3 * auVar139._12_4_ | (uint)!bVar3 * auVar138._12_4_;
                bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
                auVar179._16_4_ = (uint)bVar3 * auVar139._16_4_ | (uint)!bVar3 * auVar138._16_4_;
                bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
                auVar179._20_4_ = (uint)bVar3 * auVar139._20_4_ | (uint)!bVar3 * auVar138._20_4_;
                bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
                auVar179._24_4_ = (uint)bVar3 * auVar139._24_4_ | (uint)!bVar3 * auVar138._24_4_;
                bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
                auVar179._28_4_ = (uint)bVar3 * auVar139._28_4_ | (uint)!bVar3 * auVar138._28_4_;
                bVar3 = (bool)(bVar19 & 1);
                auVar179._32_4_ = (uint)bVar3 * auVar139._32_4_ | (uint)!bVar3 * auVar138._32_4_;
                bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
                auVar179._36_4_ = (uint)bVar3 * auVar139._36_4_ | (uint)!bVar3 * auVar138._36_4_;
                bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
                auVar179._40_4_ = (uint)bVar3 * auVar139._40_4_ | (uint)!bVar3 * auVar138._40_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
                auVar179._44_4_ = (uint)bVar3 * auVar139._44_4_ | (uint)!bVar3 * auVar138._44_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
                auVar179._48_4_ = (uint)bVar3 * auVar139._48_4_ | (uint)!bVar3 * auVar138._48_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
                auVar179._52_4_ = (uint)bVar3 * auVar139._52_4_ | (uint)!bVar3 * auVar138._52_4_;
                bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
                auVar179._56_4_ = (uint)bVar3 * auVar139._56_4_ | (uint)!bVar3 * auVar138._56_4_;
                bVar3 = SUB81(uVar119 >> 0xf,0);
                auVar179._60_4_ = (uint)bVar3 * auVar139._60_4_ | (uint)!bVar3 * auVar138._60_4_;
                auVar136 = vpternlogd_avx512f(auVar179,auVar136,auVar124,0xf8);
                auVar138 = vaddps_avx512f(auVar136,auVar177);
                bVar3 = (bool)((byte)uVar103 & 1);
                bVar5 = (bool)((byte)(uVar103 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar103 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar103 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar103 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar103 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar103 >> 6) & 1);
                bVar11 = (bool)((byte)(uVar103 >> 7) & 1);
                bVar12 = (bool)((byte)(uVar103 >> 8) & 1);
                bVar13 = (bool)((byte)(uVar103 >> 9) & 1);
                bVar14 = (bool)((byte)(uVar103 >> 10) & 1);
                bVar15 = (bool)((byte)(uVar103 >> 0xb) & 1);
                bVar16 = (bool)((byte)(uVar103 >> 0xc) & 1);
                bVar17 = (bool)((byte)(uVar103 >> 0xd) & 1);
                bVar18 = (bool)((byte)(uVar103 >> 0xe) & 1);
                bVar20 = SUB81(uVar103 >> 0xf,0);
                auVar137 = vpternlogd_avx512f(auVar137,auVar124,auVar332,0xea);
                bVar4 = (bool)((byte)uVar111 & 1);
                auVar180._0_4_ =
                     (uint)bVar4 * ((uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_) |
                     (uint)!bVar4 * auVar137._0_4_;
                bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
                auVar180._4_4_ =
                     (uint)bVar3 * ((uint)bVar5 * auVar138._4_4_ | (uint)!bVar5 * auVar136._4_4_) |
                     (uint)!bVar3 * auVar137._4_4_;
                bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
                auVar180._8_4_ =
                     (uint)bVar3 * ((uint)bVar6 * auVar138._8_4_ | (uint)!bVar6 * auVar136._8_4_) |
                     (uint)!bVar3 * auVar137._8_4_;
                bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
                auVar180._12_4_ =
                     (uint)bVar3 * ((uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * auVar136._12_4_)
                     | (uint)!bVar3 * auVar137._12_4_;
                bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
                auVar180._16_4_ =
                     (uint)bVar3 * ((uint)bVar8 * auVar138._16_4_ | (uint)!bVar8 * auVar136._16_4_)
                     | (uint)!bVar3 * auVar137._16_4_;
                bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
                auVar180._20_4_ =
                     (uint)bVar3 * ((uint)bVar9 * auVar138._20_4_ | (uint)!bVar9 * auVar136._20_4_)
                     | (uint)!bVar3 * auVar137._20_4_;
                bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
                auVar180._24_4_ =
                     (uint)bVar3 *
                     ((uint)bVar10 * auVar138._24_4_ | (uint)!bVar10 * auVar136._24_4_) |
                     (uint)!bVar3 * auVar137._24_4_;
                bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
                auVar180._28_4_ =
                     (uint)bVar3 *
                     ((uint)bVar11 * auVar138._28_4_ | (uint)!bVar11 * auVar136._28_4_) |
                     (uint)!bVar3 * auVar137._28_4_;
                bVar3 = (bool)((byte)(uVar111 >> 8) & 1);
                auVar180._32_4_ =
                     (uint)bVar3 *
                     ((uint)bVar12 * auVar138._32_4_ | (uint)!bVar12 * auVar136._32_4_) |
                     (uint)!bVar3 * auVar137._32_4_;
                bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
                auVar180._36_4_ =
                     (uint)bVar3 *
                     ((uint)bVar13 * auVar138._36_4_ | (uint)!bVar13 * auVar136._36_4_) |
                     (uint)!bVar3 * auVar137._36_4_;
                bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
                auVar180._40_4_ =
                     (uint)bVar3 *
                     ((uint)bVar14 * auVar138._40_4_ | (uint)!bVar14 * auVar136._40_4_) |
                     (uint)!bVar3 * auVar137._40_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
                auVar180._44_4_ =
                     (uint)bVar3 *
                     ((uint)bVar15 * auVar138._44_4_ | (uint)!bVar15 * auVar136._44_4_) |
                     (uint)!bVar3 * auVar137._44_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
                auVar180._48_4_ =
                     (uint)bVar3 *
                     ((uint)bVar16 * auVar138._48_4_ | (uint)!bVar16 * auVar136._48_4_) |
                     (uint)!bVar3 * auVar137._48_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
                auVar180._52_4_ =
                     (uint)bVar3 *
                     ((uint)bVar17 * auVar138._52_4_ | (uint)!bVar17 * auVar136._52_4_) |
                     (uint)!bVar3 * auVar137._52_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
                auVar180._56_4_ =
                     (uint)bVar3 *
                     ((uint)bVar18 * auVar138._56_4_ | (uint)!bVar18 * auVar136._56_4_) |
                     (uint)!bVar3 * auVar137._56_4_;
                bVar3 = SUB81(uVar111 >> 0xf,0);
                auVar180._60_4_ =
                     (uint)bVar3 *
                     ((uint)bVar20 * auVar138._60_4_ | (uint)!bVar20 * auVar136._60_4_) |
                     (uint)!bVar3 * auVar137._60_4_;
                auVar137 = vblendmps_avx512f(auVar176,auVar180);
                bVar3 = (bool)((byte)uVar36 & 1);
                bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar36 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar36 >> 6) & 1);
                bVar10 = (bool)((byte)(uVar36 >> 7) & 1);
                bVar11 = (bool)((byte)(uVar36 >> 8) & 1);
                bVar12 = (bool)((byte)(uVar36 >> 9) & 1);
                bVar13 = (bool)((byte)(uVar36 >> 10) & 1);
                bVar14 = (bool)((byte)(uVar36 >> 0xb) & 1);
                bVar15 = (bool)((byte)(uVar36 >> 0xc) & 1);
                bVar16 = (bool)((byte)(uVar36 >> 0xd) & 1);
                bVar17 = (bool)((byte)(uVar36 >> 0xe) & 1);
                bVar18 = SUB81(uVar36 >> 0xf,0);
                *(uint *)*pauVar115 = (uint)bVar3 * auVar137._0_4_ | !bVar3 * auVar180._0_4_;
                *(uint *)((long)*pauVar115 + 4) =
                     (uint)bVar4 * auVar137._4_4_ | !bVar4 * auVar180._4_4_;
                *(uint *)((long)*pauVar115 + 8) =
                     (uint)bVar5 * auVar137._8_4_ | !bVar5 * auVar180._8_4_;
                *(uint *)((long)*pauVar115 + 0xc) =
                     (uint)bVar6 * auVar137._12_4_ | !bVar6 * auVar180._12_4_;
                *(uint *)((long)*pauVar115 + 0x10) =
                     (uint)bVar7 * auVar137._16_4_ | !bVar7 * auVar180._16_4_;
                *(uint *)((long)*pauVar115 + 0x14) =
                     (uint)bVar8 * auVar137._20_4_ | !bVar8 * auVar180._20_4_;
                *(uint *)((long)*pauVar115 + 0x18) =
                     (uint)bVar9 * auVar137._24_4_ | !bVar9 * auVar180._24_4_;
                *(uint *)((long)*pauVar115 + 0x1c) =
                     (uint)bVar10 * auVar137._28_4_ | !bVar10 * auVar180._28_4_;
                *(uint *)pauVar115[1] = (uint)bVar11 * auVar137._32_4_ | !bVar11 * auVar180._32_4_;
                *(uint *)(pauVar115[1] + 4) =
                     (uint)bVar12 * auVar137._36_4_ | !bVar12 * auVar180._36_4_;
                *(uint *)(pauVar115[1] + 8) =
                     (uint)bVar13 * auVar137._40_4_ | !bVar13 * auVar180._40_4_;
                *(uint *)(pauVar115[1] + 0xc) =
                     (uint)bVar14 * auVar137._44_4_ | !bVar14 * auVar180._44_4_;
                *(uint *)(pauVar115[1] + 0x10) =
                     (uint)bVar15 * auVar137._48_4_ | !bVar15 * auVar180._48_4_;
                *(uint *)(pauVar115[1] + 0x14) =
                     (uint)bVar16 * auVar137._52_4_ | !bVar16 * auVar180._52_4_;
                *(uint *)(pauVar115[1] + 0x18) =
                     (uint)bVar17 * auVar137._56_4_ | !bVar17 * auVar180._56_4_;
                *(uint *)(pauVar115[1] + 0x1c) =
                     (uint)bVar18 * auVar137._60_4_ | !bVar18 * auVar180._60_4_;
                pauVar112 = pauVar112 + 1;
                pauVar115 = pauVar115 + 2;
                iVar99 = iVar99 + 0x10;
                auVar136 = auVar177;
              } while (iVar99 < iVar121);
              uVar103 = (ulong)local_1a0 & 0xffffffff;
            }
            uVar102 = (uint)uVar103 | 7;
            local_238 = pvVar120;
            while (uVar108 = (uint)uVar103, (int)uVar102 < iVar121) {
              auVar197 = *(undefined1 (*) [32])*pauVar112;
              local_100._0_4_ = auVar197._0_4_;
              local_100._4_4_ = auVar197._4_4_;
              local_100._8_4_ = auVar197._8_4_;
              local_100._12_4_ = auVar197._12_4_;
              local_100._16_4_ = auVar197._16_4_;
              local_100._20_4_ = auVar197._20_4_;
              local_100._24_4_ = auVar197._24_4_;
              local_100._28_4_ = auVar197._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                        ((binary_op_atan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180);
              *pauVar115 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar115 = pauVar115 + 1;
              uVar103 = (ulong)(uVar108 + 8);
              uVar102 = uVar108 + 0xf;
            }
            uVar102 = uVar108 | 3;
            while ((int)uVar102 < iVar121) {
              local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
              auVar210 = ZEXT856(*(ulong *)(*pauVar112 + 8));
              afVar333 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                   ((binary_op_atan2 *)local_190,(__m128 *)local_100,
                                    (__m128 *)local_a0);
              auVar126._0_8_ = afVar333._0_8_;
              auVar126._8_56_ = auVar210;
              *(undefined1 (*) [16])*pauVar115 = auVar126._0_16_;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar115 = (undefined1 (*) [32])((long)*pauVar115 + 0x10);
              iVar99 = (int)uVar103;
              uVar108 = iVar99 + 4;
              uVar103 = (ulong)uVar108;
              uVar102 = iVar99 + 7;
            }
            if ((int)uVar108 < iVar121) {
              lVar107 = 0;
              lVar122 = 0;
              do {
                fVar186 = atan2f(*(float *)(*pauVar112 + lVar122 * 4),(float)local_1f0._0_4_);
                *(float *)((long)*pauVar115 + lVar122 * 4) = fVar186;
                lVar122 = lVar122 + 1;
                lVar107 = lVar107 + -4;
              } while (iVar121 - uVar108 != (int)lVar122);
              pauVar115 = (undefined1 (*) [32])((long)pauVar115 - lVar107);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar107);
              iVar121 = (int)local_1b8;
            }
            pvVar120 = (void *)((long)local_238 + 1);
            auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar156 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            iVar99 = (int)local_230;
          } while (pvVar120 != local_1c0);
        }
        local_1d0 = (void *)((long)local_1d0 + 1);
      } while (local_1d0 != local_1c8);
    }
    if ((local_194 == 4.2039e-45 && local_240->dims == 4) && 0 < (int)local_1c8) {
      iVar121 = local_20c * iVar99;
      local_1a0 = (void *)(CONCAT44(local_1a0._4_4_,iVar121) & 0xfffffffffffffff0);
      local_1d8 = local_1d8 * (long)local_208;
      auVar93._4_4_ = local_1b0._4_4_;
      auVar93._0_4_ = (uint)local_1b0;
      auVar93._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar93,1);
      local_1d0 = (void *)((long)iVar100 * (long)local_208);
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_208 = (void *)0x0;
      auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar156 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      local_20c = iVar121;
      do {
        if (0 < (int)local_1c0) {
          pauVar115 = (undefined1 (*) [32])
                      (local_218->cstep * (long)local_208 * local_218->elemsize +
                      (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_208 * local_240->elemsize +
                      (long)local_240->data);
          local_1b0 = (void *)(local_1d8 * (long)local_208 + (long)local_250);
          local_1b8 = (void *)0x0;
          do {
            if (0 < (int)local_1f8) {
              local_200 = (void *)((long)local_1d0 * (long)local_1b8 + (long)local_1b0);
              pvVar120 = (void *)0x0;
              do {
                uVar102 = *(uint *)((long)local_200 + (long)pvVar120 * 4);
                if (iVar99 == 4) {
                  auVar196 = *(undefined1 (*) [16])((long)local_200 + (long)pvVar120 * 0x10);
                }
                else {
                  auVar196._4_4_ = uVar102;
                  auVar196._0_4_ = uVar102;
                  auVar196._8_4_ = uVar102;
                  auVar196._12_4_ = uVar102;
                }
                local_a0[0] = (float)auVar196._0_4_;
                local_a0[1] = (float)auVar196._4_4_;
                local_a0[2] = (float)auVar196._8_4_;
                local_a0[3] = (float)auVar196._12_4_;
                if (iVar99 == 8) {
                  auVar206 = *(undefined1 (*) [32])((long)local_200 + (long)pvVar120 * 0x20);
                }
                else {
                  auVar206._16_16_ = auVar196;
                  auVar206._0_16_ = auVar196;
                }
                local_180._0_32_ = auVar206;
                if (iVar99 == 0x10) {
                  auVar137 = *(undefined1 (*) [64])((long)local_200 + (long)pvVar120 * 0x40);
                }
                else {
                  auVar137 = vinsertf64x4_avx512f(ZEXT3264(auVar206),auVar206,1);
                }
                local_1f0 = ZEXT416(uVar102);
                uVar103 = 0;
                if (0xf < iVar121) {
                  auVar136 = vrcp14ps_avx512f(auVar137);
                  auVar144 = vfmsub213ps_avx512f(auVar136,auVar137,auVar123);
                  auVar138 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
                  auVar138 = vpternlogd_avx512f(auVar138,auVar137,auVar124,0xf8);
                  uVar103 = vcmpps_avx512f(auVar138,auVar156,1);
                  auVar138 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                  auVar181._4_4_ = (uint)((byte)(uVar103 >> 1) & 1) * auVar138._4_4_;
                  auVar181._0_4_ = (uint)((byte)uVar103 & 1) * auVar138._0_4_;
                  auVar181._8_4_ = (uint)((byte)(uVar103 >> 2) & 1) * auVar138._8_4_;
                  auVar181._12_4_ = (uint)((byte)(uVar103 >> 3) & 1) * auVar138._12_4_;
                  auVar181._16_4_ = (uint)((byte)(uVar103 >> 4) & 1) * auVar138._16_4_;
                  auVar181._20_4_ = (uint)((byte)(uVar103 >> 5) & 1) * auVar138._20_4_;
                  auVar181._24_4_ = (uint)((byte)(uVar103 >> 6) & 1) * auVar138._24_4_;
                  auVar181._28_4_ = (uint)((byte)(uVar103 >> 7) & 1) * auVar138._28_4_;
                  auVar181._32_4_ = (uint)((byte)(uVar103 >> 8) & 1) * auVar138._32_4_;
                  auVar181._36_4_ = (uint)((byte)(uVar103 >> 9) & 1) * auVar138._36_4_;
                  auVar181._40_4_ = (uint)((byte)(uVar103 >> 10) & 1) * auVar138._40_4_;
                  auVar181._44_4_ = (uint)((byte)(uVar103 >> 0xb) & 1) * auVar138._44_4_;
                  auVar181._48_4_ = (uint)((byte)(uVar103 >> 0xc) & 1) * auVar138._48_4_;
                  auVar181._52_4_ = (uint)((byte)(uVar103 >> 0xd) & 1) * auVar138._52_4_;
                  auVar181._56_4_ = (uint)((byte)(uVar103 >> 0xe) & 1) * auVar138._56_4_;
                  auVar181._60_4_ = (uint)(byte)(uVar103 >> 0xf) * auVar138._60_4_;
                  auVar144 = vfnmadd132ps_avx512vl(auVar144,auVar136,auVar136);
                  iVar99 = 0xf;
                  uVar103 = vcmpps_avx512f(auVar137,auVar156,1);
                  uVar111 = vcmpps_avx512f(auVar137,auVar156,4);
                  do {
                    auVar137 = *pauVar112;
                    uVar119 = vcmpps_avx512f(auVar137,auVar156,1);
                    auVar51._8_4_ = 0xc0490fdb;
                    auVar51._0_8_ = 0xc0490fdbc0490fdb;
                    auVar51._12_4_ = 0xc0490fdb;
                    auVar51._16_4_ = 0xc0490fdb;
                    auVar51._20_4_ = 0xc0490fdb;
                    auVar51._24_4_ = 0xc0490fdb;
                    auVar51._28_4_ = 0xc0490fdb;
                    auVar51._32_4_ = 0xc0490fdb;
                    auVar51._36_4_ = 0xc0490fdb;
                    auVar51._40_4_ = 0xc0490fdb;
                    auVar51._44_4_ = 0xc0490fdb;
                    auVar51._48_4_ = 0xc0490fdb;
                    auVar51._52_4_ = 0xc0490fdb;
                    auVar51._56_4_ = 0xc0490fdb;
                    auVar51._60_4_ = 0xc0490fdb;
                    auVar138 = vblendmps_avx512f(auVar125,auVar51);
                    bVar3 = (bool)((byte)uVar119 & 1);
                    auVar182._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_;
                    bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
                    auVar182._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar136._4_4_;
                    bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
                    auVar182._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar136._8_4_;
                    bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
                    auVar182._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar136._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
                    auVar182._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar136._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
                    auVar182._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar136._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
                    auVar182._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar136._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
                    auVar182._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar136._28_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 8) & 1);
                    auVar182._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar136._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
                    auVar182._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar136._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
                    auVar182._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar136._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
                    auVar182._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar136._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
                    auVar182._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar136._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
                    auVar182._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar136._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
                    auVar182._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar136._56_4_
                    ;
                    bVar3 = SUB81(uVar119 >> 0xf,0);
                    auVar182._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar136._60_4_
                    ;
                    auVar136 = vmulps_avx512f(auVar137,auVar144);
                    auVar138 = vandps_avx512dq(auVar136,auVar126);
                    uVar119 = vcmpps_avx512f(auVar123,auVar138,1);
                    auVar139 = vmaxps_avx512f(auVar138,auVar123);
                    auVar52._8_4_ = 0xbf800000;
                    auVar52._0_8_ = 0xbf800000bf800000;
                    auVar52._12_4_ = 0xbf800000;
                    auVar52._16_4_ = 0xbf800000;
                    auVar52._20_4_ = 0xbf800000;
                    auVar52._24_4_ = 0xbf800000;
                    auVar52._28_4_ = 0xbf800000;
                    auVar52._32_4_ = 0xbf800000;
                    auVar52._36_4_ = 0xbf800000;
                    auVar52._40_4_ = 0xbf800000;
                    auVar52._44_4_ = 0xbf800000;
                    auVar52._48_4_ = 0xbf800000;
                    auVar52._52_4_ = 0xbf800000;
                    auVar52._56_4_ = 0xbf800000;
                    auVar52._60_4_ = 0xbf800000;
                    auVar140 = vblendmps_avx512f(auVar138,auVar52);
                    bVar3 = (bool)((byte)uVar119 & 1);
                    auVar183._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                    bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
                    auVar183._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                    bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
                    auVar183._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                    bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
                    auVar183._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
                    auVar183._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
                    auVar183._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
                    auVar183._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
                    auVar183._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_
                    ;
                    bVar19 = (byte)(uVar119 >> 8);
                    bVar3 = (bool)(bVar19 & 1);
                    auVar183._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
                    auVar183._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
                    auVar183._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
                    auVar183._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
                    auVar183._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
                    auVar183._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
                    auVar183._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_
                    ;
                    bVar3 = SUB81(uVar119 >> 0xf,0);
                    auVar183._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_
                    ;
                    auVar138 = vrcp14ps_avx512f(auVar139);
                    auVar140 = vmulps_avx512f(auVar183,auVar138);
                    auVar139 = vfmsub213ps_avx512f(auVar139,auVar140,auVar183);
                    auVar138 = vfnmadd213ps_avx512f(auVar139,auVar138,auVar140);
                    auVar139 = vmulps_avx512f(auVar138,auVar138);
                    auVar140 = vmulps_avx512f(auVar139,auVar139);
                    auVar141 = vfmadd213ps_avx512f(auVar127,auVar140,auVar128);
                    auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar129);
                    auVar142 = vfmadd213ps_avx512f(auVar131,auVar140,auVar132);
                    auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar133);
                    auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar134);
                    auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar130);
                    auVar140 = vfmadd213ps_avx512f(auVar142,auVar140,auVar123);
                    auVar139 = vfmadd231ps_avx512f(auVar140,auVar139,auVar141);
                    auVar138 = vmulps_avx512f(auVar139,auVar138);
                    uVar36 = vcmpps_avx512f(auVar137,auVar156,4);
                    auVar139 = vaddps_avx512f(auVar138,auVar135);
                    bVar3 = (bool)((byte)uVar119 & 1);
                    auVar184._0_4_ = (uint)bVar3 * auVar139._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                    bVar3 = (bool)((byte)(uVar119 >> 1) & 1);
                    auVar184._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                    bVar3 = (bool)((byte)(uVar119 >> 2) & 1);
                    auVar184._8_4_ = (uint)bVar3 * auVar139._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                    bVar3 = (bool)((byte)(uVar119 >> 3) & 1);
                    auVar184._12_4_ = (uint)bVar3 * auVar139._12_4_ | (uint)!bVar3 * auVar138._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 4) & 1);
                    auVar184._16_4_ = (uint)bVar3 * auVar139._16_4_ | (uint)!bVar3 * auVar138._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 5) & 1);
                    auVar184._20_4_ = (uint)bVar3 * auVar139._20_4_ | (uint)!bVar3 * auVar138._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 6) & 1);
                    auVar184._24_4_ = (uint)bVar3 * auVar139._24_4_ | (uint)!bVar3 * auVar138._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 7) & 1);
                    auVar184._28_4_ = (uint)bVar3 * auVar139._28_4_ | (uint)!bVar3 * auVar138._28_4_
                    ;
                    bVar3 = (bool)(bVar19 & 1);
                    auVar184._32_4_ = (uint)bVar3 * auVar139._32_4_ | (uint)!bVar3 * auVar138._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 9) & 1);
                    auVar184._36_4_ = (uint)bVar3 * auVar139._36_4_ | (uint)!bVar3 * auVar138._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 10) & 1);
                    auVar184._40_4_ = (uint)bVar3 * auVar139._40_4_ | (uint)!bVar3 * auVar138._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xb) & 1);
                    auVar184._44_4_ = (uint)bVar3 * auVar139._44_4_ | (uint)!bVar3 * auVar138._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xc) & 1);
                    auVar184._48_4_ = (uint)bVar3 * auVar139._48_4_ | (uint)!bVar3 * auVar138._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xd) & 1);
                    auVar184._52_4_ = (uint)bVar3 * auVar139._52_4_ | (uint)!bVar3 * auVar138._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar119 >> 0xe) & 1);
                    auVar184._56_4_ = (uint)bVar3 * auVar139._56_4_ | (uint)!bVar3 * auVar138._56_4_
                    ;
                    bVar3 = SUB81(uVar119 >> 0xf,0);
                    auVar184._60_4_ = (uint)bVar3 * auVar139._60_4_ | (uint)!bVar3 * auVar138._60_4_
                    ;
                    auVar136 = vpternlogd_avx512f(auVar184,auVar136,auVar124,0xf8);
                    auVar138 = vaddps_avx512f(auVar136,auVar182);
                    bVar3 = (bool)((byte)uVar103 & 1);
                    bVar5 = (bool)((byte)(uVar103 >> 1) & 1);
                    bVar6 = (bool)((byte)(uVar103 >> 2) & 1);
                    bVar7 = (bool)((byte)(uVar103 >> 3) & 1);
                    bVar8 = (bool)((byte)(uVar103 >> 4) & 1);
                    bVar9 = (bool)((byte)(uVar103 >> 5) & 1);
                    bVar10 = (bool)((byte)(uVar103 >> 6) & 1);
                    bVar11 = (bool)((byte)(uVar103 >> 7) & 1);
                    bVar12 = (bool)((byte)(uVar103 >> 8) & 1);
                    bVar13 = (bool)((byte)(uVar103 >> 9) & 1);
                    bVar14 = (bool)((byte)(uVar103 >> 10) & 1);
                    bVar15 = (bool)((byte)(uVar103 >> 0xb) & 1);
                    bVar16 = (bool)((byte)(uVar103 >> 0xc) & 1);
                    bVar17 = (bool)((byte)(uVar103 >> 0xd) & 1);
                    bVar18 = (bool)((byte)(uVar103 >> 0xe) & 1);
                    bVar20 = SUB81(uVar103 >> 0xf,0);
                    auVar137 = vpternlogd_avx512f(auVar137,auVar124,auVar332,0xea);
                    bVar4 = (bool)((byte)uVar111 & 1);
                    auVar185._0_4_ =
                         (uint)bVar4 *
                         ((uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar136._0_4_) |
                         (uint)!bVar4 * auVar137._0_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
                    auVar185._4_4_ =
                         (uint)bVar3 *
                         ((uint)bVar5 * auVar138._4_4_ | (uint)!bVar5 * auVar136._4_4_) |
                         (uint)!bVar3 * auVar137._4_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
                    auVar185._8_4_ =
                         (uint)bVar3 *
                         ((uint)bVar6 * auVar138._8_4_ | (uint)!bVar6 * auVar136._8_4_) |
                         (uint)!bVar3 * auVar137._8_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
                    auVar185._12_4_ =
                         (uint)bVar3 *
                         ((uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * auVar136._12_4_) |
                         (uint)!bVar3 * auVar137._12_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
                    auVar185._16_4_ =
                         (uint)bVar3 *
                         ((uint)bVar8 * auVar138._16_4_ | (uint)!bVar8 * auVar136._16_4_) |
                         (uint)!bVar3 * auVar137._16_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
                    auVar185._20_4_ =
                         (uint)bVar3 *
                         ((uint)bVar9 * auVar138._20_4_ | (uint)!bVar9 * auVar136._20_4_) |
                         (uint)!bVar3 * auVar137._20_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
                    auVar185._24_4_ =
                         (uint)bVar3 *
                         ((uint)bVar10 * auVar138._24_4_ | (uint)!bVar10 * auVar136._24_4_) |
                         (uint)!bVar3 * auVar137._24_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
                    auVar185._28_4_ =
                         (uint)bVar3 *
                         ((uint)bVar11 * auVar138._28_4_ | (uint)!bVar11 * auVar136._28_4_) |
                         (uint)!bVar3 * auVar137._28_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 8) & 1);
                    auVar185._32_4_ =
                         (uint)bVar3 *
                         ((uint)bVar12 * auVar138._32_4_ | (uint)!bVar12 * auVar136._32_4_) |
                         (uint)!bVar3 * auVar137._32_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
                    auVar185._36_4_ =
                         (uint)bVar3 *
                         ((uint)bVar13 * auVar138._36_4_ | (uint)!bVar13 * auVar136._36_4_) |
                         (uint)!bVar3 * auVar137._36_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
                    auVar185._40_4_ =
                         (uint)bVar3 *
                         ((uint)bVar14 * auVar138._40_4_ | (uint)!bVar14 * auVar136._40_4_) |
                         (uint)!bVar3 * auVar137._40_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
                    auVar185._44_4_ =
                         (uint)bVar3 *
                         ((uint)bVar15 * auVar138._44_4_ | (uint)!bVar15 * auVar136._44_4_) |
                         (uint)!bVar3 * auVar137._44_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
                    auVar185._48_4_ =
                         (uint)bVar3 *
                         ((uint)bVar16 * auVar138._48_4_ | (uint)!bVar16 * auVar136._48_4_) |
                         (uint)!bVar3 * auVar137._48_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
                    auVar185._52_4_ =
                         (uint)bVar3 *
                         ((uint)bVar17 * auVar138._52_4_ | (uint)!bVar17 * auVar136._52_4_) |
                         (uint)!bVar3 * auVar137._52_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
                    auVar185._56_4_ =
                         (uint)bVar3 *
                         ((uint)bVar18 * auVar138._56_4_ | (uint)!bVar18 * auVar136._56_4_) |
                         (uint)!bVar3 * auVar137._56_4_;
                    bVar3 = SUB81(uVar111 >> 0xf,0);
                    auVar185._60_4_ =
                         (uint)bVar3 *
                         ((uint)bVar20 * auVar138._60_4_ | (uint)!bVar20 * auVar136._60_4_) |
                         (uint)!bVar3 * auVar137._60_4_;
                    auVar137 = vblendmps_avx512f(auVar181,auVar185);
                    bVar3 = (bool)((byte)uVar36 & 1);
                    bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
                    bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
                    bVar7 = (bool)((byte)(uVar36 >> 4) & 1);
                    bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
                    bVar9 = (bool)((byte)(uVar36 >> 6) & 1);
                    bVar10 = (bool)((byte)(uVar36 >> 7) & 1);
                    bVar11 = (bool)((byte)(uVar36 >> 8) & 1);
                    bVar12 = (bool)((byte)(uVar36 >> 9) & 1);
                    bVar13 = (bool)((byte)(uVar36 >> 10) & 1);
                    bVar14 = (bool)((byte)(uVar36 >> 0xb) & 1);
                    bVar15 = (bool)((byte)(uVar36 >> 0xc) & 1);
                    bVar16 = (bool)((byte)(uVar36 >> 0xd) & 1);
                    bVar17 = (bool)((byte)(uVar36 >> 0xe) & 1);
                    bVar18 = SUB81(uVar36 >> 0xf,0);
                    *(uint *)*pauVar115 = (uint)bVar3 * auVar137._0_4_ | !bVar3 * auVar185._0_4_;
                    *(uint *)((long)*pauVar115 + 4) =
                         (uint)bVar4 * auVar137._4_4_ | !bVar4 * auVar185._4_4_;
                    *(uint *)((long)*pauVar115 + 8) =
                         (uint)bVar5 * auVar137._8_4_ | !bVar5 * auVar185._8_4_;
                    *(uint *)((long)*pauVar115 + 0xc) =
                         (uint)bVar6 * auVar137._12_4_ | !bVar6 * auVar185._12_4_;
                    *(uint *)((long)*pauVar115 + 0x10) =
                         (uint)bVar7 * auVar137._16_4_ | !bVar7 * auVar185._16_4_;
                    *(uint *)((long)*pauVar115 + 0x14) =
                         (uint)bVar8 * auVar137._20_4_ | !bVar8 * auVar185._20_4_;
                    *(uint *)((long)*pauVar115 + 0x18) =
                         (uint)bVar9 * auVar137._24_4_ | !bVar9 * auVar185._24_4_;
                    *(uint *)((long)*pauVar115 + 0x1c) =
                         (uint)bVar10 * auVar137._28_4_ | !bVar10 * auVar185._28_4_;
                    *(uint *)pauVar115[1] =
                         (uint)bVar11 * auVar137._32_4_ | !bVar11 * auVar185._32_4_;
                    *(uint *)(pauVar115[1] + 4) =
                         (uint)bVar12 * auVar137._36_4_ | !bVar12 * auVar185._36_4_;
                    *(uint *)(pauVar115[1] + 8) =
                         (uint)bVar13 * auVar137._40_4_ | !bVar13 * auVar185._40_4_;
                    *(uint *)(pauVar115[1] + 0xc) =
                         (uint)bVar14 * auVar137._44_4_ | !bVar14 * auVar185._44_4_;
                    *(uint *)(pauVar115[1] + 0x10) =
                         (uint)bVar15 * auVar137._48_4_ | !bVar15 * auVar185._48_4_;
                    *(uint *)(pauVar115[1] + 0x14) =
                         (uint)bVar16 * auVar137._52_4_ | !bVar16 * auVar185._52_4_;
                    *(uint *)(pauVar115[1] + 0x18) =
                         (uint)bVar17 * auVar137._56_4_ | !bVar17 * auVar185._56_4_;
                    *(uint *)(pauVar115[1] + 0x1c) =
                         (uint)bVar18 * auVar137._60_4_ | !bVar18 * auVar185._60_4_;
                    pauVar112 = pauVar112 + 1;
                    pauVar115 = pauVar115 + 2;
                    iVar99 = iVar99 + 0x10;
                    auVar136 = auVar182;
                  } while (iVar99 < iVar121);
                  uVar103 = (ulong)local_1a0 & 0xffffffff;
                }
                uVar102 = (uint)uVar103 | 7;
                local_238 = pvVar120;
                while (uVar108 = (uint)uVar103, (int)uVar102 < iVar121) {
                  auVar197 = *(undefined1 (*) [32])*pauVar112;
                  local_100._0_4_ = auVar197._0_4_;
                  local_100._4_4_ = auVar197._4_4_;
                  local_100._8_4_ = auVar197._8_4_;
                  local_100._12_4_ = auVar197._12_4_;
                  local_100._16_4_ = auVar197._16_4_;
                  local_100._20_4_ = auVar197._20_4_;
                  local_100._24_4_ = auVar197._24_4_;
                  local_100._28_4_ = auVar197._28_4_;
                  BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                            ((binary_op_atan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180);
                  *pauVar115 = auVar197;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                  pauVar115 = pauVar115 + 1;
                  uVar103 = (ulong)(uVar108 + 8);
                  uVar102 = uVar108 + 0xf;
                }
                uVar102 = uVar108 | 3;
                while ((int)uVar102 < iVar121) {
                  local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
                  auVar210 = ZEXT856(*(ulong *)(*pauVar112 + 8));
                  afVar333 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                       ((binary_op_atan2 *)local_190,(__m128 *)local_100,
                                        (__m128 *)local_a0);
                  auVar127._0_8_ = afVar333._0_8_;
                  auVar127._8_56_ = auVar210;
                  *(undefined1 (*) [16])*pauVar115 = auVar127._0_16_;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                  pauVar115 = (undefined1 (*) [32])((long)*pauVar115 + 0x10);
                  iVar99 = (int)uVar103;
                  uVar108 = iVar99 + 4;
                  uVar103 = (ulong)uVar108;
                  uVar102 = iVar99 + 7;
                }
                if ((int)uVar108 < iVar121) {
                  lVar122 = 0;
                  lVar107 = 0;
                  do {
                    fVar186 = atan2f(*(float *)(*pauVar112 + lVar107 * 4),(float)local_1f0._0_4_);
                    *(float *)((long)*pauVar115 + lVar107 * 4) = fVar186;
                    lVar107 = lVar107 + 1;
                    lVar122 = lVar122 + -4;
                  } while (iVar121 - uVar108 != (int)lVar107);
                  pauVar115 = (undefined1 (*) [32])((long)pauVar115 - lVar122);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar122);
                  iVar121 = local_20c;
                }
                pvVar120 = (void *)((long)local_238 + 1);
                auVar123 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar124 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
                auVar156 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar125 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                auVar126 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                auVar127 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
                auVar128 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
                auVar129 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
                auVar130 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
                auVar131 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
                auVar132 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
                auVar133 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
                auVar134 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
                auVar135 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
                auVar332 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
                iVar99 = (int)local_230;
              } while (pvVar120 != local_1f8);
            }
            local_1b8 = (void *)((long)local_1b8 + 1);
          } while (local_1b8 != local_1c0);
        }
        local_208 = (void *)((long)local_208 + 1);
      } while (local_208 != local_1c8);
    }
    break;
  case 0xb:
    local_20c = local_240->w;
    local_1f8 = (void *)(ulong)(uint)local_240->h;
    local_1c0 = (void *)(ulong)(uint)local_240->d;
    local_1c8 = (void *)(ulong)(uint)local_240->c;
    iVar99 = local_240->elempack;
    local_194 = (float)(uint)local_1b0;
    local_230 = (void *)CONCAT44(local_230._4_4_,iVar99);
    if (0 < local_240->h && ((uint)local_1b0 == 1 && local_240->dims == 2)) {
      iVar121 = iVar99 * local_20c;
      local_200 = (void *)(CONCAT44(local_200._4_4_,iVar121) & 0xfffffffffffffff0);
      pvVar120 = (void *)0x0;
      auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      do {
        auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar102 = *(uint *)((long)local_250 + (long)pvVar120 * 4);
        local_1f0 = ZEXT416(uVar102);
        if (iVar99 == 4) {
          auVar187 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar187._4_4_ = uVar102;
          auVar187._0_4_ = uVar102;
          auVar187._8_4_ = uVar102;
          auVar187._12_4_ = uVar102;
        }
        pauVar112 = (undefined1 (*) [64])
                    ((long)local_240->w * (long)pvVar120 * local_240->elemsize +
                    (long)local_240->data);
        puVar114 = (uint *)((long)local_218->w * (long)pvVar120 * local_218->elemsize +
                           (long)local_218->data);
        local_a0[0] = (float)auVar187._0_4_;
        local_a0[1] = (float)auVar187._4_4_;
        local_a0[2] = (float)auVar187._8_4_;
        local_a0[3] = (float)auVar187._12_4_;
        if (iVar99 == 8) {
          auVar197 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar197._16_16_ = auVar187;
          auVar197._0_16_ = auVar187;
        }
        local_180._0_32_ = auVar197;
        if (iVar99 == 0x10) {
          auVar156 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar156 = vinsertf64x4_avx512f(ZEXT3264(auVar197),auVar197,1);
        }
        uVar102 = 0;
        if (0xf < iVar121) {
          uVar103 = vcmpps_avx512f(auVar156,auVar332,1);
          auVar136 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar137._8_4_ = 0xc0490fdb;
          auVar137._0_8_ = 0xc0490fdbc0490fdb;
          auVar137._12_4_ = 0xc0490fdb;
          auVar137._16_4_ = 0xc0490fdb;
          auVar137._20_4_ = 0xc0490fdb;
          auVar137._24_4_ = 0xc0490fdb;
          auVar137._28_4_ = 0xc0490fdb;
          auVar137._32_4_ = 0xc0490fdb;
          auVar137._36_4_ = 0xc0490fdb;
          auVar137._40_4_ = 0xc0490fdb;
          auVar137._44_4_ = 0xc0490fdb;
          auVar137._48_4_ = 0xc0490fdb;
          auVar137._52_4_ = 0xc0490fdb;
          auVar137._56_4_ = 0xc0490fdb;
          auVar137._60_4_ = 0xc0490fdb;
          auVar137 = vblendmps_avx512f(auVar136,auVar137);
          bVar3 = (bool)((byte)uVar103 & 1);
          auVar144._0_4_ = (uint)bVar3 * auVar137._0_4_ | (uint)!bVar3 * auVar136._0_4_;
          bVar3 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar3 * auVar137._4_4_ | (uint)!bVar3 * auVar136._4_4_;
          bVar3 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar3 * auVar137._8_4_ | (uint)!bVar3 * auVar136._8_4_;
          bVar3 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar3 * auVar137._12_4_ | (uint)!bVar3 * auVar136._12_4_;
          bVar3 = (bool)((byte)(uVar103 >> 4) & 1);
          auVar144._16_4_ = (uint)bVar3 * auVar137._16_4_ | (uint)!bVar3 * auVar136._16_4_;
          bVar3 = (bool)((byte)(uVar103 >> 5) & 1);
          auVar144._20_4_ = (uint)bVar3 * auVar137._20_4_ | (uint)!bVar3 * auVar136._20_4_;
          bVar3 = (bool)((byte)(uVar103 >> 6) & 1);
          auVar144._24_4_ = (uint)bVar3 * auVar137._24_4_ | (uint)!bVar3 * auVar136._24_4_;
          bVar3 = (bool)((byte)(uVar103 >> 7) & 1);
          auVar144._28_4_ = (uint)bVar3 * auVar137._28_4_ | (uint)!bVar3 * auVar136._28_4_;
          bVar3 = (bool)((byte)(uVar103 >> 8) & 1);
          auVar144._32_4_ = (uint)bVar3 * auVar137._32_4_ | (uint)!bVar3 * auVar136._32_4_;
          bVar3 = (bool)((byte)(uVar103 >> 9) & 1);
          auVar144._36_4_ = (uint)bVar3 * auVar137._36_4_ | (uint)!bVar3 * auVar136._36_4_;
          bVar3 = (bool)((byte)(uVar103 >> 10) & 1);
          auVar144._40_4_ = (uint)bVar3 * auVar137._40_4_ | (uint)!bVar3 * auVar136._40_4_;
          bVar3 = (bool)((byte)(uVar103 >> 0xb) & 1);
          auVar144._44_4_ = (uint)bVar3 * auVar137._44_4_ | (uint)!bVar3 * auVar136._44_4_;
          bVar3 = (bool)((byte)(uVar103 >> 0xc) & 1);
          auVar144._48_4_ = (uint)bVar3 * auVar137._48_4_ | (uint)!bVar3 * auVar136._48_4_;
          bVar3 = (bool)((byte)(uVar103 >> 0xd) & 1);
          auVar144._52_4_ = (uint)bVar3 * auVar137._52_4_ | (uint)!bVar3 * auVar136._52_4_;
          bVar3 = (bool)((byte)(uVar103 >> 0xe) & 1);
          auVar144._56_4_ = (uint)bVar3 * auVar137._56_4_ | (uint)!bVar3 * auVar136._56_4_;
          bVar3 = SUB81(uVar103 >> 0xf,0);
          auVar144._60_4_ = (uint)bVar3 * auVar137._60_4_ | (uint)!bVar3 * auVar136._60_4_;
          auVar137 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar137 = vpternlogd_avx512f(auVar137,auVar156,auVar123,0xf8);
          iVar99 = 0xf;
          uVar103 = vcmpps_avx512f(auVar156,auVar332,4);
          do {
            auVar136 = *pauVar112;
            auVar138 = vrcp14ps_avx512f(auVar136);
            auVar139 = vmulps_avx512f(auVar156,auVar138);
            auVar140 = vfmsub213ps_avx512f(auVar139,auVar136,auVar156);
            auVar139 = vfnmadd213ps_avx512f(auVar140,auVar138,auVar139);
            auVar140 = vandps_avx512dq(auVar139,auVar124);
            uVar111 = vcmpps_avx512f(auVar125,auVar140,1);
            auVar141 = vmaxps_avx512f(auVar140,auVar125);
            auVar138._8_4_ = 0xbf800000;
            auVar138._0_8_ = 0xbf800000bf800000;
            auVar138._12_4_ = 0xbf800000;
            auVar138._16_4_ = 0xbf800000;
            auVar138._20_4_ = 0xbf800000;
            auVar138._24_4_ = 0xbf800000;
            auVar138._28_4_ = 0xbf800000;
            auVar138._32_4_ = 0xbf800000;
            auVar138._36_4_ = 0xbf800000;
            auVar138._40_4_ = 0xbf800000;
            auVar138._44_4_ = 0xbf800000;
            auVar138._48_4_ = 0xbf800000;
            auVar138._52_4_ = 0xbf800000;
            auVar138._56_4_ = 0xbf800000;
            auVar138._60_4_ = 0xbf800000;
            auVar138 = vblendmps_avx512f(auVar140,auVar138);
            bVar3 = (bool)((byte)uVar111 & 1);
            auVar142._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar140._0_4_;
            bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
            auVar142._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar140._4_4_;
            bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
            auVar142._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar140._8_4_;
            bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
            auVar142._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar140._12_4_;
            bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
            auVar142._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar140._16_4_;
            bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
            auVar142._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar140._20_4_;
            bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
            auVar142._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar140._24_4_;
            bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
            auVar142._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar140._28_4_;
            bVar19 = (byte)(uVar111 >> 8);
            bVar3 = (bool)(bVar19 & 1);
            auVar142._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar140._32_4_;
            bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
            auVar142._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar140._36_4_;
            bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
            auVar142._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar140._40_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
            auVar142._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar140._44_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
            auVar142._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar140._48_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
            auVar142._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar140._52_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
            auVar142._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar140._56_4_;
            bVar3 = SUB81(uVar111 >> 0xf,0);
            auVar142._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar140._60_4_;
            auVar138 = vrcp14ps_avx512f(auVar141);
            auVar140 = vmulps_avx512f(auVar142,auVar138);
            auVar141 = vfmsub213ps_avx512f(auVar141,auVar140,auVar142);
            auVar138 = vfnmadd213ps_avx512f(auVar141,auVar138,auVar140);
            auVar140 = vmulps_avx512f(auVar138,auVar138);
            uVar119 = vcmpps_avx512f(auVar136,auVar332,4);
            auVar141 = vmulps_avx512f(auVar140,auVar140);
            auVar142 = vfmadd213ps_avx512f(auVar126,auVar141,auVar127);
            auVar142 = vfmadd213ps_avx512f(auVar142,auVar141,auVar128);
            auVar143 = vfmadd213ps_avx512f(auVar130,auVar141,auVar131);
            auVar143 = vfmadd213ps_avx512f(auVar143,auVar141,auVar132);
            auVar142 = vfmadd213ps_avx512f(auVar142,auVar141,auVar129);
            auVar143 = vfmadd213ps_avx512f(auVar143,auVar141,auVar133);
            auVar141 = vfmadd213ps_avx512f(auVar143,auVar141,auVar125);
            auVar140 = vfmadd231ps_avx512f(auVar141,auVar140,auVar142);
            uVar36 = vcmpps_avx512f(auVar136,auVar332,1);
            auVar138 = vmulps_avx512f(auVar140,auVar138);
            auVar140 = vaddps_avx512f(auVar138,auVar134);
            bVar3 = (bool)((byte)uVar111 & 1);
            auVar141._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
            bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
            auVar141._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
            bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
            auVar141._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
            bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
            auVar141._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_;
            bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
            auVar141._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_;
            bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
            auVar141._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_;
            bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
            auVar141._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_;
            bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
            auVar141._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_;
            bVar3 = (bool)(bVar19 & 1);
            auVar141._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_;
            bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
            auVar141._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_;
            bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
            auVar141._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
            auVar141._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
            auVar141._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
            auVar141._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
            auVar141._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_;
            bVar3 = SUB81(uVar111 >> 0xf,0);
            auVar141._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_;
            auVar136 = vpternlogd_avx512f(auVar136,auVar123,auVar135,0xea);
            auVar138 = vpternlogd_avx512f(auVar141,auVar139,auVar123,0xf8);
            uVar111 = vcmpps_avx512f(auVar136,auVar332,1);
            auVar136 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar139 = vaddps_avx512f(auVar138,auVar144);
            bVar3 = (bool)((byte)uVar36 & 1);
            auVar140._0_4_ = (uint)bVar3 * auVar139._0_4_ | (uint)!bVar3 * auVar138._0_4_;
            bVar3 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * auVar138._4_4_;
            bVar3 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar3 * auVar139._8_4_ | (uint)!bVar3 * auVar138._8_4_;
            bVar3 = (bool)((byte)(uVar36 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar3 * auVar139._12_4_ | (uint)!bVar3 * auVar138._12_4_;
            bVar3 = (bool)((byte)(uVar36 >> 4) & 1);
            auVar140._16_4_ = (uint)bVar3 * auVar139._16_4_ | (uint)!bVar3 * auVar138._16_4_;
            bVar3 = (bool)((byte)(uVar36 >> 5) & 1);
            auVar140._20_4_ = (uint)bVar3 * auVar139._20_4_ | (uint)!bVar3 * auVar138._20_4_;
            bVar3 = (bool)((byte)(uVar36 >> 6) & 1);
            auVar140._24_4_ = (uint)bVar3 * auVar139._24_4_ | (uint)!bVar3 * auVar138._24_4_;
            bVar3 = (bool)((byte)(uVar36 >> 7) & 1);
            auVar140._28_4_ = (uint)bVar3 * auVar139._28_4_ | (uint)!bVar3 * auVar138._28_4_;
            bVar3 = (bool)((byte)(uVar36 >> 8) & 1);
            auVar140._32_4_ = (uint)bVar3 * auVar139._32_4_ | (uint)!bVar3 * auVar138._32_4_;
            bVar3 = (bool)((byte)(uVar36 >> 9) & 1);
            auVar140._36_4_ = (uint)bVar3 * auVar139._36_4_ | (uint)!bVar3 * auVar138._36_4_;
            bVar3 = (bool)((byte)(uVar36 >> 10) & 1);
            auVar140._40_4_ = (uint)bVar3 * auVar139._40_4_ | (uint)!bVar3 * auVar138._40_4_;
            bVar3 = (bool)((byte)(uVar36 >> 0xb) & 1);
            auVar140._44_4_ = (uint)bVar3 * auVar139._44_4_ | (uint)!bVar3 * auVar138._44_4_;
            bVar3 = (bool)((byte)(uVar36 >> 0xc) & 1);
            auVar140._48_4_ = (uint)bVar3 * auVar139._48_4_ | (uint)!bVar3 * auVar138._48_4_;
            bVar3 = (bool)((byte)(uVar36 >> 0xd) & 1);
            auVar140._52_4_ = (uint)bVar3 * auVar139._52_4_ | (uint)!bVar3 * auVar138._52_4_;
            bVar3 = (bool)((byte)(uVar36 >> 0xe) & 1);
            auVar140._56_4_ = (uint)bVar3 * auVar139._56_4_ | (uint)!bVar3 * auVar138._56_4_;
            bVar3 = SUB81(uVar36 >> 0xf,0);
            auVar140._60_4_ = (uint)bVar3 * auVar139._60_4_ | (uint)!bVar3 * auVar138._60_4_;
            auVar138 = vblendmps_avx512f(auVar137,auVar140);
            bVar3 = (bool)((byte)uVar119 & 1);
            bVar5 = (bool)((byte)(uVar119 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar119 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar119 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar119 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar119 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar119 >> 6) & 1);
            bVar17 = (bool)((byte)(uVar119 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar119 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar119 >> 9) & 1);
            bVar24 = (bool)((byte)(uVar119 >> 10) & 1);
            bVar26 = (bool)((byte)(uVar119 >> 0xb) & 1);
            bVar28 = (bool)((byte)(uVar119 >> 0xc) & 1);
            bVar30 = (bool)((byte)(uVar119 >> 0xd) & 1);
            bVar32 = (bool)((byte)(uVar119 >> 0xe) & 1);
            bVar34 = SUB81(uVar119 >> 0xf,0);
            bVar4 = (bool)((byte)uVar103 & 1);
            bVar6 = (bool)((byte)(uVar103 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar103 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar103 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar103 >> 6) & 1);
            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar103 >> 8) & 1);
            bVar23 = (bool)((byte)(uVar103 >> 9) & 1);
            bVar25 = (bool)((byte)(uVar103 >> 10) & 1);
            bVar27 = (bool)((byte)(uVar103 >> 0xb) & 1);
            bVar29 = (bool)((byte)(uVar103 >> 0xc) & 1);
            bVar31 = (bool)((byte)(uVar103 >> 0xd) & 1);
            bVar33 = (bool)((byte)(uVar103 >> 0xe) & 1);
            bVar35 = SUB81(uVar103 >> 0xf,0);
            *puVar114 = (uint)bVar4 * ((uint)bVar3 * auVar138._0_4_ | !bVar3 * auVar140._0_4_) |
                        (uint)!bVar4 * (uint)((byte)uVar111 & 1) * auVar136._0_4_;
            puVar114[1] = (uint)bVar6 * ((uint)bVar5 * auVar138._4_4_ | !bVar5 * auVar140._4_4_) |
                          (uint)!bVar6 * (uint)((byte)(uVar111 >> 1) & 1) * auVar136._4_4_;
            puVar114[2] = (uint)bVar8 * ((uint)bVar7 * auVar138._8_4_ | !bVar7 * auVar140._8_4_) |
                          (uint)!bVar8 * (uint)((byte)(uVar111 >> 2) & 1) * auVar136._8_4_;
            puVar114[3] = (uint)bVar10 * ((uint)bVar9 * auVar138._12_4_ | !bVar9 * auVar140._12_4_)
                          | (uint)!bVar10 * (uint)((byte)(uVar111 >> 3) & 1) * auVar136._12_4_;
            puVar114[4] = (uint)bVar12 *
                          ((uint)bVar11 * auVar138._16_4_ | !bVar11 * auVar140._16_4_) |
                          (uint)!bVar12 * (uint)((byte)(uVar111 >> 4) & 1) * auVar136._16_4_;
            puVar114[5] = (uint)bVar14 *
                          ((uint)bVar13 * auVar138._20_4_ | !bVar13 * auVar140._20_4_) |
                          (uint)!bVar14 * (uint)((byte)(uVar111 >> 5) & 1) * auVar136._20_4_;
            puVar114[6] = (uint)bVar16 *
                          ((uint)bVar15 * auVar138._24_4_ | !bVar15 * auVar140._24_4_) |
                          (uint)!bVar16 * (uint)((byte)(uVar111 >> 6) & 1) * auVar136._24_4_;
            puVar114[7] = (uint)bVar18 *
                          ((uint)bVar17 * auVar138._28_4_ | !bVar17 * auVar140._28_4_) |
                          (uint)!bVar18 * (uint)((byte)(uVar111 >> 7) & 1) * auVar136._28_4_;
            puVar114[8] = (uint)bVar21 *
                          ((uint)bVar20 * auVar138._32_4_ | !bVar20 * auVar140._32_4_) |
                          (uint)!bVar21 * (uint)((byte)(uVar111 >> 8) & 1) * auVar136._32_4_;
            puVar114[9] = (uint)bVar23 *
                          ((uint)bVar22 * auVar138._36_4_ | !bVar22 * auVar140._36_4_) |
                          (uint)!bVar23 * (uint)((byte)(uVar111 >> 9) & 1) * auVar136._36_4_;
            puVar114[10] = (uint)bVar25 *
                           ((uint)bVar24 * auVar138._40_4_ | !bVar24 * auVar140._40_4_) |
                           (uint)!bVar25 * (uint)((byte)(uVar111 >> 10) & 1) * auVar136._40_4_;
            puVar114[0xb] =
                 (uint)bVar27 * ((uint)bVar26 * auVar138._44_4_ | !bVar26 * auVar140._44_4_) |
                 (uint)!bVar27 * (uint)((byte)(uVar111 >> 0xb) & 1) * auVar136._44_4_;
            puVar114[0xc] =
                 (uint)bVar29 * ((uint)bVar28 * auVar138._48_4_ | !bVar28 * auVar140._48_4_) |
                 (uint)!bVar29 * (uint)((byte)(uVar111 >> 0xc) & 1) * auVar136._48_4_;
            puVar114[0xd] =
                 (uint)bVar31 * ((uint)bVar30 * auVar138._52_4_ | !bVar30 * auVar140._52_4_) |
                 (uint)!bVar31 * (uint)((byte)(uVar111 >> 0xd) & 1) * auVar136._52_4_;
            puVar114[0xe] =
                 (uint)bVar33 * ((uint)bVar32 * auVar138._56_4_ | !bVar32 * auVar140._56_4_) |
                 (uint)!bVar33 * (uint)((byte)(uVar111 >> 0xe) & 1) * auVar136._56_4_;
            puVar114[0xf] =
                 (uint)bVar35 * ((uint)bVar34 * auVar138._60_4_ | !bVar34 * auVar140._60_4_) |
                 (uint)!bVar35 * (uint)(byte)(uVar111 >> 0xf) * auVar136._60_4_;
            pauVar112 = pauVar112 + 1;
            puVar114 = puVar114 + 0x10;
            iVar99 = iVar99 + 0x10;
          } while (iVar99 < iVar121);
          uVar102 = (uint)local_200;
        }
        uVar108 = uVar102 | 7;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)*pauVar112;
          uVar208 = *(undefined8 *)(*pauVar112 + 8);
          uVar211 = *(undefined8 *)(*pauVar112 + 0x10);
          uVar212 = *(undefined8 *)(*pauVar112 + 0x18);
          local_100 = *(undefined1 (*) [32])*pauVar112;
          BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                    ((binary_op_ratan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180);
          *(undefined8 *)puVar114 = uVar209;
          *(undefined8 *)(puVar114 + 2) = uVar208;
          *(undefined8 *)(puVar114 + 4) = uVar211;
          *(undefined8 *)(puVar114 + 6) = uVar212;
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
          puVar114 = puVar114 + 8;
          uVar108 = uVar102 + 0xf;
          uVar102 = uVar102 + 8;
        }
        uVar108 = uVar102 | 3;
        local_238 = pvVar120;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)(*pauVar112 + 8);
          local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
          afVar333 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                               ((binary_op_ratan2 *)local_190,(__m128 *)local_100,(__m128 *)local_a0
                               );
          *(long *)puVar114 = afVar333._0_8_;
          *(undefined8 *)(puVar114 + 2) = uVar209;
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
          puVar114 = puVar114 + 4;
          uVar108 = uVar102 + 7;
          uVar102 = uVar102 + 4;
        }
        if (iVar121 - uVar102 != 0 && (int)uVar102 <= iVar121) {
          lVar107 = 0;
          do {
            fVar186 = atan2f((float)local_1f0._0_4_,*(float *)(*pauVar112 + lVar107 * 4));
            puVar114[lVar107] = (uint)fVar186;
            lVar107 = lVar107 + 1;
          } while (iVar121 - uVar102 != (int)lVar107);
        }
        pvVar120 = (void *)((long)local_238 + 1);
        auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        iVar99 = (int)local_230;
      } while (pvVar120 != local_1f8);
    }
    if ((0 < (int)local_1c8 && local_194 == 1.4013e-45) && local_240->dims - 3U < 2) {
      iVar121 = (int)local_1f8 * (int)local_1c0 * iVar99 * local_20c;
      local_200 = (void *)(CONCAT44(local_200._4_4_,iVar121) & 0xfffffffffffffff0);
      pvVar120 = (void *)0x0;
      auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      do {
        auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar102 = *(uint *)((long)local_250 + (long)pvVar120 * 4);
        local_1f0 = ZEXT416(uVar102);
        if (iVar99 == 4) {
          auVar188 = *(undefined1 (*) [16])((long)local_250 + (long)pvVar120 * 0x10);
        }
        else {
          auVar188._4_4_ = uVar102;
          auVar188._0_4_ = uVar102;
          auVar188._8_4_ = uVar102;
          auVar188._12_4_ = uVar102;
        }
        pauVar112 = (undefined1 (*) [64])
                    (local_240->cstep * (long)pvVar120 * local_240->elemsize + (long)local_240->data
                    );
        puVar114 = (uint *)(local_218->cstep * (long)pvVar120 * local_218->elemsize +
                           (long)local_218->data);
        local_a0[0] = (float)auVar188._0_4_;
        local_a0[1] = (float)auVar188._4_4_;
        local_a0[2] = (float)auVar188._8_4_;
        local_a0[3] = (float)auVar188._12_4_;
        if (iVar99 == 8) {
          auVar198 = *(undefined1 (*) [32])((long)local_250 + (long)pvVar120 * 0x20);
        }
        else {
          auVar198._16_16_ = auVar188;
          auVar198._0_16_ = auVar188;
        }
        local_180._0_32_ = auVar198;
        if (iVar99 == 0x10) {
          auVar156 = *(undefined1 (*) [64])((long)local_250 + (long)pvVar120 * 0x40);
        }
        else {
          auVar156 = vinsertf64x4_avx512f(ZEXT3264(auVar198),auVar198,1);
        }
        uVar102 = 0;
        if (0xf < iVar121) {
          uVar103 = vcmpps_avx512f(auVar156,auVar332,1);
          auVar137 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar136._8_4_ = 0xc0490fdb;
          auVar136._0_8_ = 0xc0490fdbc0490fdb;
          auVar136._12_4_ = 0xc0490fdb;
          auVar136._16_4_ = 0xc0490fdb;
          auVar136._20_4_ = 0xc0490fdb;
          auVar136._24_4_ = 0xc0490fdb;
          auVar136._28_4_ = 0xc0490fdb;
          auVar136._32_4_ = 0xc0490fdb;
          auVar136._36_4_ = 0xc0490fdb;
          auVar136._40_4_ = 0xc0490fdb;
          auVar136._44_4_ = 0xc0490fdb;
          auVar136._48_4_ = 0xc0490fdb;
          auVar136._52_4_ = 0xc0490fdb;
          auVar136._56_4_ = 0xc0490fdb;
          auVar136._60_4_ = 0xc0490fdb;
          auVar136 = vblendmps_avx512f(auVar137,auVar136);
          bVar3 = (bool)((byte)uVar103 & 1);
          auVar139._0_4_ = (uint)bVar3 * auVar136._0_4_ | (uint)!bVar3 * auVar137._0_4_;
          bVar3 = (bool)((byte)(uVar103 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar3 * auVar136._4_4_ | (uint)!bVar3 * auVar137._4_4_;
          bVar3 = (bool)((byte)(uVar103 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar3 * auVar136._8_4_ | (uint)!bVar3 * auVar137._8_4_;
          bVar3 = (bool)((byte)(uVar103 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar3 * auVar136._12_4_ | (uint)!bVar3 * auVar137._12_4_;
          bVar3 = (bool)((byte)(uVar103 >> 4) & 1);
          auVar139._16_4_ = (uint)bVar3 * auVar136._16_4_ | (uint)!bVar3 * auVar137._16_4_;
          bVar3 = (bool)((byte)(uVar103 >> 5) & 1);
          auVar139._20_4_ = (uint)bVar3 * auVar136._20_4_ | (uint)!bVar3 * auVar137._20_4_;
          bVar3 = (bool)((byte)(uVar103 >> 6) & 1);
          auVar139._24_4_ = (uint)bVar3 * auVar136._24_4_ | (uint)!bVar3 * auVar137._24_4_;
          bVar3 = (bool)((byte)(uVar103 >> 7) & 1);
          auVar139._28_4_ = (uint)bVar3 * auVar136._28_4_ | (uint)!bVar3 * auVar137._28_4_;
          bVar3 = (bool)((byte)(uVar103 >> 8) & 1);
          auVar139._32_4_ = (uint)bVar3 * auVar136._32_4_ | (uint)!bVar3 * auVar137._32_4_;
          bVar3 = (bool)((byte)(uVar103 >> 9) & 1);
          auVar139._36_4_ = (uint)bVar3 * auVar136._36_4_ | (uint)!bVar3 * auVar137._36_4_;
          bVar3 = (bool)((byte)(uVar103 >> 10) & 1);
          auVar139._40_4_ = (uint)bVar3 * auVar136._40_4_ | (uint)!bVar3 * auVar137._40_4_;
          bVar3 = (bool)((byte)(uVar103 >> 0xb) & 1);
          auVar139._44_4_ = (uint)bVar3 * auVar136._44_4_ | (uint)!bVar3 * auVar137._44_4_;
          bVar3 = (bool)((byte)(uVar103 >> 0xc) & 1);
          auVar139._48_4_ = (uint)bVar3 * auVar136._48_4_ | (uint)!bVar3 * auVar137._48_4_;
          bVar3 = (bool)((byte)(uVar103 >> 0xd) & 1);
          auVar139._52_4_ = (uint)bVar3 * auVar136._52_4_ | (uint)!bVar3 * auVar137._52_4_;
          bVar3 = (bool)((byte)(uVar103 >> 0xe) & 1);
          auVar139._56_4_ = (uint)bVar3 * auVar136._56_4_ | (uint)!bVar3 * auVar137._56_4_;
          bVar3 = SUB81(uVar103 >> 0xf,0);
          auVar139._60_4_ = (uint)bVar3 * auVar136._60_4_ | (uint)!bVar3 * auVar137._60_4_;
          auVar137 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar137 = vpternlogd_avx512f(auVar137,auVar156,auVar123,0xf8);
          iVar99 = 0xf;
          uVar103 = vcmpps_avx512f(auVar156,auVar332,4);
          do {
            auVar136 = *pauVar112;
            auVar144 = vrcp14ps_avx512f(auVar136);
            auVar138 = vmulps_avx512f(auVar156,auVar144);
            auVar140 = vfmsub213ps_avx512f(auVar138,auVar136,auVar156);
            auVar144 = vfnmadd213ps_avx512f(auVar140,auVar144,auVar138);
            auVar138 = vandps_avx512dq(auVar144,auVar124);
            uVar111 = vcmpps_avx512f(auVar125,auVar138,1);
            auVar140 = vmaxps_avx512f(auVar138,auVar125);
            auVar143._8_4_ = 0xbf800000;
            auVar143._0_8_ = 0xbf800000bf800000;
            auVar143._12_4_ = 0xbf800000;
            auVar143._16_4_ = 0xbf800000;
            auVar143._20_4_ = 0xbf800000;
            auVar143._24_4_ = 0xbf800000;
            auVar143._28_4_ = 0xbf800000;
            auVar143._32_4_ = 0xbf800000;
            auVar143._36_4_ = 0xbf800000;
            auVar143._40_4_ = 0xbf800000;
            auVar143._44_4_ = 0xbf800000;
            auVar143._48_4_ = 0xbf800000;
            auVar143._52_4_ = 0xbf800000;
            auVar143._56_4_ = 0xbf800000;
            auVar143._60_4_ = 0xbf800000;
            auVar141 = vblendmps_avx512f(auVar138,auVar143);
            bVar3 = (bool)((byte)uVar111 & 1);
            auVar145._0_4_ = (uint)bVar3 * auVar141._0_4_ | (uint)!bVar3 * auVar138._0_4_;
            bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
            auVar145._4_4_ = (uint)bVar3 * auVar141._4_4_ | (uint)!bVar3 * auVar138._4_4_;
            bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
            auVar145._8_4_ = (uint)bVar3 * auVar141._8_4_ | (uint)!bVar3 * auVar138._8_4_;
            bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
            auVar145._12_4_ = (uint)bVar3 * auVar141._12_4_ | (uint)!bVar3 * auVar138._12_4_;
            bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
            auVar145._16_4_ = (uint)bVar3 * auVar141._16_4_ | (uint)!bVar3 * auVar138._16_4_;
            bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
            auVar145._20_4_ = (uint)bVar3 * auVar141._20_4_ | (uint)!bVar3 * auVar138._20_4_;
            bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
            auVar145._24_4_ = (uint)bVar3 * auVar141._24_4_ | (uint)!bVar3 * auVar138._24_4_;
            bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
            auVar145._28_4_ = (uint)bVar3 * auVar141._28_4_ | (uint)!bVar3 * auVar138._28_4_;
            bVar19 = (byte)(uVar111 >> 8);
            bVar3 = (bool)(bVar19 & 1);
            auVar145._32_4_ = (uint)bVar3 * auVar141._32_4_ | (uint)!bVar3 * auVar138._32_4_;
            bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
            auVar145._36_4_ = (uint)bVar3 * auVar141._36_4_ | (uint)!bVar3 * auVar138._36_4_;
            bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
            auVar145._40_4_ = (uint)bVar3 * auVar141._40_4_ | (uint)!bVar3 * auVar138._40_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
            auVar145._44_4_ = (uint)bVar3 * auVar141._44_4_ | (uint)!bVar3 * auVar138._44_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
            auVar145._48_4_ = (uint)bVar3 * auVar141._48_4_ | (uint)!bVar3 * auVar138._48_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
            auVar145._52_4_ = (uint)bVar3 * auVar141._52_4_ | (uint)!bVar3 * auVar138._52_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
            auVar145._56_4_ = (uint)bVar3 * auVar141._56_4_ | (uint)!bVar3 * auVar138._56_4_;
            bVar3 = SUB81(uVar111 >> 0xf,0);
            auVar145._60_4_ = (uint)bVar3 * auVar141._60_4_ | (uint)!bVar3 * auVar138._60_4_;
            auVar138 = vrcp14ps_avx512f(auVar140);
            auVar141 = vmulps_avx512f(auVar145,auVar138);
            auVar140 = vfmsub213ps_avx512f(auVar140,auVar141,auVar145);
            auVar138 = vfnmadd213ps_avx512f(auVar140,auVar138,auVar141);
            auVar140 = vmulps_avx512f(auVar138,auVar138);
            uVar119 = vcmpps_avx512f(auVar136,auVar332,4);
            auVar141 = vmulps_avx512f(auVar140,auVar140);
            auVar142 = vfmadd213ps_avx512f(auVar126,auVar141,auVar127);
            auVar142 = vfmadd213ps_avx512f(auVar142,auVar141,auVar128);
            auVar143 = vfmadd213ps_avx512f(auVar130,auVar141,auVar131);
            auVar143 = vfmadd213ps_avx512f(auVar143,auVar141,auVar132);
            auVar142 = vfmadd213ps_avx512f(auVar142,auVar141,auVar129);
            auVar143 = vfmadd213ps_avx512f(auVar143,auVar141,auVar133);
            auVar141 = vfmadd213ps_avx512f(auVar143,auVar141,auVar125);
            auVar140 = vfmadd231ps_avx512f(auVar141,auVar140,auVar142);
            uVar36 = vcmpps_avx512f(auVar136,auVar332,1);
            auVar138 = vmulps_avx512f(auVar140,auVar138);
            auVar140 = vaddps_avx512f(auVar138,auVar134);
            bVar3 = (bool)((byte)uVar111 & 1);
            auVar146._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
            bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
            auVar146._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
            bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
            auVar146._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
            bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
            auVar146._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_;
            bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
            auVar146._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_;
            bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
            auVar146._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_;
            bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
            auVar146._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_;
            bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
            auVar146._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_;
            bVar3 = (bool)(bVar19 & 1);
            auVar146._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_;
            bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
            auVar146._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_;
            bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
            auVar146._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
            auVar146._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
            auVar146._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
            auVar146._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_;
            bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
            auVar146._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_;
            bVar3 = SUB81(uVar111 >> 0xf,0);
            auVar146._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_;
            auVar136 = vpternlogd_avx512f(auVar136,auVar123,auVar135,0xea);
            auVar144 = vpternlogd_avx512f(auVar146,auVar144,auVar123,0xf8);
            uVar111 = vcmpps_avx512f(auVar136,auVar332,1);
            auVar136 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar138 = vaddps_avx512f(auVar144,auVar139);
            bVar3 = (bool)((byte)uVar36 & 1);
            auVar147._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar144._0_4_;
            bVar3 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar147._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar144._4_4_;
            bVar3 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar147._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar144._8_4_;
            bVar3 = (bool)((byte)(uVar36 >> 3) & 1);
            auVar147._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar144._12_4_;
            bVar3 = (bool)((byte)(uVar36 >> 4) & 1);
            auVar147._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar144._16_4_;
            bVar3 = (bool)((byte)(uVar36 >> 5) & 1);
            auVar147._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar144._20_4_;
            bVar3 = (bool)((byte)(uVar36 >> 6) & 1);
            auVar147._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar144._24_4_;
            bVar3 = (bool)((byte)(uVar36 >> 7) & 1);
            auVar147._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar144._28_4_;
            bVar3 = (bool)((byte)(uVar36 >> 8) & 1);
            auVar147._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar144._32_4_;
            bVar3 = (bool)((byte)(uVar36 >> 9) & 1);
            auVar147._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar144._36_4_;
            bVar3 = (bool)((byte)(uVar36 >> 10) & 1);
            auVar147._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar144._40_4_;
            bVar3 = (bool)((byte)(uVar36 >> 0xb) & 1);
            auVar147._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar144._44_4_;
            bVar3 = (bool)((byte)(uVar36 >> 0xc) & 1);
            auVar147._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar144._48_4_;
            bVar3 = (bool)((byte)(uVar36 >> 0xd) & 1);
            auVar147._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar144._52_4_;
            bVar3 = (bool)((byte)(uVar36 >> 0xe) & 1);
            auVar147._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar144._56_4_;
            bVar3 = SUB81(uVar36 >> 0xf,0);
            auVar147._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar144._60_4_;
            auVar144 = vblendmps_avx512f(auVar137,auVar147);
            bVar3 = (bool)((byte)uVar119 & 1);
            bVar5 = (bool)((byte)(uVar119 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar119 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar119 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar119 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar119 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar119 >> 6) & 1);
            bVar17 = (bool)((byte)(uVar119 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar119 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar119 >> 9) & 1);
            bVar24 = (bool)((byte)(uVar119 >> 10) & 1);
            bVar26 = (bool)((byte)(uVar119 >> 0xb) & 1);
            bVar28 = (bool)((byte)(uVar119 >> 0xc) & 1);
            bVar30 = (bool)((byte)(uVar119 >> 0xd) & 1);
            bVar32 = (bool)((byte)(uVar119 >> 0xe) & 1);
            bVar34 = SUB81(uVar119 >> 0xf,0);
            bVar4 = (bool)((byte)uVar103 & 1);
            bVar6 = (bool)((byte)(uVar103 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar103 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar103 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar103 >> 6) & 1);
            bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar103 >> 8) & 1);
            bVar23 = (bool)((byte)(uVar103 >> 9) & 1);
            bVar25 = (bool)((byte)(uVar103 >> 10) & 1);
            bVar27 = (bool)((byte)(uVar103 >> 0xb) & 1);
            bVar29 = (bool)((byte)(uVar103 >> 0xc) & 1);
            bVar31 = (bool)((byte)(uVar103 >> 0xd) & 1);
            bVar33 = (bool)((byte)(uVar103 >> 0xe) & 1);
            bVar35 = SUB81(uVar103 >> 0xf,0);
            *puVar114 = (uint)bVar4 * ((uint)bVar3 * auVar144._0_4_ | !bVar3 * auVar147._0_4_) |
                        (uint)!bVar4 * (uint)((byte)uVar111 & 1) * auVar136._0_4_;
            puVar114[1] = (uint)bVar6 * ((uint)bVar5 * auVar144._4_4_ | !bVar5 * auVar147._4_4_) |
                          (uint)!bVar6 * (uint)((byte)(uVar111 >> 1) & 1) * auVar136._4_4_;
            puVar114[2] = (uint)bVar8 * ((uint)bVar7 * auVar144._8_4_ | !bVar7 * auVar147._8_4_) |
                          (uint)!bVar8 * (uint)((byte)(uVar111 >> 2) & 1) * auVar136._8_4_;
            puVar114[3] = (uint)bVar10 * ((uint)bVar9 * auVar144._12_4_ | !bVar9 * auVar147._12_4_)
                          | (uint)!bVar10 * (uint)((byte)(uVar111 >> 3) & 1) * auVar136._12_4_;
            puVar114[4] = (uint)bVar12 *
                          ((uint)bVar11 * auVar144._16_4_ | !bVar11 * auVar147._16_4_) |
                          (uint)!bVar12 * (uint)((byte)(uVar111 >> 4) & 1) * auVar136._16_4_;
            puVar114[5] = (uint)bVar14 *
                          ((uint)bVar13 * auVar144._20_4_ | !bVar13 * auVar147._20_4_) |
                          (uint)!bVar14 * (uint)((byte)(uVar111 >> 5) & 1) * auVar136._20_4_;
            puVar114[6] = (uint)bVar16 *
                          ((uint)bVar15 * auVar144._24_4_ | !bVar15 * auVar147._24_4_) |
                          (uint)!bVar16 * (uint)((byte)(uVar111 >> 6) & 1) * auVar136._24_4_;
            puVar114[7] = (uint)bVar18 *
                          ((uint)bVar17 * auVar144._28_4_ | !bVar17 * auVar147._28_4_) |
                          (uint)!bVar18 * (uint)((byte)(uVar111 >> 7) & 1) * auVar136._28_4_;
            puVar114[8] = (uint)bVar21 *
                          ((uint)bVar20 * auVar144._32_4_ | !bVar20 * auVar147._32_4_) |
                          (uint)!bVar21 * (uint)((byte)(uVar111 >> 8) & 1) * auVar136._32_4_;
            puVar114[9] = (uint)bVar23 *
                          ((uint)bVar22 * auVar144._36_4_ | !bVar22 * auVar147._36_4_) |
                          (uint)!bVar23 * (uint)((byte)(uVar111 >> 9) & 1) * auVar136._36_4_;
            puVar114[10] = (uint)bVar25 *
                           ((uint)bVar24 * auVar144._40_4_ | !bVar24 * auVar147._40_4_) |
                           (uint)!bVar25 * (uint)((byte)(uVar111 >> 10) & 1) * auVar136._40_4_;
            puVar114[0xb] =
                 (uint)bVar27 * ((uint)bVar26 * auVar144._44_4_ | !bVar26 * auVar147._44_4_) |
                 (uint)!bVar27 * (uint)((byte)(uVar111 >> 0xb) & 1) * auVar136._44_4_;
            puVar114[0xc] =
                 (uint)bVar29 * ((uint)bVar28 * auVar144._48_4_ | !bVar28 * auVar147._48_4_) |
                 (uint)!bVar29 * (uint)((byte)(uVar111 >> 0xc) & 1) * auVar136._48_4_;
            puVar114[0xd] =
                 (uint)bVar31 * ((uint)bVar30 * auVar144._52_4_ | !bVar30 * auVar147._52_4_) |
                 (uint)!bVar31 * (uint)((byte)(uVar111 >> 0xd) & 1) * auVar136._52_4_;
            puVar114[0xe] =
                 (uint)bVar33 * ((uint)bVar32 * auVar144._56_4_ | !bVar32 * auVar147._56_4_) |
                 (uint)!bVar33 * (uint)((byte)(uVar111 >> 0xe) & 1) * auVar136._56_4_;
            puVar114[0xf] =
                 (uint)bVar35 * ((uint)bVar34 * auVar144._60_4_ | !bVar34 * auVar147._60_4_) |
                 (uint)!bVar35 * (uint)(byte)(uVar111 >> 0xf) * auVar136._60_4_;
            pauVar112 = pauVar112 + 1;
            puVar114 = puVar114 + 0x10;
            iVar99 = iVar99 + 0x10;
          } while (iVar99 < iVar121);
          uVar102 = (uint)local_200;
        }
        uVar108 = uVar102 | 7;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)*pauVar112;
          uVar208 = *(undefined8 *)(*pauVar112 + 8);
          uVar211 = *(undefined8 *)(*pauVar112 + 0x10);
          uVar212 = *(undefined8 *)(*pauVar112 + 0x18);
          local_100 = *(undefined1 (*) [32])*pauVar112;
          BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                    ((binary_op_ratan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180);
          *(undefined8 *)puVar114 = uVar209;
          *(undefined8 *)(puVar114 + 2) = uVar208;
          *(undefined8 *)(puVar114 + 4) = uVar211;
          *(undefined8 *)(puVar114 + 6) = uVar212;
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
          puVar114 = puVar114 + 8;
          uVar108 = uVar102 + 0xf;
          uVar102 = uVar102 + 8;
        }
        uVar108 = uVar102 | 3;
        local_238 = pvVar120;
        while ((int)uVar108 < iVar121) {
          uVar209 = *(undefined8 *)(*pauVar112 + 8);
          local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
          afVar333 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                               ((binary_op_ratan2 *)local_190,(__m128 *)local_100,(__m128 *)local_a0
                               );
          *(long *)puVar114 = afVar333._0_8_;
          *(undefined8 *)(puVar114 + 2) = uVar209;
          pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
          puVar114 = puVar114 + 4;
          uVar108 = uVar102 + 7;
          uVar102 = uVar102 + 4;
        }
        if (iVar121 - uVar102 != 0 && (int)uVar102 <= iVar121) {
          lVar107 = 0;
          do {
            fVar186 = atan2f((float)local_1f0._0_4_,*(float *)(*pauVar112 + lVar107 * 4));
            puVar114[lVar107] = (uint)fVar186;
            lVar107 = lVar107 + 1;
          } while (iVar121 - uVar102 != (int)lVar107);
        }
        pvVar120 = (void *)((long)local_238 + 1);
        auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        iVar99 = (int)local_230;
      } while (pvVar120 != local_1c8);
    }
    local_7c = (uint)local_194 ^ 2;
    if ((local_240->dims == 3 && local_7c == 0) && 0 < (int)local_1c8) {
      iVar121 = iVar99 * local_20c;
      local_1a0 = (void *)(CONCAT44(local_1a0._4_4_,iVar121) & 0xfffffffffffffff0);
      auVar68._4_4_ = local_1b0._4_4_;
      auVar68._0_4_ = (uint)local_1b0;
      auVar68._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar68,1);
      local_108 = (long)iVar100 * (long)local_208;
      local_1d0 = (void *)0x0;
      auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      local_1b8 = (void *)CONCAT44(local_1b8._4_4_,iVar121);
      do {
        if (0 < (int)local_1f8) {
          pauVar115 = (undefined1 (*) [32])
                      (local_218->cstep * (long)local_1d0 * local_218->elemsize +
                      (long)local_218->data);
          local_200 = (void *)(local_108 * (long)local_1d0 + (long)local_250);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_1d0 * local_240->elemsize +
                      (long)local_240->data);
          pvVar120 = (void *)0x0;
          do {
            uVar102 = *(uint *)((long)local_200 + (long)pvVar120 * 4);
            local_1f0 = ZEXT416(uVar102);
            if (iVar99 == 4) {
              auVar189 = *(undefined1 (*) [16])((long)local_200 + (long)pvVar120 * 0x10);
            }
            else {
              auVar189._4_4_ = uVar102;
              auVar189._0_4_ = uVar102;
              auVar189._8_4_ = uVar102;
              auVar189._12_4_ = uVar102;
            }
            local_a0[0] = (float)auVar189._0_4_;
            local_a0[1] = (float)auVar189._4_4_;
            local_a0[2] = (float)auVar189._8_4_;
            local_a0[3] = (float)auVar189._12_4_;
            if (iVar99 == 8) {
              auVar199 = *(undefined1 (*) [32])((long)local_200 + (long)pvVar120 * 0x20);
            }
            else {
              auVar199._16_16_ = auVar189;
              auVar199._0_16_ = auVar189;
            }
            local_180._0_32_ = auVar199;
            if (iVar99 == 0x10) {
              auVar156 = *(undefined1 (*) [64])((long)local_200 + (long)pvVar120 * 0x40);
            }
            else {
              auVar156 = vinsertf64x4_avx512f(ZEXT3264(auVar199),auVar199,1);
            }
            uVar103 = 0;
            if (0xf < iVar121) {
              uVar103 = vcmpps_avx512f(auVar156,auVar332,1);
              auVar137 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
              auVar37._8_4_ = 0xc0490fdb;
              auVar37._0_8_ = 0xc0490fdbc0490fdb;
              auVar37._12_4_ = 0xc0490fdb;
              auVar37._16_4_ = 0xc0490fdb;
              auVar37._20_4_ = 0xc0490fdb;
              auVar37._24_4_ = 0xc0490fdb;
              auVar37._28_4_ = 0xc0490fdb;
              auVar37._32_4_ = 0xc0490fdb;
              auVar37._36_4_ = 0xc0490fdb;
              auVar37._40_4_ = 0xc0490fdb;
              auVar37._44_4_ = 0xc0490fdb;
              auVar37._48_4_ = 0xc0490fdb;
              auVar37._52_4_ = 0xc0490fdb;
              auVar37._56_4_ = 0xc0490fdb;
              auVar37._60_4_ = 0xc0490fdb;
              auVar136 = vblendmps_avx512f(auVar137,auVar37);
              bVar3 = (bool)((byte)uVar103 & 1);
              auVar148._0_4_ = (uint)bVar3 * auVar136._0_4_ | (uint)!bVar3 * auVar137._0_4_;
              bVar3 = (bool)((byte)(uVar103 >> 1) & 1);
              auVar148._4_4_ = (uint)bVar3 * auVar136._4_4_ | (uint)!bVar3 * auVar137._4_4_;
              bVar3 = (bool)((byte)(uVar103 >> 2) & 1);
              auVar148._8_4_ = (uint)bVar3 * auVar136._8_4_ | (uint)!bVar3 * auVar137._8_4_;
              bVar3 = (bool)((byte)(uVar103 >> 3) & 1);
              auVar148._12_4_ = (uint)bVar3 * auVar136._12_4_ | (uint)!bVar3 * auVar137._12_4_;
              bVar3 = (bool)((byte)(uVar103 >> 4) & 1);
              auVar148._16_4_ = (uint)bVar3 * auVar136._16_4_ | (uint)!bVar3 * auVar137._16_4_;
              bVar3 = (bool)((byte)(uVar103 >> 5) & 1);
              auVar148._20_4_ = (uint)bVar3 * auVar136._20_4_ | (uint)!bVar3 * auVar137._20_4_;
              bVar3 = (bool)((byte)(uVar103 >> 6) & 1);
              auVar148._24_4_ = (uint)bVar3 * auVar136._24_4_ | (uint)!bVar3 * auVar137._24_4_;
              bVar3 = (bool)((byte)(uVar103 >> 7) & 1);
              auVar148._28_4_ = (uint)bVar3 * auVar136._28_4_ | (uint)!bVar3 * auVar137._28_4_;
              bVar3 = (bool)((byte)(uVar103 >> 8) & 1);
              auVar148._32_4_ = (uint)bVar3 * auVar136._32_4_ | (uint)!bVar3 * auVar137._32_4_;
              bVar3 = (bool)((byte)(uVar103 >> 9) & 1);
              auVar148._36_4_ = (uint)bVar3 * auVar136._36_4_ | (uint)!bVar3 * auVar137._36_4_;
              bVar3 = (bool)((byte)(uVar103 >> 10) & 1);
              auVar148._40_4_ = (uint)bVar3 * auVar136._40_4_ | (uint)!bVar3 * auVar137._40_4_;
              bVar3 = (bool)((byte)(uVar103 >> 0xb) & 1);
              auVar148._44_4_ = (uint)bVar3 * auVar136._44_4_ | (uint)!bVar3 * auVar137._44_4_;
              bVar3 = (bool)((byte)(uVar103 >> 0xc) & 1);
              auVar148._48_4_ = (uint)bVar3 * auVar136._48_4_ | (uint)!bVar3 * auVar137._48_4_;
              bVar3 = (bool)((byte)(uVar103 >> 0xd) & 1);
              auVar148._52_4_ = (uint)bVar3 * auVar136._52_4_ | (uint)!bVar3 * auVar137._52_4_;
              bVar3 = (bool)((byte)(uVar103 >> 0xe) & 1);
              auVar148._56_4_ = (uint)bVar3 * auVar136._56_4_ | (uint)!bVar3 * auVar137._56_4_;
              bVar3 = SUB81(uVar103 >> 0xf,0);
              auVar148._60_4_ = (uint)bVar3 * auVar136._60_4_ | (uint)!bVar3 * auVar137._60_4_;
              auVar137 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
              auVar137 = vpternlogd_avx512f(auVar137,auVar156,auVar123,0xf8);
              iVar99 = 0xf;
              uVar103 = vcmpps_avx512f(auVar156,auVar332,4);
              do {
                auVar136 = *pauVar112;
                auVar144 = vrcp14ps_avx512f(auVar136);
                auVar138 = vmulps_avx512f(auVar156,auVar144);
                auVar139 = vfmsub213ps_avx512f(auVar138,auVar136,auVar156);
                auVar144 = vfnmadd213ps_avx512f(auVar139,auVar144,auVar138);
                auVar138 = vandps_avx512dq(auVar144,auVar124);
                uVar111 = vcmpps_avx512f(auVar125,auVar138,1);
                auVar139 = vmaxps_avx512f(auVar138,auVar125);
                auVar38._8_4_ = 0xbf800000;
                auVar38._0_8_ = 0xbf800000bf800000;
                auVar38._12_4_ = 0xbf800000;
                auVar38._16_4_ = 0xbf800000;
                auVar38._20_4_ = 0xbf800000;
                auVar38._24_4_ = 0xbf800000;
                auVar38._28_4_ = 0xbf800000;
                auVar38._32_4_ = 0xbf800000;
                auVar38._36_4_ = 0xbf800000;
                auVar38._40_4_ = 0xbf800000;
                auVar38._44_4_ = 0xbf800000;
                auVar38._48_4_ = 0xbf800000;
                auVar38._52_4_ = 0xbf800000;
                auVar38._56_4_ = 0xbf800000;
                auVar38._60_4_ = 0xbf800000;
                auVar140 = vblendmps_avx512f(auVar138,auVar38);
                bVar3 = (bool)((byte)uVar111 & 1);
                auVar149._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
                auVar149._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
                auVar149._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
                auVar149._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_;
                bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
                auVar149._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_;
                bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
                auVar149._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_;
                bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
                auVar149._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_;
                bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
                auVar149._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_;
                bVar19 = (byte)(uVar111 >> 8);
                bVar3 = (bool)(bVar19 & 1);
                auVar149._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_;
                bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
                auVar149._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_;
                bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
                auVar149._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
                auVar149._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
                auVar149._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
                auVar149._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
                auVar149._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_;
                bVar3 = SUB81(uVar111 >> 0xf,0);
                auVar149._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_;
                auVar138 = vrcp14ps_avx512f(auVar139);
                auVar140 = vmulps_avx512f(auVar149,auVar138);
                auVar139 = vfmsub213ps_avx512f(auVar139,auVar140,auVar149);
                auVar138 = vfnmadd213ps_avx512f(auVar139,auVar138,auVar140);
                auVar139 = vmulps_avx512f(auVar138,auVar138);
                uVar119 = vcmpps_avx512f(auVar136,auVar332,4);
                auVar140 = vmulps_avx512f(auVar139,auVar139);
                auVar141 = vfmadd213ps_avx512f(auVar126,auVar140,auVar127);
                auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar128);
                auVar142 = vfmadd213ps_avx512f(auVar130,auVar140,auVar131);
                auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar132);
                auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar129);
                auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar133);
                auVar140 = vfmadd213ps_avx512f(auVar142,auVar140,auVar125);
                auVar139 = vfmadd231ps_avx512f(auVar140,auVar139,auVar141);
                uVar36 = vcmpps_avx512f(auVar136,auVar332,1);
                auVar138 = vmulps_avx512f(auVar139,auVar138);
                auVar139 = vaddps_avx512f(auVar138,auVar134);
                bVar3 = (bool)((byte)uVar111 & 1);
                auVar150._0_4_ = (uint)bVar3 * auVar139._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
                auVar150._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
                auVar150._8_4_ = (uint)bVar3 * auVar139._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
                auVar150._12_4_ = (uint)bVar3 * auVar139._12_4_ | (uint)!bVar3 * auVar138._12_4_;
                bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
                auVar150._16_4_ = (uint)bVar3 * auVar139._16_4_ | (uint)!bVar3 * auVar138._16_4_;
                bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
                auVar150._20_4_ = (uint)bVar3 * auVar139._20_4_ | (uint)!bVar3 * auVar138._20_4_;
                bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
                auVar150._24_4_ = (uint)bVar3 * auVar139._24_4_ | (uint)!bVar3 * auVar138._24_4_;
                bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
                auVar150._28_4_ = (uint)bVar3 * auVar139._28_4_ | (uint)!bVar3 * auVar138._28_4_;
                bVar3 = (bool)(bVar19 & 1);
                auVar150._32_4_ = (uint)bVar3 * auVar139._32_4_ | (uint)!bVar3 * auVar138._32_4_;
                bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
                auVar150._36_4_ = (uint)bVar3 * auVar139._36_4_ | (uint)!bVar3 * auVar138._36_4_;
                bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
                auVar150._40_4_ = (uint)bVar3 * auVar139._40_4_ | (uint)!bVar3 * auVar138._40_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
                auVar150._44_4_ = (uint)bVar3 * auVar139._44_4_ | (uint)!bVar3 * auVar138._44_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
                auVar150._48_4_ = (uint)bVar3 * auVar139._48_4_ | (uint)!bVar3 * auVar138._48_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
                auVar150._52_4_ = (uint)bVar3 * auVar139._52_4_ | (uint)!bVar3 * auVar138._52_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
                auVar150._56_4_ = (uint)bVar3 * auVar139._56_4_ | (uint)!bVar3 * auVar138._56_4_;
                bVar3 = SUB81(uVar111 >> 0xf,0);
                auVar150._60_4_ = (uint)bVar3 * auVar139._60_4_ | (uint)!bVar3 * auVar138._60_4_;
                auVar136 = vpternlogd_avx512f(auVar136,auVar123,auVar135,0xea);
                auVar144 = vpternlogd_avx512f(auVar150,auVar144,auVar123,0xf8);
                uVar111 = vcmpps_avx512f(auVar136,auVar332,1);
                auVar136 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                auVar138 = vaddps_avx512f(auVar144,auVar148);
                bVar3 = (bool)((byte)uVar36 & 1);
                auVar151._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar144._0_4_;
                bVar3 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar151._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar144._4_4_;
                bVar3 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar151._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar144._8_4_;
                bVar3 = (bool)((byte)(uVar36 >> 3) & 1);
                auVar151._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar144._12_4_;
                bVar3 = (bool)((byte)(uVar36 >> 4) & 1);
                auVar151._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar144._16_4_;
                bVar3 = (bool)((byte)(uVar36 >> 5) & 1);
                auVar151._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar144._20_4_;
                bVar3 = (bool)((byte)(uVar36 >> 6) & 1);
                auVar151._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar144._24_4_;
                bVar3 = (bool)((byte)(uVar36 >> 7) & 1);
                auVar151._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar144._28_4_;
                bVar3 = (bool)((byte)(uVar36 >> 8) & 1);
                auVar151._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar144._32_4_;
                bVar3 = (bool)((byte)(uVar36 >> 9) & 1);
                auVar151._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar144._36_4_;
                bVar3 = (bool)((byte)(uVar36 >> 10) & 1);
                auVar151._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar144._40_4_;
                bVar3 = (bool)((byte)(uVar36 >> 0xb) & 1);
                auVar151._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar144._44_4_;
                bVar3 = (bool)((byte)(uVar36 >> 0xc) & 1);
                auVar151._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar144._48_4_;
                bVar3 = (bool)((byte)(uVar36 >> 0xd) & 1);
                auVar151._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar144._52_4_;
                bVar3 = (bool)((byte)(uVar36 >> 0xe) & 1);
                auVar151._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar144._56_4_;
                bVar3 = SUB81(uVar36 >> 0xf,0);
                auVar151._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar144._60_4_;
                auVar144 = vblendmps_avx512f(auVar137,auVar151);
                bVar3 = (bool)((byte)uVar119 & 1);
                bVar5 = (bool)((byte)(uVar119 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar119 >> 2) & 1);
                bVar9 = (bool)((byte)(uVar119 >> 3) & 1);
                bVar11 = (bool)((byte)(uVar119 >> 4) & 1);
                bVar13 = (bool)((byte)(uVar119 >> 5) & 1);
                bVar15 = (bool)((byte)(uVar119 >> 6) & 1);
                bVar17 = (bool)((byte)(uVar119 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar119 >> 8) & 1);
                bVar22 = (bool)((byte)(uVar119 >> 9) & 1);
                bVar24 = (bool)((byte)(uVar119 >> 10) & 1);
                bVar26 = (bool)((byte)(uVar119 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar119 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar119 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar119 >> 0xe) & 1);
                bVar34 = SUB81(uVar119 >> 0xf,0);
                bVar4 = (bool)((byte)uVar103 & 1);
                bVar6 = (bool)((byte)(uVar103 >> 1) & 1);
                bVar8 = (bool)((byte)(uVar103 >> 2) & 1);
                bVar10 = (bool)((byte)(uVar103 >> 3) & 1);
                bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
                bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
                bVar16 = (bool)((byte)(uVar103 >> 6) & 1);
                bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar103 >> 8) & 1);
                bVar23 = (bool)((byte)(uVar103 >> 9) & 1);
                bVar25 = (bool)((byte)(uVar103 >> 10) & 1);
                bVar27 = (bool)((byte)(uVar103 >> 0xb) & 1);
                bVar29 = (bool)((byte)(uVar103 >> 0xc) & 1);
                bVar31 = (bool)((byte)(uVar103 >> 0xd) & 1);
                bVar33 = (bool)((byte)(uVar103 >> 0xe) & 1);
                bVar35 = SUB81(uVar103 >> 0xf,0);
                *(uint *)*pauVar115 =
                     (uint)bVar4 * ((uint)bVar3 * auVar144._0_4_ | !bVar3 * auVar151._0_4_) |
                     (uint)!bVar4 * (uint)((byte)uVar111 & 1) * auVar136._0_4_;
                *(uint *)((long)*pauVar115 + 4) =
                     (uint)bVar6 * ((uint)bVar5 * auVar144._4_4_ | !bVar5 * auVar151._4_4_) |
                     (uint)!bVar6 * (uint)((byte)(uVar111 >> 1) & 1) * auVar136._4_4_;
                *(uint *)((long)*pauVar115 + 8) =
                     (uint)bVar8 * ((uint)bVar7 * auVar144._8_4_ | !bVar7 * auVar151._8_4_) |
                     (uint)!bVar8 * (uint)((byte)(uVar111 >> 2) & 1) * auVar136._8_4_;
                *(uint *)((long)*pauVar115 + 0xc) =
                     (uint)bVar10 * ((uint)bVar9 * auVar144._12_4_ | !bVar9 * auVar151._12_4_) |
                     (uint)!bVar10 * (uint)((byte)(uVar111 >> 3) & 1) * auVar136._12_4_;
                *(uint *)((long)*pauVar115 + 0x10) =
                     (uint)bVar12 * ((uint)bVar11 * auVar144._16_4_ | !bVar11 * auVar151._16_4_) |
                     (uint)!bVar12 * (uint)((byte)(uVar111 >> 4) & 1) * auVar136._16_4_;
                *(uint *)((long)*pauVar115 + 0x14) =
                     (uint)bVar14 * ((uint)bVar13 * auVar144._20_4_ | !bVar13 * auVar151._20_4_) |
                     (uint)!bVar14 * (uint)((byte)(uVar111 >> 5) & 1) * auVar136._20_4_;
                *(uint *)((long)*pauVar115 + 0x18) =
                     (uint)bVar16 * ((uint)bVar15 * auVar144._24_4_ | !bVar15 * auVar151._24_4_) |
                     (uint)!bVar16 * (uint)((byte)(uVar111 >> 6) & 1) * auVar136._24_4_;
                *(uint *)((long)*pauVar115 + 0x1c) =
                     (uint)bVar18 * ((uint)bVar17 * auVar144._28_4_ | !bVar17 * auVar151._28_4_) |
                     (uint)!bVar18 * (uint)((byte)(uVar111 >> 7) & 1) * auVar136._28_4_;
                *(uint *)pauVar115[1] =
                     (uint)bVar21 * ((uint)bVar20 * auVar144._32_4_ | !bVar20 * auVar151._32_4_) |
                     (uint)!bVar21 * (uint)((byte)(uVar111 >> 8) & 1) * auVar136._32_4_;
                *(uint *)(pauVar115[1] + 4) =
                     (uint)bVar23 * ((uint)bVar22 * auVar144._36_4_ | !bVar22 * auVar151._36_4_) |
                     (uint)!bVar23 * (uint)((byte)(uVar111 >> 9) & 1) * auVar136._36_4_;
                *(uint *)(pauVar115[1] + 8) =
                     (uint)bVar25 * ((uint)bVar24 * auVar144._40_4_ | !bVar24 * auVar151._40_4_) |
                     (uint)!bVar25 * (uint)((byte)(uVar111 >> 10) & 1) * auVar136._40_4_;
                *(uint *)(pauVar115[1] + 0xc) =
                     (uint)bVar27 * ((uint)bVar26 * auVar144._44_4_ | !bVar26 * auVar151._44_4_) |
                     (uint)!bVar27 * (uint)((byte)(uVar111 >> 0xb) & 1) * auVar136._44_4_;
                *(uint *)(pauVar115[1] + 0x10) =
                     (uint)bVar29 * ((uint)bVar28 * auVar144._48_4_ | !bVar28 * auVar151._48_4_) |
                     (uint)!bVar29 * (uint)((byte)(uVar111 >> 0xc) & 1) * auVar136._48_4_;
                *(uint *)(pauVar115[1] + 0x14) =
                     (uint)bVar31 * ((uint)bVar30 * auVar144._52_4_ | !bVar30 * auVar151._52_4_) |
                     (uint)!bVar31 * (uint)((byte)(uVar111 >> 0xd) & 1) * auVar136._52_4_;
                *(uint *)(pauVar115[1] + 0x18) =
                     (uint)bVar33 * ((uint)bVar32 * auVar144._56_4_ | !bVar32 * auVar151._56_4_) |
                     (uint)!bVar33 * (uint)((byte)(uVar111 >> 0xe) & 1) * auVar136._56_4_;
                *(uint *)(pauVar115[1] + 0x1c) =
                     (uint)bVar35 * ((uint)bVar34 * auVar144._60_4_ | !bVar34 * auVar151._60_4_) |
                     (uint)!bVar35 * (uint)(byte)(uVar111 >> 0xf) * auVar136._60_4_;
                pauVar112 = pauVar112 + 1;
                pauVar115 = pauVar115 + 2;
                iVar99 = iVar99 + 0x10;
              } while (iVar99 < iVar121);
              uVar103 = (ulong)local_1a0 & 0xffffffff;
            }
            uVar102 = (uint)uVar103 | 7;
            local_238 = pvVar120;
            while (uVar108 = (uint)uVar103, (int)uVar102 < iVar121) {
              auVar197 = *(undefined1 (*) [32])*pauVar112;
              local_100._0_4_ = auVar197._0_4_;
              local_100._4_4_ = auVar197._4_4_;
              local_100._8_4_ = auVar197._8_4_;
              local_100._12_4_ = auVar197._12_4_;
              local_100._16_4_ = auVar197._16_4_;
              local_100._20_4_ = auVar197._20_4_;
              local_100._24_4_ = auVar197._24_4_;
              local_100._28_4_ = auVar197._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                        ((binary_op_ratan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180);
              *pauVar115 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar115 = pauVar115 + 1;
              uVar103 = (ulong)(uVar108 + 8);
              uVar102 = uVar108 + 0xf;
            }
            uVar102 = uVar108 | 3;
            while ((int)uVar102 < iVar121) {
              local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
              auVar210 = ZEXT856(*(ulong *)(*pauVar112 + 8));
              afVar333 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                   ((binary_op_ratan2 *)local_190,(__m128 *)local_100,
                                    (__m128 *)local_a0);
              auVar123._0_8_ = afVar333._0_8_;
              auVar123._8_56_ = auVar210;
              *(undefined1 (*) [16])*pauVar115 = auVar123._0_16_;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar115 = (undefined1 (*) [32])((long)*pauVar115 + 0x10);
              iVar99 = (int)uVar103;
              uVar108 = iVar99 + 4;
              uVar103 = (ulong)uVar108;
              uVar102 = iVar99 + 7;
            }
            if ((int)uVar108 < iVar121) {
              lVar122 = 0;
              lVar107 = 0;
              do {
                fVar186 = atan2f((float)local_1f0._0_4_,*(float *)(*pauVar112 + lVar122 * 4));
                *(float *)((long)*pauVar115 + lVar122 * 4) = fVar186;
                lVar107 = lVar107 + -4;
                lVar122 = lVar122 + 1;
              } while (iVar121 - uVar108 != (int)lVar122);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar107);
              pauVar115 = (undefined1 (*) [32])((long)pauVar115 - lVar107);
              iVar121 = (int)local_1b8;
            }
            pvVar120 = (void *)((long)local_238 + 1);
            auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            iVar99 = (int)local_230;
          } while (pvVar120 != local_1f8);
        }
        local_1d0 = (void *)((long)local_1d0 + 1);
      } while (local_1d0 != local_1c8);
    }
    if ((local_240->dims == 4 && local_7c == 0) && 0 < (int)local_1c8) {
      iVar121 = iVar99 * local_20c * (int)local_1f8;
      local_1a0 = (void *)(CONCAT44(local_1a0._4_4_,iVar121) & 0xfffffffffffffff0);
      auVar69._4_4_ = local_1b0._4_4_;
      auVar69._0_4_ = (uint)local_1b0;
      auVar69._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar69,1);
      local_108 = (long)iVar100 * (long)local_208;
      local_1d0 = (void *)0x0;
      auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      local_1b8 = (void *)CONCAT44(local_1b8._4_4_,iVar121);
      do {
        if (0 < (int)local_1c0) {
          pauVar115 = (undefined1 (*) [32])
                      (local_218->cstep * (long)local_1d0 * local_218->elemsize +
                      (long)local_218->data);
          local_200 = (void *)(local_108 * (long)local_1d0 + (long)local_250);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_1d0 * local_240->elemsize +
                      (long)local_240->data);
          pvVar120 = (void *)0x0;
          do {
            uVar102 = *(uint *)((long)local_200 + (long)pvVar120 * 4);
            local_1f0 = ZEXT416(uVar102);
            if (iVar99 == 4) {
              auVar190 = *(undefined1 (*) [16])((long)local_200 + (long)pvVar120 * 0x10);
            }
            else {
              auVar190._4_4_ = uVar102;
              auVar190._0_4_ = uVar102;
              auVar190._8_4_ = uVar102;
              auVar190._12_4_ = uVar102;
            }
            local_a0[0] = (float)auVar190._0_4_;
            local_a0[1] = (float)auVar190._4_4_;
            local_a0[2] = (float)auVar190._8_4_;
            local_a0[3] = (float)auVar190._12_4_;
            if (iVar99 == 8) {
              auVar200 = *(undefined1 (*) [32])((long)local_200 + (long)pvVar120 * 0x20);
            }
            else {
              auVar200._16_16_ = auVar190;
              auVar200._0_16_ = auVar190;
            }
            local_180._0_32_ = auVar200;
            if (iVar99 == 0x10) {
              auVar156 = *(undefined1 (*) [64])((long)local_200 + (long)pvVar120 * 0x40);
            }
            else {
              auVar156 = vinsertf64x4_avx512f(ZEXT3264(auVar200),auVar200,1);
            }
            uVar103 = 0;
            if (0xf < iVar121) {
              uVar103 = vcmpps_avx512f(auVar156,auVar332,1);
              auVar137 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
              auVar39._8_4_ = 0xc0490fdb;
              auVar39._0_8_ = 0xc0490fdbc0490fdb;
              auVar39._12_4_ = 0xc0490fdb;
              auVar39._16_4_ = 0xc0490fdb;
              auVar39._20_4_ = 0xc0490fdb;
              auVar39._24_4_ = 0xc0490fdb;
              auVar39._28_4_ = 0xc0490fdb;
              auVar39._32_4_ = 0xc0490fdb;
              auVar39._36_4_ = 0xc0490fdb;
              auVar39._40_4_ = 0xc0490fdb;
              auVar39._44_4_ = 0xc0490fdb;
              auVar39._48_4_ = 0xc0490fdb;
              auVar39._52_4_ = 0xc0490fdb;
              auVar39._56_4_ = 0xc0490fdb;
              auVar39._60_4_ = 0xc0490fdb;
              auVar136 = vblendmps_avx512f(auVar137,auVar39);
              bVar3 = (bool)((byte)uVar103 & 1);
              auVar152._0_4_ = (uint)bVar3 * auVar136._0_4_ | (uint)!bVar3 * auVar137._0_4_;
              bVar3 = (bool)((byte)(uVar103 >> 1) & 1);
              auVar152._4_4_ = (uint)bVar3 * auVar136._4_4_ | (uint)!bVar3 * auVar137._4_4_;
              bVar3 = (bool)((byte)(uVar103 >> 2) & 1);
              auVar152._8_4_ = (uint)bVar3 * auVar136._8_4_ | (uint)!bVar3 * auVar137._8_4_;
              bVar3 = (bool)((byte)(uVar103 >> 3) & 1);
              auVar152._12_4_ = (uint)bVar3 * auVar136._12_4_ | (uint)!bVar3 * auVar137._12_4_;
              bVar3 = (bool)((byte)(uVar103 >> 4) & 1);
              auVar152._16_4_ = (uint)bVar3 * auVar136._16_4_ | (uint)!bVar3 * auVar137._16_4_;
              bVar3 = (bool)((byte)(uVar103 >> 5) & 1);
              auVar152._20_4_ = (uint)bVar3 * auVar136._20_4_ | (uint)!bVar3 * auVar137._20_4_;
              bVar3 = (bool)((byte)(uVar103 >> 6) & 1);
              auVar152._24_4_ = (uint)bVar3 * auVar136._24_4_ | (uint)!bVar3 * auVar137._24_4_;
              bVar3 = (bool)((byte)(uVar103 >> 7) & 1);
              auVar152._28_4_ = (uint)bVar3 * auVar136._28_4_ | (uint)!bVar3 * auVar137._28_4_;
              bVar3 = (bool)((byte)(uVar103 >> 8) & 1);
              auVar152._32_4_ = (uint)bVar3 * auVar136._32_4_ | (uint)!bVar3 * auVar137._32_4_;
              bVar3 = (bool)((byte)(uVar103 >> 9) & 1);
              auVar152._36_4_ = (uint)bVar3 * auVar136._36_4_ | (uint)!bVar3 * auVar137._36_4_;
              bVar3 = (bool)((byte)(uVar103 >> 10) & 1);
              auVar152._40_4_ = (uint)bVar3 * auVar136._40_4_ | (uint)!bVar3 * auVar137._40_4_;
              bVar3 = (bool)((byte)(uVar103 >> 0xb) & 1);
              auVar152._44_4_ = (uint)bVar3 * auVar136._44_4_ | (uint)!bVar3 * auVar137._44_4_;
              bVar3 = (bool)((byte)(uVar103 >> 0xc) & 1);
              auVar152._48_4_ = (uint)bVar3 * auVar136._48_4_ | (uint)!bVar3 * auVar137._48_4_;
              bVar3 = (bool)((byte)(uVar103 >> 0xd) & 1);
              auVar152._52_4_ = (uint)bVar3 * auVar136._52_4_ | (uint)!bVar3 * auVar137._52_4_;
              bVar3 = (bool)((byte)(uVar103 >> 0xe) & 1);
              auVar152._56_4_ = (uint)bVar3 * auVar136._56_4_ | (uint)!bVar3 * auVar137._56_4_;
              bVar3 = SUB81(uVar103 >> 0xf,0);
              auVar152._60_4_ = (uint)bVar3 * auVar136._60_4_ | (uint)!bVar3 * auVar137._60_4_;
              auVar137 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
              auVar137 = vpternlogd_avx512f(auVar137,auVar156,auVar123,0xf8);
              iVar99 = 0xf;
              uVar103 = vcmpps_avx512f(auVar156,auVar332,4);
              do {
                auVar136 = *pauVar112;
                auVar144 = vrcp14ps_avx512f(auVar136);
                auVar138 = vmulps_avx512f(auVar156,auVar144);
                auVar139 = vfmsub213ps_avx512f(auVar138,auVar136,auVar156);
                auVar144 = vfnmadd213ps_avx512f(auVar139,auVar144,auVar138);
                auVar138 = vandps_avx512dq(auVar144,auVar124);
                uVar111 = vcmpps_avx512f(auVar125,auVar138,1);
                auVar139 = vmaxps_avx512f(auVar138,auVar125);
                auVar40._8_4_ = 0xbf800000;
                auVar40._0_8_ = 0xbf800000bf800000;
                auVar40._12_4_ = 0xbf800000;
                auVar40._16_4_ = 0xbf800000;
                auVar40._20_4_ = 0xbf800000;
                auVar40._24_4_ = 0xbf800000;
                auVar40._28_4_ = 0xbf800000;
                auVar40._32_4_ = 0xbf800000;
                auVar40._36_4_ = 0xbf800000;
                auVar40._40_4_ = 0xbf800000;
                auVar40._44_4_ = 0xbf800000;
                auVar40._48_4_ = 0xbf800000;
                auVar40._52_4_ = 0xbf800000;
                auVar40._56_4_ = 0xbf800000;
                auVar40._60_4_ = 0xbf800000;
                auVar140 = vblendmps_avx512f(auVar138,auVar40);
                bVar3 = (bool)((byte)uVar111 & 1);
                auVar153._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
                auVar153._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
                auVar153._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
                auVar153._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_;
                bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
                auVar153._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_;
                bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
                auVar153._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_;
                bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
                auVar153._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_;
                bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
                auVar153._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_;
                bVar19 = (byte)(uVar111 >> 8);
                bVar3 = (bool)(bVar19 & 1);
                auVar153._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_;
                bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
                auVar153._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_;
                bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
                auVar153._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
                auVar153._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
                auVar153._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
                auVar153._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
                auVar153._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_;
                bVar3 = SUB81(uVar111 >> 0xf,0);
                auVar153._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_;
                auVar138 = vrcp14ps_avx512f(auVar139);
                auVar140 = vmulps_avx512f(auVar153,auVar138);
                auVar139 = vfmsub213ps_avx512f(auVar139,auVar140,auVar153);
                auVar138 = vfnmadd213ps_avx512f(auVar139,auVar138,auVar140);
                auVar139 = vmulps_avx512f(auVar138,auVar138);
                uVar119 = vcmpps_avx512f(auVar136,auVar332,4);
                auVar140 = vmulps_avx512f(auVar139,auVar139);
                auVar141 = vfmadd213ps_avx512f(auVar126,auVar140,auVar127);
                auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar128);
                auVar142 = vfmadd213ps_avx512f(auVar130,auVar140,auVar131);
                auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar132);
                auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar129);
                auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar133);
                auVar140 = vfmadd213ps_avx512f(auVar142,auVar140,auVar125);
                auVar139 = vfmadd231ps_avx512f(auVar140,auVar139,auVar141);
                uVar36 = vcmpps_avx512f(auVar136,auVar332,1);
                auVar138 = vmulps_avx512f(auVar139,auVar138);
                auVar139 = vaddps_avx512f(auVar138,auVar134);
                bVar3 = (bool)((byte)uVar111 & 1);
                auVar154._0_4_ = (uint)bVar3 * auVar139._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
                auVar154._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
                auVar154._8_4_ = (uint)bVar3 * auVar139._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
                auVar154._12_4_ = (uint)bVar3 * auVar139._12_4_ | (uint)!bVar3 * auVar138._12_4_;
                bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
                auVar154._16_4_ = (uint)bVar3 * auVar139._16_4_ | (uint)!bVar3 * auVar138._16_4_;
                bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
                auVar154._20_4_ = (uint)bVar3 * auVar139._20_4_ | (uint)!bVar3 * auVar138._20_4_;
                bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
                auVar154._24_4_ = (uint)bVar3 * auVar139._24_4_ | (uint)!bVar3 * auVar138._24_4_;
                bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
                auVar154._28_4_ = (uint)bVar3 * auVar139._28_4_ | (uint)!bVar3 * auVar138._28_4_;
                bVar3 = (bool)(bVar19 & 1);
                auVar154._32_4_ = (uint)bVar3 * auVar139._32_4_ | (uint)!bVar3 * auVar138._32_4_;
                bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
                auVar154._36_4_ = (uint)bVar3 * auVar139._36_4_ | (uint)!bVar3 * auVar138._36_4_;
                bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
                auVar154._40_4_ = (uint)bVar3 * auVar139._40_4_ | (uint)!bVar3 * auVar138._40_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
                auVar154._44_4_ = (uint)bVar3 * auVar139._44_4_ | (uint)!bVar3 * auVar138._44_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
                auVar154._48_4_ = (uint)bVar3 * auVar139._48_4_ | (uint)!bVar3 * auVar138._48_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
                auVar154._52_4_ = (uint)bVar3 * auVar139._52_4_ | (uint)!bVar3 * auVar138._52_4_;
                bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
                auVar154._56_4_ = (uint)bVar3 * auVar139._56_4_ | (uint)!bVar3 * auVar138._56_4_;
                bVar3 = SUB81(uVar111 >> 0xf,0);
                auVar154._60_4_ = (uint)bVar3 * auVar139._60_4_ | (uint)!bVar3 * auVar138._60_4_;
                auVar136 = vpternlogd_avx512f(auVar136,auVar123,auVar135,0xea);
                auVar144 = vpternlogd_avx512f(auVar154,auVar144,auVar123,0xf8);
                uVar111 = vcmpps_avx512f(auVar136,auVar332,1);
                auVar136 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                auVar138 = vaddps_avx512f(auVar144,auVar152);
                bVar3 = (bool)((byte)uVar36 & 1);
                auVar155._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar144._0_4_;
                bVar3 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar155._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar144._4_4_;
                bVar3 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar155._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar144._8_4_;
                bVar3 = (bool)((byte)(uVar36 >> 3) & 1);
                auVar155._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar144._12_4_;
                bVar3 = (bool)((byte)(uVar36 >> 4) & 1);
                auVar155._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar144._16_4_;
                bVar3 = (bool)((byte)(uVar36 >> 5) & 1);
                auVar155._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar144._20_4_;
                bVar3 = (bool)((byte)(uVar36 >> 6) & 1);
                auVar155._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar144._24_4_;
                bVar3 = (bool)((byte)(uVar36 >> 7) & 1);
                auVar155._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar144._28_4_;
                bVar3 = (bool)((byte)(uVar36 >> 8) & 1);
                auVar155._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar144._32_4_;
                bVar3 = (bool)((byte)(uVar36 >> 9) & 1);
                auVar155._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar144._36_4_;
                bVar3 = (bool)((byte)(uVar36 >> 10) & 1);
                auVar155._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar144._40_4_;
                bVar3 = (bool)((byte)(uVar36 >> 0xb) & 1);
                auVar155._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar144._44_4_;
                bVar3 = (bool)((byte)(uVar36 >> 0xc) & 1);
                auVar155._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar144._48_4_;
                bVar3 = (bool)((byte)(uVar36 >> 0xd) & 1);
                auVar155._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar144._52_4_;
                bVar3 = (bool)((byte)(uVar36 >> 0xe) & 1);
                auVar155._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar144._56_4_;
                bVar3 = SUB81(uVar36 >> 0xf,0);
                auVar155._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar144._60_4_;
                auVar144 = vblendmps_avx512f(auVar137,auVar155);
                bVar3 = (bool)((byte)uVar119 & 1);
                bVar5 = (bool)((byte)(uVar119 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar119 >> 2) & 1);
                bVar9 = (bool)((byte)(uVar119 >> 3) & 1);
                bVar11 = (bool)((byte)(uVar119 >> 4) & 1);
                bVar13 = (bool)((byte)(uVar119 >> 5) & 1);
                bVar15 = (bool)((byte)(uVar119 >> 6) & 1);
                bVar17 = (bool)((byte)(uVar119 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar119 >> 8) & 1);
                bVar22 = (bool)((byte)(uVar119 >> 9) & 1);
                bVar24 = (bool)((byte)(uVar119 >> 10) & 1);
                bVar26 = (bool)((byte)(uVar119 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar119 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar119 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar119 >> 0xe) & 1);
                bVar34 = SUB81(uVar119 >> 0xf,0);
                bVar4 = (bool)((byte)uVar103 & 1);
                bVar6 = (bool)((byte)(uVar103 >> 1) & 1);
                bVar8 = (bool)((byte)(uVar103 >> 2) & 1);
                bVar10 = (bool)((byte)(uVar103 >> 3) & 1);
                bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
                bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
                bVar16 = (bool)((byte)(uVar103 >> 6) & 1);
                bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar103 >> 8) & 1);
                bVar23 = (bool)((byte)(uVar103 >> 9) & 1);
                bVar25 = (bool)((byte)(uVar103 >> 10) & 1);
                bVar27 = (bool)((byte)(uVar103 >> 0xb) & 1);
                bVar29 = (bool)((byte)(uVar103 >> 0xc) & 1);
                bVar31 = (bool)((byte)(uVar103 >> 0xd) & 1);
                bVar33 = (bool)((byte)(uVar103 >> 0xe) & 1);
                bVar35 = SUB81(uVar103 >> 0xf,0);
                *(uint *)*pauVar115 =
                     (uint)bVar4 * ((uint)bVar3 * auVar144._0_4_ | !bVar3 * auVar155._0_4_) |
                     (uint)!bVar4 * (uint)((byte)uVar111 & 1) * auVar136._0_4_;
                *(uint *)((long)*pauVar115 + 4) =
                     (uint)bVar6 * ((uint)bVar5 * auVar144._4_4_ | !bVar5 * auVar155._4_4_) |
                     (uint)!bVar6 * (uint)((byte)(uVar111 >> 1) & 1) * auVar136._4_4_;
                *(uint *)((long)*pauVar115 + 8) =
                     (uint)bVar8 * ((uint)bVar7 * auVar144._8_4_ | !bVar7 * auVar155._8_4_) |
                     (uint)!bVar8 * (uint)((byte)(uVar111 >> 2) & 1) * auVar136._8_4_;
                *(uint *)((long)*pauVar115 + 0xc) =
                     (uint)bVar10 * ((uint)bVar9 * auVar144._12_4_ | !bVar9 * auVar155._12_4_) |
                     (uint)!bVar10 * (uint)((byte)(uVar111 >> 3) & 1) * auVar136._12_4_;
                *(uint *)((long)*pauVar115 + 0x10) =
                     (uint)bVar12 * ((uint)bVar11 * auVar144._16_4_ | !bVar11 * auVar155._16_4_) |
                     (uint)!bVar12 * (uint)((byte)(uVar111 >> 4) & 1) * auVar136._16_4_;
                *(uint *)((long)*pauVar115 + 0x14) =
                     (uint)bVar14 * ((uint)bVar13 * auVar144._20_4_ | !bVar13 * auVar155._20_4_) |
                     (uint)!bVar14 * (uint)((byte)(uVar111 >> 5) & 1) * auVar136._20_4_;
                *(uint *)((long)*pauVar115 + 0x18) =
                     (uint)bVar16 * ((uint)bVar15 * auVar144._24_4_ | !bVar15 * auVar155._24_4_) |
                     (uint)!bVar16 * (uint)((byte)(uVar111 >> 6) & 1) * auVar136._24_4_;
                *(uint *)((long)*pauVar115 + 0x1c) =
                     (uint)bVar18 * ((uint)bVar17 * auVar144._28_4_ | !bVar17 * auVar155._28_4_) |
                     (uint)!bVar18 * (uint)((byte)(uVar111 >> 7) & 1) * auVar136._28_4_;
                *(uint *)pauVar115[1] =
                     (uint)bVar21 * ((uint)bVar20 * auVar144._32_4_ | !bVar20 * auVar155._32_4_) |
                     (uint)!bVar21 * (uint)((byte)(uVar111 >> 8) & 1) * auVar136._32_4_;
                *(uint *)(pauVar115[1] + 4) =
                     (uint)bVar23 * ((uint)bVar22 * auVar144._36_4_ | !bVar22 * auVar155._36_4_) |
                     (uint)!bVar23 * (uint)((byte)(uVar111 >> 9) & 1) * auVar136._36_4_;
                *(uint *)(pauVar115[1] + 8) =
                     (uint)bVar25 * ((uint)bVar24 * auVar144._40_4_ | !bVar24 * auVar155._40_4_) |
                     (uint)!bVar25 * (uint)((byte)(uVar111 >> 10) & 1) * auVar136._40_4_;
                *(uint *)(pauVar115[1] + 0xc) =
                     (uint)bVar27 * ((uint)bVar26 * auVar144._44_4_ | !bVar26 * auVar155._44_4_) |
                     (uint)!bVar27 * (uint)((byte)(uVar111 >> 0xb) & 1) * auVar136._44_4_;
                *(uint *)(pauVar115[1] + 0x10) =
                     (uint)bVar29 * ((uint)bVar28 * auVar144._48_4_ | !bVar28 * auVar155._48_4_) |
                     (uint)!bVar29 * (uint)((byte)(uVar111 >> 0xc) & 1) * auVar136._48_4_;
                *(uint *)(pauVar115[1] + 0x14) =
                     (uint)bVar31 * ((uint)bVar30 * auVar144._52_4_ | !bVar30 * auVar155._52_4_) |
                     (uint)!bVar31 * (uint)((byte)(uVar111 >> 0xd) & 1) * auVar136._52_4_;
                *(uint *)(pauVar115[1] + 0x18) =
                     (uint)bVar33 * ((uint)bVar32 * auVar144._56_4_ | !bVar32 * auVar155._56_4_) |
                     (uint)!bVar33 * (uint)((byte)(uVar111 >> 0xe) & 1) * auVar136._56_4_;
                *(uint *)(pauVar115[1] + 0x1c) =
                     (uint)bVar35 * ((uint)bVar34 * auVar144._60_4_ | !bVar34 * auVar155._60_4_) |
                     (uint)!bVar35 * (uint)(byte)(uVar111 >> 0xf) * auVar136._60_4_;
                pauVar112 = pauVar112 + 1;
                pauVar115 = pauVar115 + 2;
                iVar99 = iVar99 + 0x10;
              } while (iVar99 < iVar121);
              uVar103 = (ulong)local_1a0 & 0xffffffff;
            }
            uVar102 = (uint)uVar103 | 7;
            local_238 = pvVar120;
            while (uVar108 = (uint)uVar103, (int)uVar102 < iVar121) {
              auVar197 = *(undefined1 (*) [32])*pauVar112;
              local_100._0_4_ = auVar197._0_4_;
              local_100._4_4_ = auVar197._4_4_;
              local_100._8_4_ = auVar197._8_4_;
              local_100._12_4_ = auVar197._12_4_;
              local_100._16_4_ = auVar197._16_4_;
              local_100._20_4_ = auVar197._20_4_;
              local_100._24_4_ = auVar197._24_4_;
              local_100._28_4_ = auVar197._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                        ((binary_op_ratan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180);
              *pauVar115 = auVar197;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
              pauVar115 = pauVar115 + 1;
              uVar103 = (ulong)(uVar108 + 8);
              uVar102 = uVar108 + 0xf;
            }
            uVar102 = uVar108 | 3;
            while ((int)uVar102 < iVar121) {
              local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
              auVar210 = ZEXT856(*(ulong *)(*pauVar112 + 8));
              afVar333 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                   ((binary_op_ratan2 *)local_190,(__m128 *)local_100,
                                    (__m128 *)local_a0);
              auVar124._0_8_ = afVar333._0_8_;
              auVar124._8_56_ = auVar210;
              *(undefined1 (*) [16])*pauVar115 = auVar124._0_16_;
              pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
              pauVar115 = (undefined1 (*) [32])((long)*pauVar115 + 0x10);
              iVar99 = (int)uVar103;
              uVar108 = iVar99 + 4;
              uVar103 = (ulong)uVar108;
              uVar102 = iVar99 + 7;
            }
            if ((int)uVar108 < iVar121) {
              lVar107 = 0;
              lVar122 = 0;
              do {
                fVar186 = atan2f((float)local_1f0._0_4_,*(float *)(*pauVar112 + lVar122 * 4));
                *(float *)((long)*pauVar115 + lVar122 * 4) = fVar186;
                lVar122 = lVar122 + 1;
                lVar107 = lVar107 + -4;
              } while (iVar121 - uVar108 != (int)lVar122);
              pauVar115 = (undefined1 (*) [32])((long)pauVar115 - lVar107);
              pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar107);
              iVar121 = (int)local_1b8;
            }
            pvVar120 = (void *)((long)local_238 + 1);
            auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            iVar99 = (int)local_230;
          } while (pvVar120 != local_1c0);
        }
        local_1d0 = (void *)((long)local_1d0 + 1);
      } while (local_1d0 != local_1c8);
    }
    if ((local_194 == 4.2039e-45 && local_240->dims == 4) && 0 < (int)local_1c8) {
      iVar121 = local_20c * iVar99;
      local_1a0 = (void *)(CONCAT44(local_1a0._4_4_,iVar121) & 0xfffffffffffffff0);
      local_1d8 = local_1d8 * (long)local_208;
      auVar70._4_4_ = local_1b0._4_4_;
      auVar70._0_4_ = (uint)local_1b0;
      auVar70._8_8_ = uStack_1a8;
      iVar100 = vextractps_avx(auVar70,1);
      local_1d0 = (void *)((long)iVar100 * (long)local_208);
      local_208 = (void *)0x0;
      auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      local_20c = iVar121;
      do {
        if (0 < (int)local_1c0) {
          puVar114 = (uint *)(local_218->cstep * (long)local_208 * local_218->elemsize +
                             (long)local_218->data);
          pauVar112 = (undefined1 (*) [64])
                      (local_240->cstep * (long)local_208 * local_240->elemsize +
                      (long)local_240->data);
          local_1b0 = (void *)(local_1d8 * (long)local_208 + (long)local_250);
          local_1b8 = (void *)0x0;
          do {
            if (0 < (int)local_1f8) {
              local_200 = (void *)((long)local_1d0 * (long)local_1b8 + (long)local_1b0);
              pvVar120 = (void *)0x0;
              do {
                uVar102 = *(uint *)((long)local_200 + (long)pvVar120 * 4);
                local_1f0 = ZEXT416(uVar102);
                if (iVar99 == 4) {
                  auVar191 = *(undefined1 (*) [16])((long)local_200 + (long)pvVar120 * 0x10);
                }
                else {
                  auVar191._4_4_ = uVar102;
                  auVar191._0_4_ = uVar102;
                  auVar191._8_4_ = uVar102;
                  auVar191._12_4_ = uVar102;
                }
                local_a0[0] = (float)auVar191._0_4_;
                local_a0[1] = (float)auVar191._4_4_;
                local_a0[2] = (float)auVar191._8_4_;
                local_a0[3] = (float)auVar191._12_4_;
                if (iVar99 == 8) {
                  auVar201 = *(undefined1 (*) [32])((long)local_200 + (long)pvVar120 * 0x20);
                }
                else {
                  auVar201._16_16_ = auVar191;
                  auVar201._0_16_ = auVar191;
                }
                local_180._0_32_ = auVar201;
                if (iVar99 == 0x10) {
                  auVar156 = *(undefined1 (*) [64])((long)local_200 + (long)pvVar120 * 0x40);
                }
                else {
                  auVar156 = vinsertf64x4_avx512f(ZEXT3264(auVar201),auVar201,1);
                }
                uVar103 = 0;
                if (0xf < iVar121) {
                  uVar103 = vcmpps_avx512f(auVar156,auVar332,1);
                  auVar137 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                  auVar41._8_4_ = 0xc0490fdb;
                  auVar41._0_8_ = 0xc0490fdbc0490fdb;
                  auVar41._12_4_ = 0xc0490fdb;
                  auVar41._16_4_ = 0xc0490fdb;
                  auVar41._20_4_ = 0xc0490fdb;
                  auVar41._24_4_ = 0xc0490fdb;
                  auVar41._28_4_ = 0xc0490fdb;
                  auVar41._32_4_ = 0xc0490fdb;
                  auVar41._36_4_ = 0xc0490fdb;
                  auVar41._40_4_ = 0xc0490fdb;
                  auVar41._44_4_ = 0xc0490fdb;
                  auVar41._48_4_ = 0xc0490fdb;
                  auVar41._52_4_ = 0xc0490fdb;
                  auVar41._56_4_ = 0xc0490fdb;
                  auVar41._60_4_ = 0xc0490fdb;
                  auVar136 = vblendmps_avx512f(auVar137,auVar41);
                  bVar3 = (bool)((byte)uVar103 & 1);
                  auVar157._0_4_ = (uint)bVar3 * auVar136._0_4_ | (uint)!bVar3 * auVar137._0_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar157._4_4_ = (uint)bVar3 * auVar136._4_4_ | (uint)!bVar3 * auVar137._4_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar157._8_4_ = (uint)bVar3 * auVar136._8_4_ | (uint)!bVar3 * auVar137._8_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar157._12_4_ = (uint)bVar3 * auVar136._12_4_ | (uint)!bVar3 * auVar137._12_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 4) & 1);
                  auVar157._16_4_ = (uint)bVar3 * auVar136._16_4_ | (uint)!bVar3 * auVar137._16_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 5) & 1);
                  auVar157._20_4_ = (uint)bVar3 * auVar136._20_4_ | (uint)!bVar3 * auVar137._20_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 6) & 1);
                  auVar157._24_4_ = (uint)bVar3 * auVar136._24_4_ | (uint)!bVar3 * auVar137._24_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 7) & 1);
                  auVar157._28_4_ = (uint)bVar3 * auVar136._28_4_ | (uint)!bVar3 * auVar137._28_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 8) & 1);
                  auVar157._32_4_ = (uint)bVar3 * auVar136._32_4_ | (uint)!bVar3 * auVar137._32_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 9) & 1);
                  auVar157._36_4_ = (uint)bVar3 * auVar136._36_4_ | (uint)!bVar3 * auVar137._36_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 10) & 1);
                  auVar157._40_4_ = (uint)bVar3 * auVar136._40_4_ | (uint)!bVar3 * auVar137._40_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 0xb) & 1);
                  auVar157._44_4_ = (uint)bVar3 * auVar136._44_4_ | (uint)!bVar3 * auVar137._44_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 0xc) & 1);
                  auVar157._48_4_ = (uint)bVar3 * auVar136._48_4_ | (uint)!bVar3 * auVar137._48_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 0xd) & 1);
                  auVar157._52_4_ = (uint)bVar3 * auVar136._52_4_ | (uint)!bVar3 * auVar137._52_4_;
                  bVar3 = (bool)((byte)(uVar103 >> 0xe) & 1);
                  auVar157._56_4_ = (uint)bVar3 * auVar136._56_4_ | (uint)!bVar3 * auVar137._56_4_;
                  bVar3 = SUB81(uVar103 >> 0xf,0);
                  auVar157._60_4_ = (uint)bVar3 * auVar136._60_4_ | (uint)!bVar3 * auVar137._60_4_;
                  auVar137 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
                  auVar137 = vpternlogd_avx512f(auVar137,auVar156,auVar123,0xf8);
                  iVar99 = 0xf;
                  uVar103 = vcmpps_avx512f(auVar156,auVar332,4);
                  do {
                    auVar136 = *pauVar112;
                    auVar144 = vrcp14ps_avx512f(auVar136);
                    auVar138 = vmulps_avx512f(auVar156,auVar144);
                    auVar139 = vfmsub213ps_avx512f(auVar138,auVar136,auVar156);
                    auVar144 = vfnmadd213ps_avx512f(auVar139,auVar144,auVar138);
                    auVar138 = vandps_avx512dq(auVar144,auVar124);
                    uVar111 = vcmpps_avx512f(auVar125,auVar138,1);
                    auVar139 = vmaxps_avx512f(auVar138,auVar125);
                    auVar42._8_4_ = 0xbf800000;
                    auVar42._0_8_ = 0xbf800000bf800000;
                    auVar42._12_4_ = 0xbf800000;
                    auVar42._16_4_ = 0xbf800000;
                    auVar42._20_4_ = 0xbf800000;
                    auVar42._24_4_ = 0xbf800000;
                    auVar42._28_4_ = 0xbf800000;
                    auVar42._32_4_ = 0xbf800000;
                    auVar42._36_4_ = 0xbf800000;
                    auVar42._40_4_ = 0xbf800000;
                    auVar42._44_4_ = 0xbf800000;
                    auVar42._48_4_ = 0xbf800000;
                    auVar42._52_4_ = 0xbf800000;
                    auVar42._56_4_ = 0xbf800000;
                    auVar42._60_4_ = 0xbf800000;
                    auVar140 = vblendmps_avx512f(auVar138,auVar42);
                    bVar3 = (bool)((byte)uVar111 & 1);
                    auVar158._0_4_ = (uint)bVar3 * auVar140._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
                    auVar158._4_4_ = (uint)bVar3 * auVar140._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
                    auVar158._8_4_ = (uint)bVar3 * auVar140._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
                    auVar158._12_4_ = (uint)bVar3 * auVar140._12_4_ | (uint)!bVar3 * auVar138._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
                    auVar158._16_4_ = (uint)bVar3 * auVar140._16_4_ | (uint)!bVar3 * auVar138._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
                    auVar158._20_4_ = (uint)bVar3 * auVar140._20_4_ | (uint)!bVar3 * auVar138._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
                    auVar158._24_4_ = (uint)bVar3 * auVar140._24_4_ | (uint)!bVar3 * auVar138._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
                    auVar158._28_4_ = (uint)bVar3 * auVar140._28_4_ | (uint)!bVar3 * auVar138._28_4_
                    ;
                    bVar19 = (byte)(uVar111 >> 8);
                    bVar3 = (bool)(bVar19 & 1);
                    auVar158._32_4_ = (uint)bVar3 * auVar140._32_4_ | (uint)!bVar3 * auVar138._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
                    auVar158._36_4_ = (uint)bVar3 * auVar140._36_4_ | (uint)!bVar3 * auVar138._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
                    auVar158._40_4_ = (uint)bVar3 * auVar140._40_4_ | (uint)!bVar3 * auVar138._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
                    auVar158._44_4_ = (uint)bVar3 * auVar140._44_4_ | (uint)!bVar3 * auVar138._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
                    auVar158._48_4_ = (uint)bVar3 * auVar140._48_4_ | (uint)!bVar3 * auVar138._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
                    auVar158._52_4_ = (uint)bVar3 * auVar140._52_4_ | (uint)!bVar3 * auVar138._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
                    auVar158._56_4_ = (uint)bVar3 * auVar140._56_4_ | (uint)!bVar3 * auVar138._56_4_
                    ;
                    bVar3 = SUB81(uVar111 >> 0xf,0);
                    auVar158._60_4_ = (uint)bVar3 * auVar140._60_4_ | (uint)!bVar3 * auVar138._60_4_
                    ;
                    auVar138 = vrcp14ps_avx512f(auVar139);
                    auVar140 = vmulps_avx512f(auVar158,auVar138);
                    auVar139 = vfmsub213ps_avx512f(auVar139,auVar140,auVar158);
                    auVar138 = vfnmadd213ps_avx512f(auVar139,auVar138,auVar140);
                    auVar139 = vmulps_avx512f(auVar138,auVar138);
                    uVar119 = vcmpps_avx512f(auVar136,auVar332,4);
                    auVar140 = vmulps_avx512f(auVar139,auVar139);
                    auVar141 = vfmadd213ps_avx512f(auVar126,auVar140,auVar127);
                    auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar128);
                    auVar142 = vfmadd213ps_avx512f(auVar130,auVar140,auVar131);
                    auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar132);
                    auVar141 = vfmadd213ps_avx512f(auVar141,auVar140,auVar129);
                    auVar142 = vfmadd213ps_avx512f(auVar142,auVar140,auVar133);
                    auVar140 = vfmadd213ps_avx512f(auVar142,auVar140,auVar125);
                    auVar139 = vfmadd231ps_avx512f(auVar140,auVar139,auVar141);
                    uVar36 = vcmpps_avx512f(auVar136,auVar332,1);
                    auVar138 = vmulps_avx512f(auVar139,auVar138);
                    auVar139 = vaddps_avx512f(auVar138,auVar134);
                    bVar3 = (bool)((byte)uVar111 & 1);
                    auVar159._0_4_ = (uint)bVar3 * auVar139._0_4_ | (uint)!bVar3 * auVar138._0_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 1) & 1);
                    auVar159._4_4_ = (uint)bVar3 * auVar139._4_4_ | (uint)!bVar3 * auVar138._4_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 2) & 1);
                    auVar159._8_4_ = (uint)bVar3 * auVar139._8_4_ | (uint)!bVar3 * auVar138._8_4_;
                    bVar3 = (bool)((byte)(uVar111 >> 3) & 1);
                    auVar159._12_4_ = (uint)bVar3 * auVar139._12_4_ | (uint)!bVar3 * auVar138._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 4) & 1);
                    auVar159._16_4_ = (uint)bVar3 * auVar139._16_4_ | (uint)!bVar3 * auVar138._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 5) & 1);
                    auVar159._20_4_ = (uint)bVar3 * auVar139._20_4_ | (uint)!bVar3 * auVar138._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 6) & 1);
                    auVar159._24_4_ = (uint)bVar3 * auVar139._24_4_ | (uint)!bVar3 * auVar138._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 7) & 1);
                    auVar159._28_4_ = (uint)bVar3 * auVar139._28_4_ | (uint)!bVar3 * auVar138._28_4_
                    ;
                    bVar3 = (bool)(bVar19 & 1);
                    auVar159._32_4_ = (uint)bVar3 * auVar139._32_4_ | (uint)!bVar3 * auVar138._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 9) & 1);
                    auVar159._36_4_ = (uint)bVar3 * auVar139._36_4_ | (uint)!bVar3 * auVar138._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 10) & 1);
                    auVar159._40_4_ = (uint)bVar3 * auVar139._40_4_ | (uint)!bVar3 * auVar138._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 0xb) & 1);
                    auVar159._44_4_ = (uint)bVar3 * auVar139._44_4_ | (uint)!bVar3 * auVar138._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 0xc) & 1);
                    auVar159._48_4_ = (uint)bVar3 * auVar139._48_4_ | (uint)!bVar3 * auVar138._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 0xd) & 1);
                    auVar159._52_4_ = (uint)bVar3 * auVar139._52_4_ | (uint)!bVar3 * auVar138._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar111 >> 0xe) & 1);
                    auVar159._56_4_ = (uint)bVar3 * auVar139._56_4_ | (uint)!bVar3 * auVar138._56_4_
                    ;
                    bVar3 = SUB81(uVar111 >> 0xf,0);
                    auVar159._60_4_ = (uint)bVar3 * auVar139._60_4_ | (uint)!bVar3 * auVar138._60_4_
                    ;
                    auVar136 = vpternlogd_avx512f(auVar136,auVar123,auVar135,0xea);
                    auVar144 = vpternlogd_avx512f(auVar159,auVar144,auVar123,0xf8);
                    uVar111 = vcmpps_avx512f(auVar136,auVar332,1);
                    auVar136 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                    auVar138 = vaddps_avx512f(auVar144,auVar157);
                    bVar3 = (bool)((byte)uVar36 & 1);
                    auVar160._0_4_ = (uint)bVar3 * auVar138._0_4_ | (uint)!bVar3 * auVar144._0_4_;
                    bVar3 = (bool)((byte)(uVar36 >> 1) & 1);
                    auVar160._4_4_ = (uint)bVar3 * auVar138._4_4_ | (uint)!bVar3 * auVar144._4_4_;
                    bVar3 = (bool)((byte)(uVar36 >> 2) & 1);
                    auVar160._8_4_ = (uint)bVar3 * auVar138._8_4_ | (uint)!bVar3 * auVar144._8_4_;
                    bVar3 = (bool)((byte)(uVar36 >> 3) & 1);
                    auVar160._12_4_ = (uint)bVar3 * auVar138._12_4_ | (uint)!bVar3 * auVar144._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 4) & 1);
                    auVar160._16_4_ = (uint)bVar3 * auVar138._16_4_ | (uint)!bVar3 * auVar144._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 5) & 1);
                    auVar160._20_4_ = (uint)bVar3 * auVar138._20_4_ | (uint)!bVar3 * auVar144._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 6) & 1);
                    auVar160._24_4_ = (uint)bVar3 * auVar138._24_4_ | (uint)!bVar3 * auVar144._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 7) & 1);
                    auVar160._28_4_ = (uint)bVar3 * auVar138._28_4_ | (uint)!bVar3 * auVar144._28_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 8) & 1);
                    auVar160._32_4_ = (uint)bVar3 * auVar138._32_4_ | (uint)!bVar3 * auVar144._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 9) & 1);
                    auVar160._36_4_ = (uint)bVar3 * auVar138._36_4_ | (uint)!bVar3 * auVar144._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 10) & 1);
                    auVar160._40_4_ = (uint)bVar3 * auVar138._40_4_ | (uint)!bVar3 * auVar144._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 0xb) & 1);
                    auVar160._44_4_ = (uint)bVar3 * auVar138._44_4_ | (uint)!bVar3 * auVar144._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 0xc) & 1);
                    auVar160._48_4_ = (uint)bVar3 * auVar138._48_4_ | (uint)!bVar3 * auVar144._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 0xd) & 1);
                    auVar160._52_4_ = (uint)bVar3 * auVar138._52_4_ | (uint)!bVar3 * auVar144._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar36 >> 0xe) & 1);
                    auVar160._56_4_ = (uint)bVar3 * auVar138._56_4_ | (uint)!bVar3 * auVar144._56_4_
                    ;
                    bVar3 = SUB81(uVar36 >> 0xf,0);
                    auVar160._60_4_ = (uint)bVar3 * auVar138._60_4_ | (uint)!bVar3 * auVar144._60_4_
                    ;
                    auVar144 = vblendmps_avx512f(auVar137,auVar160);
                    bVar3 = (bool)((byte)uVar119 & 1);
                    bVar5 = (bool)((byte)(uVar119 >> 1) & 1);
                    bVar7 = (bool)((byte)(uVar119 >> 2) & 1);
                    bVar9 = (bool)((byte)(uVar119 >> 3) & 1);
                    bVar11 = (bool)((byte)(uVar119 >> 4) & 1);
                    bVar13 = (bool)((byte)(uVar119 >> 5) & 1);
                    bVar15 = (bool)((byte)(uVar119 >> 6) & 1);
                    bVar17 = (bool)((byte)(uVar119 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar119 >> 8) & 1);
                    bVar22 = (bool)((byte)(uVar119 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar119 >> 10) & 1);
                    bVar26 = (bool)((byte)(uVar119 >> 0xb) & 1);
                    bVar28 = (bool)((byte)(uVar119 >> 0xc) & 1);
                    bVar30 = (bool)((byte)(uVar119 >> 0xd) & 1);
                    bVar32 = (bool)((byte)(uVar119 >> 0xe) & 1);
                    bVar34 = SUB81(uVar119 >> 0xf,0);
                    bVar4 = (bool)((byte)uVar103 & 1);
                    bVar6 = (bool)((byte)(uVar103 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar103 >> 2) & 1);
                    bVar10 = (bool)((byte)(uVar103 >> 3) & 1);
                    bVar12 = (bool)((byte)(uVar103 >> 4) & 1);
                    bVar14 = (bool)((byte)(uVar103 >> 5) & 1);
                    bVar16 = (bool)((byte)(uVar103 >> 6) & 1);
                    bVar18 = (bool)((byte)(uVar103 >> 7) & 1);
                    bVar21 = (bool)((byte)(uVar103 >> 8) & 1);
                    bVar23 = (bool)((byte)(uVar103 >> 9) & 1);
                    bVar25 = (bool)((byte)(uVar103 >> 10) & 1);
                    bVar27 = (bool)((byte)(uVar103 >> 0xb) & 1);
                    bVar29 = (bool)((byte)(uVar103 >> 0xc) & 1);
                    bVar31 = (bool)((byte)(uVar103 >> 0xd) & 1);
                    bVar33 = (bool)((byte)(uVar103 >> 0xe) & 1);
                    bVar35 = SUB81(uVar103 >> 0xf,0);
                    *puVar114 = (uint)bVar4 *
                                ((uint)bVar3 * auVar144._0_4_ | !bVar3 * auVar160._0_4_) |
                                (uint)!bVar4 * (uint)((byte)uVar111 & 1) * auVar136._0_4_;
                    puVar114[1] = (uint)bVar6 *
                                  ((uint)bVar5 * auVar144._4_4_ | !bVar5 * auVar160._4_4_) |
                                  (uint)!bVar6 * (uint)((byte)(uVar111 >> 1) & 1) * auVar136._4_4_;
                    puVar114[2] = (uint)bVar8 *
                                  ((uint)bVar7 * auVar144._8_4_ | !bVar7 * auVar160._8_4_) |
                                  (uint)!bVar8 * (uint)((byte)(uVar111 >> 2) & 1) * auVar136._8_4_;
                    puVar114[3] = (uint)bVar10 *
                                  ((uint)bVar9 * auVar144._12_4_ | !bVar9 * auVar160._12_4_) |
                                  (uint)!bVar10 * (uint)((byte)(uVar111 >> 3) & 1) * auVar136._12_4_
                    ;
                    puVar114[4] = (uint)bVar12 *
                                  ((uint)bVar11 * auVar144._16_4_ | !bVar11 * auVar160._16_4_) |
                                  (uint)!bVar12 * (uint)((byte)(uVar111 >> 4) & 1) * auVar136._16_4_
                    ;
                    puVar114[5] = (uint)bVar14 *
                                  ((uint)bVar13 * auVar144._20_4_ | !bVar13 * auVar160._20_4_) |
                                  (uint)!bVar14 * (uint)((byte)(uVar111 >> 5) & 1) * auVar136._20_4_
                    ;
                    puVar114[6] = (uint)bVar16 *
                                  ((uint)bVar15 * auVar144._24_4_ | !bVar15 * auVar160._24_4_) |
                                  (uint)!bVar16 * (uint)((byte)(uVar111 >> 6) & 1) * auVar136._24_4_
                    ;
                    puVar114[7] = (uint)bVar18 *
                                  ((uint)bVar17 * auVar144._28_4_ | !bVar17 * auVar160._28_4_) |
                                  (uint)!bVar18 * (uint)((byte)(uVar111 >> 7) & 1) * auVar136._28_4_
                    ;
                    puVar114[8] = (uint)bVar21 *
                                  ((uint)bVar20 * auVar144._32_4_ | !bVar20 * auVar160._32_4_) |
                                  (uint)!bVar21 * (uint)((byte)(uVar111 >> 8) & 1) * auVar136._32_4_
                    ;
                    puVar114[9] = (uint)bVar23 *
                                  ((uint)bVar22 * auVar144._36_4_ | !bVar22 * auVar160._36_4_) |
                                  (uint)!bVar23 * (uint)((byte)(uVar111 >> 9) & 1) * auVar136._36_4_
                    ;
                    puVar114[10] = (uint)bVar25 *
                                   ((uint)bVar24 * auVar144._40_4_ | !bVar24 * auVar160._40_4_) |
                                   (uint)!bVar25 *
                                   (uint)((byte)(uVar111 >> 10) & 1) * auVar136._40_4_;
                    puVar114[0xb] =
                         (uint)bVar27 * ((uint)bVar26 * auVar144._44_4_ | !bVar26 * auVar160._44_4_)
                         | (uint)!bVar27 * (uint)((byte)(uVar111 >> 0xb) & 1) * auVar136._44_4_;
                    puVar114[0xc] =
                         (uint)bVar29 * ((uint)bVar28 * auVar144._48_4_ | !bVar28 * auVar160._48_4_)
                         | (uint)!bVar29 * (uint)((byte)(uVar111 >> 0xc) & 1) * auVar136._48_4_;
                    puVar114[0xd] =
                         (uint)bVar31 * ((uint)bVar30 * auVar144._52_4_ | !bVar30 * auVar160._52_4_)
                         | (uint)!bVar31 * (uint)((byte)(uVar111 >> 0xd) & 1) * auVar136._52_4_;
                    puVar114[0xe] =
                         (uint)bVar33 * ((uint)bVar32 * auVar144._56_4_ | !bVar32 * auVar160._56_4_)
                         | (uint)!bVar33 * (uint)((byte)(uVar111 >> 0xe) & 1) * auVar136._56_4_;
                    puVar114[0xf] =
                         (uint)bVar35 * ((uint)bVar34 * auVar144._60_4_ | !bVar34 * auVar160._60_4_)
                         | (uint)!bVar35 * (uint)(byte)(uVar111 >> 0xf) * auVar136._60_4_;
                    pauVar112 = pauVar112 + 1;
                    puVar114 = puVar114 + 0x10;
                    iVar99 = iVar99 + 0x10;
                  } while (iVar99 < iVar121);
                  uVar103 = (ulong)local_1a0 & 0xffffffff;
                }
                uVar102 = (uint)uVar103 | 7;
                local_238 = pvVar120;
                while (uVar108 = (uint)uVar103, (int)uVar102 < iVar121) {
                  uVar209 = *(undefined8 *)*pauVar112;
                  uVar208 = *(undefined8 *)(*pauVar112 + 8);
                  uVar211 = *(undefined8 *)(*pauVar112 + 0x10);
                  uVar212 = *(undefined8 *)(*pauVar112 + 0x18);
                  local_100 = *(undefined1 (*) [32])*pauVar112;
                  BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                            ((binary_op_ratan2 *)local_190,(__m256 *)local_100,(__m256 *)&local_180)
                  ;
                  *(undefined8 *)puVar114 = uVar209;
                  *(undefined8 *)(puVar114 + 2) = uVar208;
                  *(undefined8 *)(puVar114 + 4) = uVar211;
                  *(undefined8 *)(puVar114 + 6) = uVar212;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x20);
                  puVar114 = puVar114 + 8;
                  uVar103 = (ulong)(uVar108 + 8);
                  uVar102 = uVar108 + 0xf;
                }
                uVar102 = uVar108 | 3;
                while ((int)uVar102 < iVar121) {
                  uVar209 = *(undefined8 *)(*pauVar112 + 8);
                  local_100._0_16_ = *(undefined1 (*) [16])*pauVar112;
                  afVar333 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                       ((binary_op_ratan2 *)local_190,(__m128 *)local_100,
                                        (__m128 *)local_a0);
                  *(long *)puVar114 = afVar333._0_8_;
                  *(undefined8 *)(puVar114 + 2) = uVar209;
                  pauVar112 = (undefined1 (*) [64])(*pauVar112 + 0x10);
                  puVar114 = puVar114 + 4;
                  iVar99 = (int)uVar103;
                  uVar108 = iVar99 + 4;
                  uVar103 = (ulong)uVar108;
                  uVar102 = iVar99 + 7;
                }
                if ((int)uVar108 < iVar121) {
                  lVar107 = 0;
                  lVar122 = 0;
                  do {
                    fVar186 = atan2f((float)local_1f0._0_4_,*(float *)(*pauVar112 + lVar122 * 4));
                    puVar114[lVar122] = (uint)fVar186;
                    lVar122 = lVar122 + 1;
                    lVar107 = lVar107 + -4;
                  } while (iVar121 - uVar108 != (int)lVar122);
                  puVar114 = (uint *)((long)puVar114 - lVar107);
                  pauVar112 = (undefined1 (*) [64])((long)pauVar112 - lVar107);
                }
                pvVar120 = (void *)((long)local_238 + 1);
                auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar123 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
                auVar124 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                auVar125 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar126 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
                auVar127 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
                auVar128 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
                auVar129 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
                auVar130 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
                auVar131 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
                auVar132 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
                auVar133 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
                auVar134 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
                auVar135 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
                iVar99 = (int)local_230;
                iVar121 = local_20c;
              } while (pvVar120 != local_1f8);
            }
            local_1b8 = (void *)((long)local_1b8 + 1);
          } while (local_1b8 != local_1c0);
        }
        local_208 = (void *)((long)local_208 + 1);
      } while (local_208 != local_1c8);
    }
  }
  if (local_220 != (int *)0x0) {
    LOCK();
    *local_220 = *local_220 + -1;
    UNLOCK();
    if (*local_220 == 0) {
      if (local_228 == (Allocator *)0x0) {
        if (local_250 != (void *)0x0) {
          free(local_250);
          local_220 = extraout_RAX;
        }
      }
      else {
        uVar102 = (*local_228->_vptr_Allocator[3])(local_228,local_250);
        local_220 = (int *)(ulong)uVar102;
      }
    }
  }
  return (int)local_220;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    // squeeze inner axes
    Mat b2 = b;
    if (b.dims == 2 && b.w == 1)
        b2 = b.reshape(b.h);
    else if (b.dims == 3 && b.h == 1)
        b2 = b.reshape(b.c);
    else if (b.dims == 3 && b.w == 1)
        b2 = b.reshape(b.h, b.c);
    else if (b.dims == 4 && b.d == 1)
        b2 = b.reshape(b.c);
    else if (b.dims == 4 && b.h == 1)
        b2 = b.reshape(b.d, b.c);
    else if (b.dims == 4 && b.w == 1)
        b2 = b.reshape(b.h, b.d, b.c);

    using namespace BinaryOp_x86_avx512_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_broadcast_inner<binary_op_add>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_broadcast_inner<binary_op_sub>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_broadcast_inner<binary_op_mul>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_broadcast_inner<binary_op_div>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_broadcast_inner<binary_op_max>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_broadcast_inner<binary_op_min>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_broadcast_inner<binary_op_pow>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_broadcast_inner<binary_op_rsub>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_broadcast_inner<binary_op_rdiv>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_broadcast_inner<binary_op_rpow>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_broadcast_inner<binary_op_atan2>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_broadcast_inner<binary_op_ratan2>(a, b2, c, opt);

    // should never reach here
    return 0;
}